

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_avx512::forward
          (Deconvolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 uVar12;
  uint uVar13;
  int *piVar14;
  _func_int **pp_Var15;
  size_t sVar16;
  size_t sVar17;
  float *pfVar18;
  _func_int **pp_Var19;
  size_t sVar20;
  size_t sVar21;
  _func_int **pp_Var22;
  byte bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  byte bVar31;
  byte bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  ulong uVar41;
  undefined8 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  Mat *pMVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  uint uVar140;
  _func_int *p_Var141;
  long lVar142;
  ulong uVar143;
  long lVar144;
  uint uVar145;
  uint uVar146;
  int iVar147;
  undefined8 uVar148;
  int y_1;
  _func_int *p_Var149;
  _func_int ***ppp_Var150;
  void *pvVar151;
  void *pvVar152;
  uint uVar153;
  ulong uVar154;
  long lVar155;
  int iVar156;
  ulong uVar157;
  int y_12;
  int iVar158;
  void *pvVar159;
  int y;
  uint uVar160;
  uint uVar161;
  ulong uVar162;
  ulong uVar163;
  int w_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  ulong unaff_R13;
  ulong uVar164;
  ushort uVar165;
  ulong uVar166;
  ulong uVar167;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar168 [16];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [64];
  undefined1 auVar294 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar305 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar310 [64];
  float afVar311 [16];
  float afVar312 [16];
  float afVar313 [16];
  float afVar314 [16];
  float afVar315 [16];
  float afVar316 [16];
  float afVar317 [16];
  float afVar318 [16];
  float afVar319 [16];
  float afVar320 [16];
  float afVar321 [16];
  float afVar322 [16];
  float afVar323 [16];
  float afVar324 [16];
  float afVar325 [16];
  float afVar326 [16];
  float afVar327 [16];
  float afVar328 [16];
  float afVar329 [16];
  float afVar330 [16];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  int iVar334;
  int iVar335;
  int iVar336;
  int iVar337;
  int iVar338;
  int iVar339;
  int iVar340;
  int iVar341;
  int iVar342;
  int iVar343;
  int iVar344;
  int iVar345;
  float fVar346;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar360;
  undefined1 auVar355 [64];
  undefined1 auVar356 [64];
  undefined1 auVar357 [64];
  undefined1 auVar358 [64];
  undefined1 auVar359 [64];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float fVar367;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  v4sf one;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [16];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar398 [64];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar471 [32];
  undefined1 auVar468 [16];
  float in_ZMM13 [16];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  float afVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM20 [64];
  float in_ZMM21 [16];
  undefined1 in_ZMM29 [64];
  int outh;
  int outw_2;
  int outw;
  int h;
  long local_1e0;
  int local_1d4;
  _func_int ***local_1b8;
  long local_1b0;
  long local_188;
  Mat local_118;
  undefined1 local_c8 [16];
  _func_int *local_b0;
  Allocator *local_a8;
  Allocator *local_a0;
  long local_98;
  int local_90;
  int local_8c;
  undefined1 local_88 [64];
  Mat *local_40;
  Option *local_38;
  undefined1 auVar309 [64];
  
  iVar7 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  uVar143 = bottom_blob->elemsize;
  p_Var141 = this->_vptr_Deconvolution_x86_avx512[-3];
  local_8c = (*(int *)(&this->field_0xd4 + (long)p_Var141) + -1) *
             *(int *)(&this->field_0xdc + (long)p_Var141);
  iVar9 = bottom_blob->elempack;
  iVar147 = *(int *)(&this->field_0xe4 + (long)p_Var141);
  local_90 = (*(int *)(&this->field_0xd8 + (long)p_Var141) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var141);
  iVar10 = *(int *)(&this->field_0xe8 + (long)p_Var141);
  iVar156 = *(int *)(&this->field_0xfc + (long)p_Var141);
  iVar158 = *(int *)(&this->field_0x100 + (long)p_Var141);
  uVar145 = 1;
  if (opt->use_packing_layout == true) {
    uVar145 = *(uint *)(&this->field_0xd0 + (long)p_Var141);
    if ((uVar145 & 0xf) == 0) {
      uVar145 = 0x10;
    }
    else if ((uVar145 & 7) == 0) {
      uVar145 = 8;
    }
    else {
      uVar145 = (uint)((uVar145 & 3) == 0) * 3 + 1;
    }
  }
  local_118.cstep = 0;
  local_118.data = (Allocator *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elempack = 0;
  p_Var149 = this->_vptr_Deconvolution_x86_avx512[-3];
  p_Var141 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx512 + (long)p_Var149);
  lVar155 = 0x10;
  local_118.elemsize._4_4_ = (int)local_118.refcount;
  local_118.allocator = (Allocator *)local_118.data;
  local_118.dims = (int)local_118.refcount;
  local_118.w = local_118.refcount._4_4_;
  local_118.h = (uint)local_118.elemsize;
  local_118.d = (int)local_118.refcount;
  local_118.c = local_118.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var149) < 1) && (*(int *)(p_Var141 + 0xf0) < 1)) &&
       (*(int *)(p_Var141 + 0xf4) < 1)) && (*(int *)(p_Var141 + 0xf8) < 1)) &&
     ((*(int *)(p_Var141 + 0x104) < 1 || (*(int *)(p_Var141 + 0x108) < 1)))) {
    if (&local_118 != top_blob) {
      piVar14 = top_blob->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_118.data = top_blob->data;
      local_118.refcount._0_4_ = (int)top_blob->refcount;
      local_118.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_118.elemsize._0_4_ = (uint)top_blob->elemsize;
      local_118.elemsize._4_4_ = (int)(top_blob->elemsize >> 0x20);
      local_118.elempack = top_blob->elempack;
      local_118.allocator = top_blob->allocator;
      uVar3 = top_blob->dims;
      uVar4 = top_blob->w;
      uVar5 = top_blob->h;
      uVar6 = top_blob->d;
      local_118.c = top_blob->c;
      local_118.cstep = top_blob->cstep;
      local_118.dims = uVar3;
      local_118.w = uVar4;
      local_118.h = uVar5;
      local_118.d = uVar6;
    }
    p_Var141 = (_func_int *)
               ((long)&this->_vptr_Deconvolution_x86_avx512 +
               (long)this->_vptr_Deconvolution_x86_avx512[-3]);
    lVar155 = 8;
  }
  local_40 = top_blob;
  local_38 = opt;
  Mat::create(&local_118,iVar156 + (iVar7 + -1) * iVar147 + local_8c + 1,
              iVar158 + (iVar8 + -1) * iVar10 + local_90 + 1,
              *(int *)(p_Var141 + 0xd0) / (int)uVar145,
              (uVar143 / (ulong)(long)iVar9) * (ulong)uVar145,uVar145,
              *(Allocator **)(&opt->lightmode + lVar155));
  iVar8 = local_118.h;
  iVar7 = local_118.w;
  afVar320 = _ps512_cephes_exp_p5;
  afVar319 = _ps512_cephes_exp_p4;
  afVar318 = _ps512_cephes_exp_p3;
  afVar317 = _ps512_cephes_exp_p2;
  afVar316 = _ps512_cephes_exp_p1;
  afVar315 = _ps512_cephes_exp_p0;
  afVar314 = _ps512_cephes_LOG2EF;
  afVar313 = _ps512_exp_lo;
  afVar312 = _ps512_exp_hi;
  afVar311 = _ps512_1;
  pvVar151 = (void *)0xffffff9c;
  if (((Allocator *)local_118.data != (Allocator *)0x0) &&
     ((long)local_118.c * local_118.cstep != 0)) {
    pp_Var15 = this->_vptr_Deconvolution_x86_avx512;
    p_Var141 = pp_Var15[-3];
    uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
    local_b0 = (_func_int *)(ulong)uVar140;
    uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
    local_c8._0_8_ = CONCAT44(0,uVar11);
    if ((iVar9 == 0x10) && ((uVar145 == 0x10 && (0 < (long)local_118.c)))) {
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      auVar274 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar275 = vxorps_avx512dq(auVar274,(undefined1  [64])_ps512_cephes_log_q2);
      auVar276 = vxorps_avx512dq(auVar274,(undefined1  [64])_ps512_cephes_log_q1);
      auVar277 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_88 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar274);
      local_188 = 0;
      auVar168 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar168);
      auVar274 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        if (0 < local_118.h) {
          iVar138 = bottom_blob->w;
          iVar139 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_188 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar13 = bottom_blob->c;
          unaff_R13 = 0;
          do {
            if (0 < local_118.w) {
              uVar160 = 0;
              local_1d4 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar291 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar291 = *(undefined1 (*) [64])(lVar155 + local_188 * 0x40);
                }
                if (0 < (int)uVar13) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_188 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar157 = 0;
                      uVar162 = 0;
                      do {
                        iVar134 = (((int)uVar162 - uVar11) + 1) * iVar10 + (int)unaff_R13;
                        if ((((-1 < iVar134) &&
                             (iVar135 = iVar134 / iVar158, iVar134 % iVar158 == 0)) &&
                            (0 < (int)uVar140)) && (iVar135 < iVar139)) {
                          lVar144 = (long)iVar135 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          p_Var149 = local_b0;
                          uVar154 = uVar157;
                          iVar134 = local_1d4;
                          do {
                            if (((-1 < iVar134) &&
                                (iVar135 = iVar134 / iVar156, iVar134 % iVar156 == 0)) &&
                               (iVar135 < iVar138)) {
                              lVar142 = (long)(iVar135 << 4);
                              auVar278 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144)));
                              auVar279 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              auVar280 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              auVar281 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x10)))
                              ;
                              auVar282 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x14)))
                              ;
                              in_ZMM20 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x18)))
                              ;
                              in_ZMM21 = (float  [16])
                                         vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x1c)))
                              ;
                              auVar283 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x20)))
                              ;
                              auVar284 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x24)))
                              ;
                              auVar285 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x28)))
                              ;
                              auVar286 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x2c)))
                              ;
                              auVar287 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x30)))
                              ;
                              auVar288 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x34)))
                              ;
                              auVar289 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x38)))
                              ;
                              auVar290 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x3c)))
                              ;
                              uVar164 = uVar154 & 0xffffffff;
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar278,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4));
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar279,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x40))
                              ;
                              auVar291 = vfmadd231ps_avx512f(auVar291,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x80))
                              ;
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar280,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0xc0))
                              ;
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar281,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x100)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar282,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x140)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,in_ZMM20,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x180)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,(undefined1  [64])in_ZMM21,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x1c0)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar283,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x200)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar284,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x240)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar285,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x280)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar286,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x2c0)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar287,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x300)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar288,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x340)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar289,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x380)
                                                            );
                              auVar291 = vfmadd231ps_avx512f(auVar291,auVar290,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar164 * 4 + 0x3c0)
                                                            );
                            }
                            uVar154 = uVar154 + 0x100;
                            iVar134 = iVar134 + iVar147;
                            p_Var149 = p_Var149 + -1;
                          } while (p_Var149 != (_func_int *)0x0);
                        }
                        uVar162 = uVar162 + 1;
                        uVar157 = uVar157 + (long)local_b0 * 0x100;
                      } while (uVar162 != CONCAT44(0,uVar11));
                    }
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x100) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar13);
                }
                switch(uVar12) {
                case 1:
                  auVar291 = vmaxps_avx512f(auVar291,in_ZMM29);
                  break;
                case 2:
                  uVar143 = vcmpps_avx512f(auVar291,in_ZMM29,1);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar286._4_4_ = uVar1;
                  auVar286._0_4_ = uVar1;
                  auVar286._8_4_ = uVar1;
                  auVar286._12_4_ = uVar1;
                  auVar286._16_4_ = uVar1;
                  auVar286._20_4_ = uVar1;
                  auVar286._24_4_ = uVar1;
                  auVar286._28_4_ = uVar1;
                  auVar286._32_4_ = uVar1;
                  auVar286._36_4_ = uVar1;
                  auVar286._40_4_ = uVar1;
                  auVar286._44_4_ = uVar1;
                  auVar286._48_4_ = uVar1;
                  auVar286._52_4_ = uVar1;
                  auVar286._56_4_ = uVar1;
                  auVar286._60_4_ = uVar1;
                  auVar278 = vmulps_avx512f(auVar291,auVar286);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar287._0_4_ = (uint)bVar37 * auVar278._0_4_ | (uint)!bVar37 * auVar291._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar287._4_4_ = (uint)bVar37 * auVar278._4_4_ | (uint)!bVar37 * auVar291._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar287._8_4_ = (uint)bVar37 * auVar278._8_4_ | (uint)!bVar37 * auVar291._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar287._12_4_ = (uint)bVar37 * auVar278._12_4_ | (uint)!bVar37 * auVar291._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar287._16_4_ = (uint)bVar37 * auVar278._16_4_ | (uint)!bVar37 * auVar291._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar287._20_4_ = (uint)bVar37 * auVar278._20_4_ | (uint)!bVar37 * auVar291._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar287._24_4_ = (uint)bVar37 * auVar278._24_4_ | (uint)!bVar37 * auVar291._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar287._28_4_ = (uint)bVar37 * auVar278._28_4_ | (uint)!bVar37 * auVar291._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar287._32_4_ = (uint)bVar37 * auVar278._32_4_ | (uint)!bVar37 * auVar291._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar287._36_4_ = (uint)bVar37 * auVar278._36_4_ | (uint)!bVar37 * auVar291._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar287._40_4_ = (uint)bVar37 * auVar278._40_4_ | (uint)!bVar37 * auVar291._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar287._44_4_ = (uint)bVar37 * auVar278._44_4_ | (uint)!bVar37 * auVar291._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar287._48_4_ = (uint)bVar37 * auVar278._48_4_ | (uint)!bVar37 * auVar291._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar287._52_4_ = (uint)bVar37 * auVar278._52_4_ | (uint)!bVar37 * auVar291._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar287._56_4_ = (uint)bVar37 * auVar278._56_4_ | (uint)!bVar37 * auVar291._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar287._60_4_ = (uint)bVar37 * auVar278._60_4_ | (uint)!bVar37 * auVar291._60_4_
                  ;
                  auVar291 = auVar287;
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar285._4_4_ = uVar1;
                  auVar285._0_4_ = uVar1;
                  auVar285._8_4_ = uVar1;
                  auVar285._12_4_ = uVar1;
                  auVar285._16_4_ = uVar1;
                  auVar285._20_4_ = uVar1;
                  auVar285._24_4_ = uVar1;
                  auVar285._28_4_ = uVar1;
                  auVar285._32_4_ = uVar1;
                  auVar285._36_4_ = uVar1;
                  auVar285._40_4_ = uVar1;
                  auVar285._44_4_ = uVar1;
                  auVar285._48_4_ = uVar1;
                  auVar285._52_4_ = uVar1;
                  auVar285._56_4_ = uVar1;
                  auVar285._60_4_ = uVar1;
                  auVar278 = vmaxps_avx512f(auVar291,auVar285);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar291._4_4_ = uVar1;
                  auVar291._0_4_ = uVar1;
                  auVar291._8_4_ = uVar1;
                  auVar291._12_4_ = uVar1;
                  auVar291._16_4_ = uVar1;
                  auVar291._20_4_ = uVar1;
                  auVar291._24_4_ = uVar1;
                  auVar291._28_4_ = uVar1;
                  auVar291._32_4_ = uVar1;
                  auVar291._36_4_ = uVar1;
                  auVar291._40_4_ = uVar1;
                  auVar291._44_4_ = uVar1;
                  auVar291._48_4_ = uVar1;
                  auVar291._52_4_ = uVar1;
                  auVar291._56_4_ = uVar1;
                  auVar291._60_4_ = uVar1;
                  auVar291 = vminps_avx512f(auVar278,auVar291);
                  break;
                case 4:
                  auVar279._8_4_ = 0x80000000;
                  auVar279._0_8_ = 0x8000000080000000;
                  auVar279._12_4_ = 0x80000000;
                  auVar279._16_4_ = 0x80000000;
                  auVar279._20_4_ = 0x80000000;
                  auVar279._24_4_ = 0x80000000;
                  auVar279._28_4_ = 0x80000000;
                  auVar279._32_4_ = 0x80000000;
                  auVar279._36_4_ = 0x80000000;
                  auVar279._40_4_ = 0x80000000;
                  auVar279._44_4_ = 0x80000000;
                  auVar279._48_4_ = 0x80000000;
                  auVar279._52_4_ = 0x80000000;
                  auVar279._56_4_ = 0x80000000;
                  auVar279._60_4_ = 0x80000000;
                  auVar291 = vxorps_avx512dq(auVar291,auVar279);
                  auVar291 = vminps_avx512f(auVar291,(undefined1  [64])afVar312);
                  auVar291 = vmaxps_avx512f(auVar291,(undefined1  [64])afVar313);
                  auVar278 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar291,
                                                 (undefined1  [64])afVar320);
                  auVar279 = vrndscaleps_avx512f(auVar278,1);
                  uVar143 = vcmpps_avx512f(auVar278,auVar279,1);
                  auVar278 = vsubps_avx512f(auVar279,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar280._0_4_ = (uint)bVar37 * auVar278._0_4_ | (uint)!bVar37 * auVar279._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar280._4_4_ = (uint)bVar37 * auVar278._4_4_ | (uint)!bVar37 * auVar279._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar280._8_4_ = (uint)bVar37 * auVar278._8_4_ | (uint)!bVar37 * auVar279._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar280._12_4_ = (uint)bVar37 * auVar278._12_4_ | (uint)!bVar37 * auVar279._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar280._16_4_ = (uint)bVar37 * auVar278._16_4_ | (uint)!bVar37 * auVar279._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar280._20_4_ = (uint)bVar37 * auVar278._20_4_ | (uint)!bVar37 * auVar279._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar280._24_4_ = (uint)bVar37 * auVar278._24_4_ | (uint)!bVar37 * auVar279._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar280._28_4_ = (uint)bVar37 * auVar278._28_4_ | (uint)!bVar37 * auVar279._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar280._32_4_ = (uint)bVar37 * auVar278._32_4_ | (uint)!bVar37 * auVar279._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar280._36_4_ = (uint)bVar37 * auVar278._36_4_ | (uint)!bVar37 * auVar279._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar280._40_4_ = (uint)bVar37 * auVar278._40_4_ | (uint)!bVar37 * auVar279._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar280._44_4_ = (uint)bVar37 * auVar278._44_4_ | (uint)!bVar37 * auVar279._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar280._48_4_ = (uint)bVar37 * auVar278._48_4_ | (uint)!bVar37 * auVar279._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar280._52_4_ = (uint)bVar37 * auVar278._52_4_ | (uint)!bVar37 * auVar279._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar280._56_4_ = (uint)bVar37 * auVar278._56_4_ | (uint)!bVar37 * auVar279._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar280._60_4_ = (uint)bVar37 * auVar278._60_4_ | (uint)!bVar37 * auVar279._60_4_
                  ;
                  auVar291 = vfmadd231ps_avx512f(auVar291,auVar280,auVar275);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar291,auVar280,auVar276);
                  auVar291 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar278 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar278 = vfmadd213ps_avx512f(auVar278,in_ZMM16,(undefined1  [64])afVar317);
                  auVar278 = vfmadd213ps_avx512f(auVar278,in_ZMM16,(undefined1  [64])afVar318);
                  auVar278 = vfmadd213ps_avx512f(auVar278,in_ZMM16,(undefined1  [64])afVar319);
                  auVar278 = vfmadd213ps_avx512f(auVar278,in_ZMM16,(undefined1  [64])afVar320);
                  auVar291 = vfmadd213ps_avx512f(auVar278,auVar291,in_ZMM16);
                  auVar291 = vaddps_avx512f(auVar291,(undefined1  [64])afVar311);
                  auVar278 = vcvttps2dq_avx512f(auVar280);
                  auVar278 = vpaddd_avx512f(auVar278,auVar277);
                  auVar278 = vpslld_avx512f(auVar278,0x17);
                  auVar291 = vfmadd213ps_avx512f(auVar278,auVar291,auVar274);
                  auVar278 = vrcp14ps_avx512f(auVar291);
                  auVar291 = vfmsub213ps_avx512f(auVar291,auVar278,auVar274);
                  auVar291 = vfnmadd132ps_avx512vl(auVar291,auVar278,auVar278);
                  break;
                case 5:
                  auVar278 = vminps_avx512f(auVar291,(undefined1  [64])afVar312);
                  auVar278 = vmaxps_avx512f(auVar278,(undefined1  [64])afVar313);
                  auVar279 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar278,
                                                 (undefined1  [64])afVar320);
                  auVar280 = vrndscaleps_avx512f(auVar279,1);
                  uVar143 = vcmpps_avx512f(auVar279,auVar280,1);
                  auVar279 = vsubps_avx512f(auVar280,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar281._0_4_ = (uint)bVar37 * auVar279._0_4_ | (uint)!bVar37 * auVar280._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar281._4_4_ = (uint)bVar37 * auVar279._4_4_ | (uint)!bVar37 * auVar280._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar281._8_4_ = (uint)bVar37 * auVar279._8_4_ | (uint)!bVar37 * auVar280._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar281._12_4_ = (uint)bVar37 * auVar279._12_4_ | (uint)!bVar37 * auVar280._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar281._16_4_ = (uint)bVar37 * auVar279._16_4_ | (uint)!bVar37 * auVar280._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar281._20_4_ = (uint)bVar37 * auVar279._20_4_ | (uint)!bVar37 * auVar280._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar281._24_4_ = (uint)bVar37 * auVar279._24_4_ | (uint)!bVar37 * auVar280._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar281._28_4_ = (uint)bVar37 * auVar279._28_4_ | (uint)!bVar37 * auVar280._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar281._32_4_ = (uint)bVar37 * auVar279._32_4_ | (uint)!bVar37 * auVar280._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar281._36_4_ = (uint)bVar37 * auVar279._36_4_ | (uint)!bVar37 * auVar280._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar281._40_4_ = (uint)bVar37 * auVar279._40_4_ | (uint)!bVar37 * auVar280._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar281._44_4_ = (uint)bVar37 * auVar279._44_4_ | (uint)!bVar37 * auVar280._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar281._48_4_ = (uint)bVar37 * auVar279._48_4_ | (uint)!bVar37 * auVar280._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar281._52_4_ = (uint)bVar37 * auVar279._52_4_ | (uint)!bVar37 * auVar280._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar281._56_4_ = (uint)bVar37 * auVar279._56_4_ | (uint)!bVar37 * auVar280._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar281._60_4_ = (uint)bVar37 * auVar279._60_4_ | (uint)!bVar37 * auVar280._60_4_
                  ;
                  auVar278 = vfmadd231ps_avx512f(auVar278,auVar281,auVar275);
                  auVar278 = vfmadd231ps_avx512f(auVar278,auVar281,auVar276);
                  auVar279 = vmulps_avx512f(auVar278,auVar278);
                  auVar280 = vfmadd213ps_avx512f(auVar278,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar280 = vfmadd213ps_avx512f(auVar280,auVar278,(undefined1  [64])afVar317);
                  auVar280 = vfmadd213ps_avx512f(auVar280,auVar278,(undefined1  [64])afVar318);
                  auVar280 = vfmadd213ps_avx512f(auVar280,auVar278,(undefined1  [64])afVar319);
                  auVar280 = vfmadd213ps_avx512f(auVar280,auVar278,(undefined1  [64])afVar320);
                  auVar278 = vfmadd213ps_avx512f(auVar280,auVar279,auVar278);
                  auVar278 = vaddps_avx512f(auVar278,(undefined1  [64])afVar311);
                  auVar279 = vcvttps2dq_avx512f(auVar281);
                  auVar279 = vpaddd_avx512f(auVar279,auVar277);
                  auVar279 = vpslld_avx512f(auVar279,0x17);
                  auVar278 = vfmadd213ps_avx512f(auVar279,auVar278,auVar274);
                  auVar279 = vmaxps_avx512f(auVar278,(undefined1  [64])_ps512_min_norm_pos);
                  auVar280 = vpsrld_avx512f(auVar279,0x17);
                  auVar279 = vpternlogd_avx512f(auVar279,(undefined1  [64])afVar320,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar143 = vcmpps_avx512f(auVar279,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar281 = vsubps_avx512f(auVar279,(undefined1  [64])afVar311);
                  auVar279 = vaddps_avx512f(auVar281,auVar279);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar282._0_4_ = (uint)bVar37 * auVar279._0_4_ | (uint)!bVar37 * auVar281._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar282._4_4_ = (uint)bVar37 * auVar279._4_4_ | (uint)!bVar37 * auVar281._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar282._8_4_ = (uint)bVar37 * auVar279._8_4_ | (uint)!bVar37 * auVar281._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar282._12_4_ = (uint)bVar37 * auVar279._12_4_ | (uint)!bVar37 * auVar281._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar282._16_4_ = (uint)bVar37 * auVar279._16_4_ | (uint)!bVar37 * auVar281._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar282._20_4_ = (uint)bVar37 * auVar279._20_4_ | (uint)!bVar37 * auVar281._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar282._24_4_ = (uint)bVar37 * auVar279._24_4_ | (uint)!bVar37 * auVar281._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar282._28_4_ = (uint)bVar37 * auVar279._28_4_ | (uint)!bVar37 * auVar281._28_4_
                  ;
                  bVar31 = (byte)(uVar143 >> 8);
                  bVar37 = (bool)(bVar31 & 1);
                  auVar282._32_4_ = (uint)bVar37 * auVar279._32_4_ | (uint)!bVar37 * auVar281._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar282._36_4_ = (uint)bVar37 * auVar279._36_4_ | (uint)!bVar37 * auVar281._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar282._40_4_ = (uint)bVar37 * auVar279._40_4_ | (uint)!bVar37 * auVar281._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar282._44_4_ = (uint)bVar37 * auVar279._44_4_ | (uint)!bVar37 * auVar281._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar282._48_4_ = (uint)bVar37 * auVar279._48_4_ | (uint)!bVar37 * auVar281._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar282._52_4_ = (uint)bVar37 * auVar279._52_4_ | (uint)!bVar37 * auVar281._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar282._56_4_ = (uint)bVar37 * auVar279._56_4_ | (uint)!bVar37 * auVar281._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar282._60_4_ = (uint)bVar37 * auVar279._60_4_ | (uint)!bVar37 * auVar281._60_4_
                  ;
                  auVar279 = vmulps_avx512f(auVar282,auVar282);
                  auVar281 = vfmadd132ps_avx512f(auVar282,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar282,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar282,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar282,
                                                 (undefined1  [64])_ps512_cephes_log_p4);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar282,
                                                 (undefined1  [64])_ps512_cephes_log_p5);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar282,
                                                 (undefined1  [64])_ps512_cephes_log_p6);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar282,
                                                 (undefined1  [64])_ps512_cephes_log_p7);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar282,
                                                 (undefined1  [64])_ps512_cephes_log_p8);
                  auVar283 = vmulps_avx512f(auVar279,auVar282);
                  auVar281 = vfmadd213ps_avx512f(auVar283,auVar281,auVar282);
                  uVar157 = vcmpps_avx512f(auVar278,in_ZMM29,2);
                  auVar278 = vpsubd_avx512f(auVar280,auVar277);
                  auVar278 = vcvtdq2ps_avx512f(auVar278);
                  auVar280 = vaddps_avx512f(auVar278,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar283._0_4_ = (uint)bVar37 * auVar278._0_4_ | (uint)!bVar37 * auVar280._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar283._4_4_ = (uint)bVar37 * auVar278._4_4_ | (uint)!bVar37 * auVar280._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar283._8_4_ = (uint)bVar37 * auVar278._8_4_ | (uint)!bVar37 * auVar280._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar283._12_4_ = (uint)bVar37 * auVar278._12_4_ | (uint)!bVar37 * auVar280._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar283._16_4_ = (uint)bVar37 * auVar278._16_4_ | (uint)!bVar37 * auVar280._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar283._20_4_ = (uint)bVar37 * auVar278._20_4_ | (uint)!bVar37 * auVar280._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar283._24_4_ = (uint)bVar37 * auVar278._24_4_ | (uint)!bVar37 * auVar280._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar283._28_4_ = (uint)bVar37 * auVar278._28_4_ | (uint)!bVar37 * auVar280._28_4_
                  ;
                  bVar37 = (bool)(bVar31 & 1);
                  auVar283._32_4_ = (uint)bVar37 * auVar278._32_4_ | (uint)!bVar37 * auVar280._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar283._36_4_ = (uint)bVar37 * auVar278._36_4_ | (uint)!bVar37 * auVar280._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar283._40_4_ = (uint)bVar37 * auVar278._40_4_ | (uint)!bVar37 * auVar280._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar283._44_4_ = (uint)bVar37 * auVar278._44_4_ | (uint)!bVar37 * auVar280._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar283._48_4_ = (uint)bVar37 * auVar278._48_4_ | (uint)!bVar37 * auVar280._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar283._52_4_ = (uint)bVar37 * auVar278._52_4_ | (uint)!bVar37 * auVar280._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar283._56_4_ = (uint)bVar37 * auVar278._56_4_ | (uint)!bVar37 * auVar280._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar283._60_4_ = (uint)bVar37 * auVar278._60_4_ | (uint)!bVar37 * auVar280._60_4_
                  ;
                  auVar278 = vfmadd231ps_avx512f(auVar281,auVar283,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar278 = vfmadd231ps_avx512f(auVar278,auVar279,local_88);
                  auVar278 = vfmadd231ps_avx512f(auVar278,auVar283,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar279 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
                  auVar278 = vmulps_avx512f(auVar278,auVar279);
                  auVar280 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar284._0_4_ = (uint)bVar37 * auVar280._0_4_ | (uint)!bVar37 * auVar278._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar284._4_4_ = (uint)bVar37 * auVar280._4_4_ | (uint)!bVar37 * auVar278._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar284._8_4_ = (uint)bVar37 * auVar280._8_4_ | (uint)!bVar37 * auVar278._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar284._12_4_ = (uint)bVar37 * auVar280._12_4_ | (uint)!bVar37 * auVar278._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  auVar284._16_4_ = (uint)bVar37 * auVar280._16_4_ | (uint)!bVar37 * auVar278._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  auVar284._20_4_ = (uint)bVar37 * auVar280._20_4_ | (uint)!bVar37 * auVar278._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  auVar284._24_4_ = (uint)bVar37 * auVar280._24_4_ | (uint)!bVar37 * auVar278._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  auVar284._28_4_ = (uint)bVar37 * auVar280._28_4_ | (uint)!bVar37 * auVar278._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 8) & 1);
                  auVar284._32_4_ = (uint)bVar37 * auVar280._32_4_ | (uint)!bVar37 * auVar278._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  auVar284._36_4_ = (uint)bVar37 * auVar280._36_4_ | (uint)!bVar37 * auVar278._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  auVar284._40_4_ = (uint)bVar37 * auVar280._40_4_ | (uint)!bVar37 * auVar278._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  auVar284._44_4_ = (uint)bVar37 * auVar280._44_4_ | (uint)!bVar37 * auVar278._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  auVar284._48_4_ = (uint)bVar37 * auVar280._48_4_ | (uint)!bVar37 * auVar278._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  auVar284._52_4_ = (uint)bVar37 * auVar280._52_4_ | (uint)!bVar37 * auVar278._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  auVar284._56_4_ = (uint)bVar37 * auVar280._56_4_ | (uint)!bVar37 * auVar278._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  auVar284._60_4_ = (uint)bVar37 * auVar280._60_4_ | (uint)!bVar37 * auVar278._60_4_
                  ;
                  auVar278 = vminps_avx512f(auVar284,(undefined1  [64])afVar312);
                  auVar278 = vmaxps_avx512f(auVar278,(undefined1  [64])afVar313);
                  auVar280 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar278,
                                                 (undefined1  [64])afVar320);
                  auVar281 = vrndscaleps_avx512f(auVar280,1);
                  uVar143 = vcmpps_avx512f(auVar280,auVar281,1);
                  auVar280 = vsubps_avx512f(auVar281,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  in_ZMM16._0_4_ = (uint)bVar37 * auVar280._0_4_ | (uint)!bVar37 * auVar281._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar37 * auVar280._4_4_ | (uint)!bVar37 * auVar281._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar37 * auVar280._8_4_ | (uint)!bVar37 * auVar281._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar37 * auVar280._12_4_ | (uint)!bVar37 * auVar281._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar37 * auVar280._16_4_ | (uint)!bVar37 * auVar281._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar37 * auVar280._20_4_ | (uint)!bVar37 * auVar281._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar37 * auVar280._24_4_ | (uint)!bVar37 * auVar281._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar37 * auVar280._28_4_ | (uint)!bVar37 * auVar281._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar37 * auVar280._32_4_ | (uint)!bVar37 * auVar281._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar37 * auVar280._36_4_ | (uint)!bVar37 * auVar281._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar37 * auVar280._40_4_ | (uint)!bVar37 * auVar281._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar37 * auVar280._44_4_ | (uint)!bVar37 * auVar281._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar37 * auVar280._48_4_ | (uint)!bVar37 * auVar281._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar37 * auVar280._52_4_ | (uint)!bVar37 * auVar281._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar37 * auVar280._56_4_ | (uint)!bVar37 * auVar281._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar37 * auVar280._60_4_ | (uint)!bVar37 * auVar281._60_4_
                  ;
                  auVar278 = vfmadd231ps_avx512f(auVar278,in_ZMM16,auVar275);
                  auVar278 = vfmadd231ps_avx512f(auVar278,in_ZMM16,auVar276);
                  auVar280 = vmulps_avx512f(auVar278,auVar278);
                  auVar281 = vfmadd213ps_avx512f(auVar278,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar278,(undefined1  [64])afVar317);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar278,(undefined1  [64])afVar318);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar278,(undefined1  [64])afVar319);
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar278,(undefined1  [64])afVar320);
                  auVar278 = vfmadd213ps_avx512f(auVar281,auVar280,auVar278);
                  auVar278 = vaddps_avx512f(auVar278,(undefined1  [64])afVar311);
                  auVar280 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar280 = vpaddd_avx512f(auVar280,auVar277);
                  auVar280 = vpslld_avx512f(auVar280,0x17);
                  auVar278 = vfmadd213ps_avx512f(auVar280,auVar278,auVar274);
                  auVar280 = vrcp14ps_avx512f(auVar278);
                  auVar278 = vfmsub213ps_avx512f(auVar278,auVar280,auVar274);
                  auVar278 = vfnmadd132ps_avx512vl(auVar278,auVar280,auVar280);
                  auVar278 = vfnmsub213ps_avx512f(auVar278,auVar279,auVar274);
                  auVar291 = vmulps_avx512f(auVar278,auVar291);
                  break;
                case 6:
                  auVar279 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var141)));
                  uVar153 = (*(uint **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar278._4_4_ = uVar153;
                  auVar278._0_4_ = uVar153;
                  auVar278._8_4_ = uVar153;
                  auVar278._12_4_ = uVar153;
                  auVar278._16_4_ = uVar153;
                  auVar278._20_4_ = uVar153;
                  auVar278._24_4_ = uVar153;
                  auVar278._28_4_ = uVar153;
                  auVar278._32_4_ = uVar153;
                  auVar278._36_4_ = uVar153;
                  auVar278._40_4_ = uVar153;
                  auVar278._44_4_ = uVar153;
                  auVar278._48_4_ = uVar153;
                  auVar278._52_4_ = uVar153;
                  auVar278._56_4_ = uVar153;
                  auVar278._60_4_ = uVar153;
                  auVar278 = vfmadd213ps_avx512f(auVar279,auVar291,auVar278);
                  auVar278 = vmaxps_avx512f(auVar278,in_ZMM29);
                  auVar278 = vminps_avx512f(auVar278,auVar274);
                  auVar291 = vmulps_avx512f(auVar278,auVar291);
                }
                *(undefined1 (*) [64])ppp_Var150 = auVar291;
                ppp_Var150 = ppp_Var150 + 8;
                uVar160 = uVar160 + 1;
                local_1d4 = local_1d4 + 1;
              } while (uVar160 != local_118.w);
            }
            uVar160 = (int)unaff_R13 + 1;
            unaff_R13 = (ulong)uVar160;
          } while (uVar160 != local_118.h);
        }
        local_188 = local_188 + 1;
        in_ZMM13 = afVar318;
      } while (local_188 != local_118.c);
    }
    afVar324 = _ps512_cephes_log_p8;
    afVar323 = _ps512_cephes_log_p7;
    afVar322 = _ps512_cephes_log_p6;
    afVar321 = _ps512_cephes_log_p5;
    afVar474 = _ps512_cephes_log_p4;
    afVar320 = _ps512_cephes_exp_p5;
    afVar319 = _ps512_cephes_exp_p4;
    afVar318 = _ps512_cephes_exp_p3;
    afVar317 = _ps512_cephes_exp_p2;
    afVar316 = _ps512_cephes_exp_p1;
    afVar315 = _ps512_cephes_exp_p0;
    afVar314 = _ps512_cephes_LOG2EF;
    afVar313 = _ps512_exp_lo;
    afVar312 = _ps512_exp_hi;
    afVar311 = _ps512_1;
    if (((iVar9 == 8) && (uVar145 == 0x10)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      auVar274 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar275 = vxorps_avx512dq(auVar274,(undefined1  [64])_ps512_cephes_log_q2);
      auVar276 = vxorps_avx512dq(auVar274,(undefined1  [64])_ps512_cephes_log_q1);
      auVar277 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar291 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar274);
      local_1e0 = 0;
      auVar168 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar168);
      auVar278 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar279 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if (0 < local_118.h) {
          uVar13 = bottom_blob->w;
          unaff_R13 = (ulong)uVar13;
          iVar138 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar160 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x40;
          uVar153 = 0;
          do {
            if (0 < local_118.w) {
              uVar161 = 0;
              iVar139 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar280 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar280 = *(undefined1 (*) [64])(lVar155 + local_1e0 * 0x40);
                }
                if (0 < (int)uVar160) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar134 = (((int)uVar157 - uVar11) + 1) * iVar10 + uVar153;
                        if ((((-1 < iVar134) &&
                             (iVar135 = iVar134 / iVar158, iVar134 % iVar158 == 0)) &&
                            (0 < (int)uVar140)) && (iVar135 < iVar138)) {
                          lVar144 = (long)iVar135 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar134 = iVar139;
                          do {
                            if (((-1 < iVar134) &&
                                (iVar135 = iVar134 / iVar156, iVar134 % iVar156 == 0)) &&
                               (iVar135 < (int)uVar13)) {
                              lVar142 = (long)(iVar135 << 3);
                              auVar281 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144)));
                              auVar282 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              auVar283 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              auVar284 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x10)))
                              ;
                              auVar285 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x14)))
                              ;
                              in_ZMM20 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x18)))
                              ;
                              in_ZMM21 = (float  [16])
                                         vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x1c)))
                              ;
                              uVar163 = uVar154 & 0xffffffff;
                              auVar280 = vfmadd231ps_avx512f(auVar280,auVar281,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4));
                              auVar280 = vfmadd231ps_avx512f(auVar280,auVar282,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0x40))
                              ;
                              auVar280 = vfmadd231ps_avx512f(auVar280,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0x80))
                              ;
                              auVar280 = vfmadd231ps_avx512f(auVar280,auVar283,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0xc0))
                              ;
                              auVar280 = vfmadd231ps_avx512f(auVar280,auVar284,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0x100)
                                                            );
                              auVar280 = vfmadd231ps_avx512f(auVar280,auVar285,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0x140)
                                                            );
                              auVar280 = vfmadd231ps_avx512f(auVar280,in_ZMM20,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0x180)
                                                            );
                              auVar280 = vfmadd231ps_avx512f(auVar280,(undefined1  [64])in_ZMM21,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0x1c0)
                                                            );
                            }
                            uVar154 = uVar154 + 0x80;
                            iVar134 = iVar134 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 0x80;
                      } while (uVar157 != uVar11);
                    }
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x80) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                switch(uVar12) {
                case 1:
                  auVar280 = vmaxps_avx512f(auVar280,in_ZMM29);
                  break;
                case 2:
                  uVar143 = vcmpps_avx512f(auVar280,in_ZMM29,1);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar124._4_4_ = uVar1;
                  auVar124._0_4_ = uVar1;
                  auVar124._8_4_ = uVar1;
                  auVar124._12_4_ = uVar1;
                  auVar124._16_4_ = uVar1;
                  auVar124._20_4_ = uVar1;
                  auVar124._24_4_ = uVar1;
                  auVar124._28_4_ = uVar1;
                  auVar124._32_4_ = uVar1;
                  auVar124._36_4_ = uVar1;
                  auVar124._40_4_ = uVar1;
                  auVar124._44_4_ = uVar1;
                  auVar124._48_4_ = uVar1;
                  auVar124._52_4_ = uVar1;
                  auVar124._56_4_ = uVar1;
                  auVar124._60_4_ = uVar1;
                  auVar281 = vmulps_avx512f(auVar280,auVar124);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar295._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar280._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar295._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar280._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar295._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar280._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar295._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar280._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar295._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar280._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar295._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar280._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar295._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar280._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar295._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar280._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar295._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar280._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar295._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar280._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar295._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar280._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar295._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar280._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar295._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar280._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar295._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar280._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar295._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar280._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar295._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar280._60_4_
                  ;
                  auVar280 = auVar295;
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar122._4_4_ = uVar1;
                  auVar122._0_4_ = uVar1;
                  auVar122._8_4_ = uVar1;
                  auVar122._12_4_ = uVar1;
                  auVar122._16_4_ = uVar1;
                  auVar122._20_4_ = uVar1;
                  auVar122._24_4_ = uVar1;
                  auVar122._28_4_ = uVar1;
                  auVar122._32_4_ = uVar1;
                  auVar122._36_4_ = uVar1;
                  auVar122._40_4_ = uVar1;
                  auVar122._44_4_ = uVar1;
                  auVar122._48_4_ = uVar1;
                  auVar122._52_4_ = uVar1;
                  auVar122._56_4_ = uVar1;
                  auVar122._60_4_ = uVar1;
                  auVar280 = vmaxps_avx512f(auVar280,auVar122);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar123._4_4_ = uVar1;
                  auVar123._0_4_ = uVar1;
                  auVar123._8_4_ = uVar1;
                  auVar123._12_4_ = uVar1;
                  auVar123._16_4_ = uVar1;
                  auVar123._20_4_ = uVar1;
                  auVar123._24_4_ = uVar1;
                  auVar123._28_4_ = uVar1;
                  auVar123._32_4_ = uVar1;
                  auVar123._36_4_ = uVar1;
                  auVar123._40_4_ = uVar1;
                  auVar123._44_4_ = uVar1;
                  auVar123._48_4_ = uVar1;
                  auVar123._52_4_ = uVar1;
                  auVar123._56_4_ = uVar1;
                  auVar123._60_4_ = uVar1;
                  auVar280 = vminps_avx512f(auVar280,auVar123);
                  break;
                case 4:
                  auVar280 = vxorps_avx512dq(auVar280,auVar274);
                  auVar280 = vminps_avx512f(auVar280,(undefined1  [64])afVar312);
                  auVar280 = vmaxps_avx512f(auVar280,(undefined1  [64])afVar313);
                  auVar281 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar280,
                                                 (undefined1  [64])afVar320);
                  auVar282 = vrndscaleps_avx512f(auVar281,1);
                  uVar143 = vcmpps_avx512f(auVar281,auVar282,1);
                  auVar281 = vsubps_avx512f(auVar282,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar294._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar282._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar294._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar282._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar294._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar282._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar294._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar282._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar294._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar282._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar294._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar282._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar294._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar282._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar294._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar282._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar294._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar282._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar294._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar282._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar294._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar282._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar294._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar282._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar294._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar282._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar294._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar282._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar294._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar282._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar294._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar282._60_4_
                  ;
                  auVar280 = vfmadd231ps_avx512f(auVar280,auVar294,auVar275);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar280,auVar294,auVar276);
                  auVar280 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar281 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar281 = vfmadd213ps_avx512f(auVar281,in_ZMM16,(undefined1  [64])afVar317);
                  auVar281 = vfmadd213ps_avx512f(auVar281,in_ZMM16,(undefined1  [64])afVar318);
                  auVar281 = vfmadd213ps_avx512f(auVar281,in_ZMM16,(undefined1  [64])afVar319);
                  auVar281 = vfmadd213ps_avx512f(auVar281,in_ZMM16,(undefined1  [64])afVar320);
                  auVar280 = vfmadd213ps_avx512f(auVar281,auVar280,in_ZMM16);
                  auVar280 = vaddps_avx512f(auVar280,(undefined1  [64])afVar311);
                  auVar281 = vcvttps2dq_avx512f(auVar294);
                  auVar281 = vpaddd_avx512f(auVar281,auVar277);
                  auVar281 = vpslld_avx512f(auVar281,0x17);
                  auVar280 = vfmadd213ps_avx512f(auVar281,auVar280,auVar278);
                  auVar281 = vrcp14ps_avx512f(auVar280);
                  auVar280 = vfmsub213ps_avx512f(auVar280,auVar281,auVar278);
                  auVar280 = vfnmadd132ps_avx512vl(auVar280,auVar281,auVar281);
                  break;
                case 5:
                  auVar281 = vminps_avx512f(auVar280,(undefined1  [64])afVar312);
                  auVar281 = vmaxps_avx512f(auVar281,(undefined1  [64])afVar313);
                  auVar282 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar281,
                                                 (undefined1  [64])afVar320);
                  auVar283 = vrndscaleps_avx512f(auVar282,1);
                  uVar143 = vcmpps_avx512f(auVar282,auVar283,1);
                  auVar282 = vsubps_avx512f(auVar283,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar289._0_4_ = (uint)bVar37 * auVar282._0_4_ | (uint)!bVar37 * auVar283._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar289._4_4_ = (uint)bVar37 * auVar282._4_4_ | (uint)!bVar37 * auVar283._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar289._8_4_ = (uint)bVar37 * auVar282._8_4_ | (uint)!bVar37 * auVar283._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar289._12_4_ = (uint)bVar37 * auVar282._12_4_ | (uint)!bVar37 * auVar283._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar289._16_4_ = (uint)bVar37 * auVar282._16_4_ | (uint)!bVar37 * auVar283._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar289._20_4_ = (uint)bVar37 * auVar282._20_4_ | (uint)!bVar37 * auVar283._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar289._24_4_ = (uint)bVar37 * auVar282._24_4_ | (uint)!bVar37 * auVar283._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar289._28_4_ = (uint)bVar37 * auVar282._28_4_ | (uint)!bVar37 * auVar283._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar289._32_4_ = (uint)bVar37 * auVar282._32_4_ | (uint)!bVar37 * auVar283._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar289._36_4_ = (uint)bVar37 * auVar282._36_4_ | (uint)!bVar37 * auVar283._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar289._40_4_ = (uint)bVar37 * auVar282._40_4_ | (uint)!bVar37 * auVar283._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar289._44_4_ = (uint)bVar37 * auVar282._44_4_ | (uint)!bVar37 * auVar283._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar289._48_4_ = (uint)bVar37 * auVar282._48_4_ | (uint)!bVar37 * auVar283._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar289._52_4_ = (uint)bVar37 * auVar282._52_4_ | (uint)!bVar37 * auVar283._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar289._56_4_ = (uint)bVar37 * auVar282._56_4_ | (uint)!bVar37 * auVar283._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar289._60_4_ = (uint)bVar37 * auVar282._60_4_ | (uint)!bVar37 * auVar283._60_4_
                  ;
                  auVar281 = vfmadd231ps_avx512f(auVar281,auVar289,auVar275);
                  auVar281 = vfmadd231ps_avx512f(auVar281,auVar289,auVar276);
                  auVar282 = vmulps_avx512f(auVar281,auVar281);
                  auVar283 = vfmadd213ps_avx512f(auVar281,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar317);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar318);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar319);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar320);
                  auVar281 = vfmadd213ps_avx512f(auVar283,auVar282,auVar281);
                  auVar281 = vaddps_avx512f(auVar281,(undefined1  [64])afVar311);
                  auVar282 = vcvttps2dq_avx512f(auVar289);
                  auVar282 = vpaddd_avx512f(auVar282,auVar277);
                  auVar282 = vpslld_avx512f(auVar282,0x17);
                  auVar281 = vfmadd213ps_avx512f(auVar282,auVar281,auVar278);
                  auVar282 = vmaxps_avx512f(auVar281,(undefined1  [64])_ps512_min_norm_pos);
                  auVar283 = vpsrld_avx512f(auVar282,0x17);
                  auVar282 = vpternlogd_avx512f(auVar282,(undefined1  [64])afVar320,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar143 = vcmpps_avx512f(auVar282,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar284 = vsubps_avx512f(auVar282,(undefined1  [64])afVar311);
                  auVar282 = vaddps_avx512f(auVar284,auVar282);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar290._0_4_ = (uint)bVar37 * auVar282._0_4_ | (uint)!bVar37 * auVar284._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar290._4_4_ = (uint)bVar37 * auVar282._4_4_ | (uint)!bVar37 * auVar284._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar290._8_4_ = (uint)bVar37 * auVar282._8_4_ | (uint)!bVar37 * auVar284._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar290._12_4_ = (uint)bVar37 * auVar282._12_4_ | (uint)!bVar37 * auVar284._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar290._16_4_ = (uint)bVar37 * auVar282._16_4_ | (uint)!bVar37 * auVar284._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar290._20_4_ = (uint)bVar37 * auVar282._20_4_ | (uint)!bVar37 * auVar284._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar290._24_4_ = (uint)bVar37 * auVar282._24_4_ | (uint)!bVar37 * auVar284._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar290._28_4_ = (uint)bVar37 * auVar282._28_4_ | (uint)!bVar37 * auVar284._28_4_
                  ;
                  bVar31 = (byte)(uVar143 >> 8);
                  bVar37 = (bool)(bVar31 & 1);
                  auVar290._32_4_ = (uint)bVar37 * auVar282._32_4_ | (uint)!bVar37 * auVar284._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar290._36_4_ = (uint)bVar37 * auVar282._36_4_ | (uint)!bVar37 * auVar284._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar290._40_4_ = (uint)bVar37 * auVar282._40_4_ | (uint)!bVar37 * auVar284._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar290._44_4_ = (uint)bVar37 * auVar282._44_4_ | (uint)!bVar37 * auVar284._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar290._48_4_ = (uint)bVar37 * auVar282._48_4_ | (uint)!bVar37 * auVar284._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar290._52_4_ = (uint)bVar37 * auVar282._52_4_ | (uint)!bVar37 * auVar284._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar290._56_4_ = (uint)bVar37 * auVar282._56_4_ | (uint)!bVar37 * auVar284._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar290._60_4_ = (uint)bVar37 * auVar282._60_4_ | (uint)!bVar37 * auVar284._60_4_
                  ;
                  auVar282 = vmulps_avx512f(auVar290,auVar290);
                  auVar284 = vfmadd132ps_avx512f(auVar290,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p2);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar290,
                                                 (undefined1  [64])_ps512_cephes_log_p3);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar290,(undefined1  [64])afVar474);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar290,(undefined1  [64])afVar321);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar290,(undefined1  [64])afVar322);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar290,(undefined1  [64])afVar323);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar290,(undefined1  [64])afVar324);
                  auVar285 = vmulps_avx512f(auVar282,auVar290);
                  auVar284 = vfmadd213ps_avx512f(auVar285,auVar284,auVar290);
                  uVar157 = vcmpps_avx512f(auVar281,in_ZMM29,2);
                  auVar281 = vpsubd_avx512f(auVar283,auVar277);
                  auVar281 = vcvtdq2ps_avx512f(auVar281);
                  auVar283 = vaddps_avx512f(auVar281,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar292._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar283._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar292._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar283._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar292._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar283._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar292._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar283._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar292._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar283._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar292._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar283._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar292._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar283._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar292._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar283._28_4_
                  ;
                  bVar37 = (bool)(bVar31 & 1);
                  auVar292._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar283._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar292._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar283._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar292._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar283._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar292._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar283._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar292._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar283._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar292._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar283._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar292._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar283._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar292._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar283._60_4_
                  ;
                  auVar281 = vfmadd231ps_avx512f(auVar284,auVar292,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar281 = vfmadd231ps_avx512f(auVar281,auVar291,auVar282);
                  auVar281 = vfmadd231ps_avx512f(auVar281,auVar292,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar281 = vmulps_avx512f(auVar281,auVar279);
                  auVar282 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar293._0_4_ = (uint)bVar37 * auVar282._0_4_ | (uint)!bVar37 * auVar281._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar293._4_4_ = (uint)bVar37 * auVar282._4_4_ | (uint)!bVar37 * auVar281._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar293._8_4_ = (uint)bVar37 * auVar282._8_4_ | (uint)!bVar37 * auVar281._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar293._12_4_ = (uint)bVar37 * auVar282._12_4_ | (uint)!bVar37 * auVar281._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  auVar293._16_4_ = (uint)bVar37 * auVar282._16_4_ | (uint)!bVar37 * auVar281._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  auVar293._20_4_ = (uint)bVar37 * auVar282._20_4_ | (uint)!bVar37 * auVar281._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  auVar293._24_4_ = (uint)bVar37 * auVar282._24_4_ | (uint)!bVar37 * auVar281._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  auVar293._28_4_ = (uint)bVar37 * auVar282._28_4_ | (uint)!bVar37 * auVar281._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 8) & 1);
                  auVar293._32_4_ = (uint)bVar37 * auVar282._32_4_ | (uint)!bVar37 * auVar281._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  auVar293._36_4_ = (uint)bVar37 * auVar282._36_4_ | (uint)!bVar37 * auVar281._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  auVar293._40_4_ = (uint)bVar37 * auVar282._40_4_ | (uint)!bVar37 * auVar281._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  auVar293._44_4_ = (uint)bVar37 * auVar282._44_4_ | (uint)!bVar37 * auVar281._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  auVar293._48_4_ = (uint)bVar37 * auVar282._48_4_ | (uint)!bVar37 * auVar281._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  auVar293._52_4_ = (uint)bVar37 * auVar282._52_4_ | (uint)!bVar37 * auVar281._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  auVar293._56_4_ = (uint)bVar37 * auVar282._56_4_ | (uint)!bVar37 * auVar281._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  auVar293._60_4_ = (uint)bVar37 * auVar282._60_4_ | (uint)!bVar37 * auVar281._60_4_
                  ;
                  auVar281 = vminps_avx512f(auVar293,(undefined1  [64])afVar312);
                  auVar281 = vmaxps_avx512f(auVar281,(undefined1  [64])afVar313);
                  auVar282 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar281,
                                                 (undefined1  [64])afVar320);
                  auVar283 = vrndscaleps_avx512f(auVar282,1);
                  uVar143 = vcmpps_avx512f(auVar282,auVar283,1);
                  auVar282 = vsubps_avx512f(auVar283,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  in_ZMM16._0_4_ = (uint)bVar37 * auVar282._0_4_ | (uint)!bVar37 * auVar283._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar37 * auVar282._4_4_ | (uint)!bVar37 * auVar283._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar37 * auVar282._8_4_ | (uint)!bVar37 * auVar283._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar37 * auVar282._12_4_ | (uint)!bVar37 * auVar283._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar37 * auVar282._16_4_ | (uint)!bVar37 * auVar283._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar37 * auVar282._20_4_ | (uint)!bVar37 * auVar283._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar37 * auVar282._24_4_ | (uint)!bVar37 * auVar283._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar37 * auVar282._28_4_ | (uint)!bVar37 * auVar283._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar37 * auVar282._32_4_ | (uint)!bVar37 * auVar283._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar37 * auVar282._36_4_ | (uint)!bVar37 * auVar283._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar37 * auVar282._40_4_ | (uint)!bVar37 * auVar283._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar37 * auVar282._44_4_ | (uint)!bVar37 * auVar283._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar37 * auVar282._48_4_ | (uint)!bVar37 * auVar283._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar37 * auVar282._52_4_ | (uint)!bVar37 * auVar283._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar37 * auVar282._56_4_ | (uint)!bVar37 * auVar283._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar37 * auVar282._60_4_ | (uint)!bVar37 * auVar283._60_4_
                  ;
                  auVar281 = vfmadd231ps_avx512f(auVar281,in_ZMM16,auVar275);
                  auVar281 = vfmadd231ps_avx512f(auVar281,in_ZMM16,auVar276);
                  auVar282 = vmulps_avx512f(auVar281,auVar281);
                  auVar283 = vfmadd213ps_avx512f(auVar281,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar317);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar318);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar319);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar320);
                  auVar281 = vfmadd213ps_avx512f(auVar283,auVar282,auVar281);
                  auVar281 = vaddps_avx512f(auVar281,(undefined1  [64])afVar311);
                  auVar282 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar282 = vpaddd_avx512f(auVar282,auVar277);
                  auVar282 = vpslld_avx512f(auVar282,0x17);
                  auVar281 = vfmadd213ps_avx512f(auVar282,auVar281,auVar278);
                  auVar282 = vrcp14ps_avx512f(auVar281);
                  auVar281 = vfmsub213ps_avx512f(auVar281,auVar282,auVar278);
                  auVar281 = vfnmadd132ps_avx512vl(auVar281,auVar282,auVar282);
                  auVar281 = vfnmsub213ps_avx512f(auVar281,auVar279,auVar278);
                  auVar280 = vmulps_avx512f(auVar281,auVar280);
                  break;
                case 6:
                  auVar281 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var141)));
                  uVar146 = (*(uint **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar288._4_4_ = uVar146;
                  auVar288._0_4_ = uVar146;
                  auVar288._8_4_ = uVar146;
                  auVar288._12_4_ = uVar146;
                  auVar288._16_4_ = uVar146;
                  auVar288._20_4_ = uVar146;
                  auVar288._24_4_ = uVar146;
                  auVar288._28_4_ = uVar146;
                  auVar288._32_4_ = uVar146;
                  auVar288._36_4_ = uVar146;
                  auVar288._40_4_ = uVar146;
                  auVar288._44_4_ = uVar146;
                  auVar288._48_4_ = uVar146;
                  auVar288._52_4_ = uVar146;
                  auVar288._56_4_ = uVar146;
                  auVar288._60_4_ = uVar146;
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar280,auVar288);
                  auVar281 = vmaxps_avx512f(auVar281,in_ZMM29);
                  auVar281 = vminps_avx512f(auVar281,auVar278);
                  auVar280 = vmulps_avx512f(auVar281,auVar280);
                }
                *(undefined1 (*) [64])ppp_Var150 = auVar280;
                ppp_Var150 = ppp_Var150 + 8;
                uVar161 = uVar161 + 1;
                iVar139 = iVar139 + 1;
              } while (uVar161 != local_118.w);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
        in_ZMM13 = afVar318;
      } while (local_1e0 != local_118.c);
    }
    if (((iVar9 == 0x10) && (uVar145 == 8)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      iVar138 = *(int *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_1e0 = 0;
      auVar244._8_4_ = 0x42b0c0a5;
      auVar244._0_8_ = 0x42b0c0a542b0c0a5;
      auVar244._12_4_ = 0x42b0c0a5;
      auVar244._16_4_ = 0x42b0c0a5;
      auVar244._20_4_ = 0x42b0c0a5;
      auVar244._24_4_ = 0x42b0c0a5;
      auVar244._28_4_ = 0x42b0c0a5;
      auVar245._8_4_ = 0xc2b0c0a5;
      auVar245._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar245._12_4_ = 0xc2b0c0a5;
      auVar245._16_4_ = 0xc2b0c0a5;
      auVar245._20_4_ = 0xc2b0c0a5;
      auVar245._24_4_ = 0xc2b0c0a5;
      auVar245._28_4_ = 0xc2b0c0a5;
      auVar246._8_4_ = 0x3f000000;
      auVar246._0_8_ = 0x3f0000003f000000;
      auVar246._12_4_ = 0x3f000000;
      auVar246._16_4_ = 0x3f000000;
      auVar246._20_4_ = 0x3f000000;
      auVar246._24_4_ = 0x3f000000;
      auVar246._28_4_ = 0x3f000000;
      auVar247._8_4_ = 0x3fb8aa3b;
      auVar247._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar247._12_4_ = 0x3fb8aa3b;
      auVar247._16_4_ = 0x3fb8aa3b;
      auVar247._20_4_ = 0x3fb8aa3b;
      auVar247._24_4_ = 0x3fb8aa3b;
      auVar247._28_4_ = 0x3fb8aa3b;
      auVar248._8_4_ = 0x3f800000;
      auVar248._0_8_ = 0x3f8000003f800000;
      auVar248._12_4_ = 0x3f800000;
      auVar248._16_4_ = 0x3f800000;
      auVar248._20_4_ = 0x3f800000;
      auVar248._24_4_ = 0x3f800000;
      auVar248._28_4_ = 0x3f800000;
      auVar249._8_4_ = 0x3f318000;
      auVar249._0_8_ = 0x3f3180003f318000;
      auVar249._12_4_ = 0x3f318000;
      auVar249._16_4_ = 0x3f318000;
      auVar249._20_4_ = 0x3f318000;
      auVar249._24_4_ = 0x3f318000;
      auVar249._28_4_ = 0x3f318000;
      auVar222 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar250._8_4_ = 0x3ab743ce;
      auVar250._0_8_ = 0x3ab743ce3ab743ce;
      auVar250._12_4_ = 0x3ab743ce;
      auVar250._16_4_ = 0x3ab743ce;
      auVar250._20_4_ = 0x3ab743ce;
      auVar250._24_4_ = 0x3ab743ce;
      auVar250._28_4_ = 0x3ab743ce;
      auVar251._8_4_ = 0x3c088908;
      auVar251._0_8_ = 0x3c0889083c088908;
      auVar251._12_4_ = 0x3c088908;
      auVar251._16_4_ = 0x3c088908;
      auVar251._20_4_ = 0x3c088908;
      auVar251._24_4_ = 0x3c088908;
      auVar251._28_4_ = 0x3c088908;
      auVar252._8_4_ = 0x3d2aa9c1;
      auVar252._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar252._12_4_ = 0x3d2aa9c1;
      auVar252._16_4_ = 0x3d2aa9c1;
      auVar252._20_4_ = 0x3d2aa9c1;
      auVar252._24_4_ = 0x3d2aa9c1;
      auVar252._28_4_ = 0x3d2aa9c1;
      auVar253._8_4_ = 0x3e2aaaaa;
      auVar253._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar253._12_4_ = 0x3e2aaaaa;
      auVar253._16_4_ = 0x3e2aaaaa;
      auVar253._20_4_ = 0x3e2aaaaa;
      auVar253._24_4_ = 0x3e2aaaaa;
      auVar253._28_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT3264(auVar253);
      auVar254._8_4_ = 0x3f800000;
      auVar254._0_8_ = 0x3f8000003f800000;
      auVar254._12_4_ = 0x3f800000;
      auVar254._16_4_ = 0x3f800000;
      auVar254._20_4_ = 0x3f800000;
      auVar254._24_4_ = 0x3f800000;
      auVar254._28_4_ = 0x3f800000;
      auVar255._8_4_ = 0xb95e8083;
      auVar255._0_8_ = 0xb95e8083b95e8083;
      auVar255._12_4_ = 0xb95e8083;
      auVar255._16_4_ = 0xb95e8083;
      auVar255._20_4_ = 0xb95e8083;
      auVar255._24_4_ = 0xb95e8083;
      auVar255._28_4_ = 0xb95e8083;
      auVar223 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        if (0 < local_118.h) {
          iVar139 = bottom_blob->w;
          iVar134 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar13 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x20;
          unaff_R13 = 0;
          do {
            if (0 < local_118.w) {
              uVar160 = 0;
              iVar135 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar274 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar274 = ZEXT3264(*(undefined1 (*) [32])(lVar155 + local_1e0 * 0x20));
                }
                if (0 < (int)uVar13) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar136 = (((int)uVar157 - uVar11) + 1) * iVar10 + (int)unaff_R13;
                        if ((((-1 < iVar136) &&
                             (iVar137 = iVar136 / iVar158, iVar136 % iVar158 == 0)) &&
                            (0 < (int)uVar140)) && (iVar137 < iVar134)) {
                          lVar144 = (long)iVar137 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar136 = iVar135;
                          do {
                            if (((-1 < iVar136) &&
                                (iVar137 = iVar136 / iVar156, iVar136 % iVar156 == 0)) &&
                               (iVar137 < iVar139)) {
                              lVar142 = (long)(iVar137 << 4);
                              uVar12 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144);
                              auVar440._4_4_ = uVar12;
                              auVar440._0_4_ = uVar12;
                              auVar440._8_4_ = uVar12;
                              auVar440._12_4_ = uVar12;
                              auVar440._16_4_ = uVar12;
                              auVar440._20_4_ = uVar12;
                              auVar440._24_4_ = uVar12;
                              auVar440._28_4_ = uVar12;
                              uVar12 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144 + 4);
                              auVar438._4_4_ = uVar12;
                              auVar438._0_4_ = uVar12;
                              auVar438._8_4_ = uVar12;
                              auVar438._12_4_ = uVar12;
                              auVar438._16_4_ = uVar12;
                              auVar438._20_4_ = uVar12;
                              auVar438._24_4_ = uVar12;
                              auVar438._28_4_ = uVar12;
                              auVar224 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              in_ZMM16 = ZEXT3264(auVar224);
                              auVar225 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              auVar226 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x10)))
                              ;
                              auVar227 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x14)))
                              ;
                              in_ZMM20 = ZEXT3264(auVar227);
                              auVar228 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x18)))
                              ;
                              auVar229 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x1c)))
                              ;
                              auVar230 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x20)))
                              ;
                              auVar231 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x24)))
                              ;
                              auVar232 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x28)))
                              ;
                              auVar233 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x2c)))
                              ;
                              auVar234 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x30)))
                              ;
                              auVar235 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x34)))
                              ;
                              in_ZMM29 = ZEXT3264(auVar235);
                              auVar236 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x38)))
                              ;
                              auVar237 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x3c)))
                              ;
                              in_ZMM21 = (float  [16])ZEXT3264(auVar237);
                              uVar163 = uVar154 & 0xffffffff;
                              auVar168 = vfmadd231ps_fma(auVar274._0_32_,auVar440,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar151 + uVar163 * 4));
                              auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar438,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar151 + uVar163 * 4 + 0x20));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar168),auVar224,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x40));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar225,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x60));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar226,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x80));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar227,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xa0));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar228,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xc0));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar229,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xe0));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar230,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x100));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar231,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x120));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar232,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x140));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar233,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x160));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar234,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x180));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar235,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x1a0));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar236,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x1c0));
                              auVar224 = vfmadd231ps_avx512vl
                                                   (auVar224,auVar237,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x1e0));
                              auVar274 = ZEXT3264(auVar224);
                            }
                            uVar154 = uVar154 + 0x80;
                            iVar136 = iVar136 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 0x80;
                      } while (uVar157 != uVar11);
                    }
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x80) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar13);
                }
                auVar224 = auVar274._0_32_;
                if (iVar138 - 1U < 6) {
                  auVar225 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar275._28_36_ = auVar274._28_36_;
                  switch(iVar138) {
                  case 1:
                    auVar224 = vmaxps_avx(auVar224,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar226 = vmaxps_avx(auVar224,auVar225);
                    auVar224 = vminps_avx(auVar224,auVar225);
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar91._4_4_ = uVar12;
                    auVar91._0_4_ = uVar12;
                    auVar91._8_4_ = uVar12;
                    auVar91._12_4_ = uVar12;
                    auVar91._16_4_ = uVar12;
                    auVar91._20_4_ = uVar12;
                    auVar91._24_4_ = uVar12;
                    auVar91._28_4_ = uVar12;
                    auVar224 = vfmadd132ps_avx512vl(auVar224,auVar226,auVar91);
                    break;
                  case 3:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar89._4_4_ = uVar12;
                    auVar89._0_4_ = uVar12;
                    auVar89._8_4_ = uVar12;
                    auVar89._12_4_ = uVar12;
                    auVar89._16_4_ = uVar12;
                    auVar89._20_4_ = uVar12;
                    auVar89._24_4_ = uVar12;
                    auVar89._28_4_ = uVar12;
                    auVar224 = vmaxps_avx512vl(auVar224,auVar89);
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                    auVar90._4_4_ = uVar12;
                    auVar90._0_4_ = uVar12;
                    auVar90._8_4_ = uVar12;
                    auVar90._12_4_ = uVar12;
                    auVar90._16_4_ = uVar12;
                    auVar90._20_4_ = uVar12;
                    auVar90._24_4_ = uVar12;
                    auVar90._28_4_ = uVar12;
                    auVar224 = vminps_avx512vl(auVar224,auVar90);
                    break;
                  case 4:
                    auVar87._8_4_ = 0x80000000;
                    auVar87._0_8_ = 0x8000000080000000;
                    auVar87._12_4_ = 0x80000000;
                    auVar87._16_4_ = 0x80000000;
                    auVar87._20_4_ = 0x80000000;
                    auVar87._24_4_ = 0x80000000;
                    auVar87._28_4_ = 0x80000000;
                    auVar224 = vxorps_avx512vl(auVar224,auVar87);
                    auVar224 = vminps_avx(auVar224,auVar244);
                    auVar224 = vmaxps_avx(auVar224,auVar245);
                    auVar168 = vfmadd231ps_fma(auVar246,auVar224,auVar247);
                    auVar225 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar225,1);
                    auVar226 = vsubps_avx512vl(auVar225,auVar248);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar243._0_4_ = (uint)bVar37 * auVar226._0_4_ | (uint)!bVar37 * auVar225._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar243._4_4_ = (uint)bVar37 * auVar226._4_4_ | (uint)!bVar37 * auVar225._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar243._8_4_ = (uint)bVar37 * auVar226._8_4_ | (uint)!bVar37 * auVar225._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar243._12_4_ =
                         (uint)bVar37 * auVar226._12_4_ | (uint)!bVar37 * auVar225._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar243._16_4_ =
                         (uint)bVar37 * auVar226._16_4_ | (uint)!bVar37 * auVar225._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar243._20_4_ =
                         (uint)bVar37 * auVar226._20_4_ | (uint)!bVar37 * auVar225._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar243._24_4_ =
                         (uint)bVar37 * auVar226._24_4_ | (uint)!bVar37 * auVar225._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar243._28_4_ =
                         (uint)bVar37 * auVar226._28_4_ | (uint)!bVar37 * auVar225._28_4_;
                    in_ZMM16 = ZEXT3264(auVar243);
                    auVar224 = vfmsub231ps_avx512vl(auVar224,auVar243,auVar249);
                    auVar88._8_4_ = 0x395e8083;
                    auVar88._0_8_ = 0x395e8083395e8083;
                    auVar88._12_4_ = 0x395e8083;
                    auVar88._16_4_ = 0x395e8083;
                    auVar88._20_4_ = 0x395e8083;
                    auVar88._24_4_ = 0x395e8083;
                    auVar88._28_4_ = 0x395e8083;
                    auVar224 = vfmsub231ps_avx512vl(auVar224,auVar243,auVar88);
                    auVar413._0_4_ = auVar224._0_4_ * auVar224._0_4_;
                    auVar413._4_4_ = auVar224._4_4_ * auVar224._4_4_;
                    auVar413._8_4_ = auVar224._8_4_ * auVar224._8_4_;
                    auVar413._12_4_ = auVar224._12_4_ * auVar224._12_4_;
                    auVar413._16_4_ = auVar224._16_4_ * auVar224._16_4_;
                    auVar413._20_4_ = auVar224._20_4_ * auVar224._20_4_;
                    auVar413._24_4_ = auVar224._24_4_ * auVar224._24_4_;
                    auVar413._28_4_ = 0;
                    auVar168 = vfmadd213ps_fma(auVar222,auVar224,auVar250);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar224,auVar251);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar224,auVar252);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar224,auVar253);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar224,auVar246);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar413,auVar224);
                    auVar414._0_4_ = auVar168._0_4_ + 1.0;
                    auVar414._4_4_ = auVar168._4_4_ + 1.0;
                    auVar414._8_4_ = auVar168._8_4_ + 1.0;
                    auVar414._12_4_ = auVar168._12_4_ + 1.0;
                    auVar414._16_4_ = 0x3f800000;
                    auVar414._20_4_ = 0x3f800000;
                    auVar414._24_4_ = 0x3f800000;
                    auVar414._28_4_ = 0x3f800000;
                    auVar224 = vcvttps2dq_avx512vl(auVar243);
                    auVar224 = vpslld_avx2(auVar224,0x17);
                    auVar224 = vpaddd_avx2(auVar254,auVar224);
                    auVar168 = vfmadd213ps_fma(auVar224,auVar414,auVar248);
                    auVar224 = vrcpps_avx(ZEXT1632(auVar168));
                    auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar224,auVar248);
                    auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar224,auVar224);
                    auVar224 = ZEXT1632(auVar168);
                    break;
                  case 5:
                    auVar224 = vminps_avx(auVar224,auVar244);
                    auVar224 = vmaxps_avx(auVar224,auVar245);
                    auVar168 = vfmadd213ps_fma(auVar247,auVar224,auVar246);
                    auVar226 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar226,1);
                    auVar227 = vsubps_avx512vl(auVar226,auVar248);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar238._0_4_ = (uint)bVar37 * auVar227._0_4_ | (uint)!bVar37 * auVar226._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar238._4_4_ = (uint)bVar37 * auVar227._4_4_ | (uint)!bVar37 * auVar226._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar238._8_4_ = (uint)bVar37 * auVar227._8_4_ | (uint)!bVar37 * auVar226._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar238._12_4_ =
                         (uint)bVar37 * auVar227._12_4_ | (uint)!bVar37 * auVar226._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar238._16_4_ =
                         (uint)bVar37 * auVar227._16_4_ | (uint)!bVar37 * auVar226._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar238._20_4_ =
                         (uint)bVar37 * auVar227._20_4_ | (uint)!bVar37 * auVar226._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar238._24_4_ =
                         (uint)bVar37 * auVar227._24_4_ | (uint)!bVar37 * auVar226._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar238._28_4_ =
                         (uint)bVar37 * auVar227._28_4_ | (uint)!bVar37 * auVar226._28_4_;
                    auVar224 = vfmsub231ps_avx512vl(auVar224,auVar238,auVar249);
                    auVar224 = vfnmsub231ps_avx512vl(auVar224,auVar238,auVar255);
                    auVar439._0_4_ = auVar224._0_4_ * auVar224._0_4_;
                    auVar439._4_4_ = auVar224._4_4_ * auVar224._4_4_;
                    auVar439._8_4_ = auVar224._8_4_ * auVar224._8_4_;
                    auVar439._12_4_ = auVar224._12_4_ * auVar224._12_4_;
                    auVar439._16_4_ = auVar224._16_4_ * auVar224._16_4_;
                    auVar439._20_4_ = auVar224._20_4_ * auVar224._20_4_;
                    auVar439._24_4_ = auVar224._24_4_ * auVar224._24_4_;
                    auVar439._28_4_ = 0;
                    auVar226 = vfmadd213ps_avx512vl(auVar222,auVar224,auVar250);
                    auVar226 = vfmadd213ps_avx512vl(auVar226,auVar224,auVar251);
                    auVar226 = vfmadd213ps_avx512vl(auVar226,auVar224,auVar252);
                    auVar226 = vfmadd213ps_avx512vl(auVar226,auVar224,auVar253);
                    auVar226 = vfmadd213ps_avx512vl(auVar226,auVar224,auVar246);
                    auVar224 = vfmadd213ps_avx512vl(auVar226,auVar439,auVar224);
                    auVar226 = vaddps_avx512vl(auVar224,auVar248);
                    auVar224 = vcvttps2dq_avx512vl(auVar238);
                    auVar224 = vpslld_avx2(auVar224,0x17);
                    auVar224 = vpaddd_avx2(auVar224,auVar254);
                    auVar168 = vfmadd213ps_fma(auVar224,auVar226,auVar248);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar225,2);
                    auVar224._8_4_ = 0x800000;
                    auVar224._0_8_ = 0x80000000800000;
                    auVar224._12_4_ = 0x800000;
                    auVar224._16_4_ = 0x800000;
                    auVar224._20_4_ = 0x800000;
                    auVar224._24_4_ = 0x800000;
                    auVar224._28_4_ = 0x800000;
                    auVar224 = vmaxps_avx512vl(ZEXT1632(auVar168),auVar224);
                    auVar440 = vpsrld_avx2(auVar224,0x17);
                    auVar226 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar225._8_4_ = 0x3f000000;
                    auVar225._0_8_ = 0x3f0000003f000000;
                    auVar225._12_4_ = 0x3f000000;
                    auVar225._16_4_ = 0x3f000000;
                    auVar225._20_4_ = 0x3f000000;
                    auVar225._24_4_ = 0x3f000000;
                    auVar225._28_4_ = 0x3f000000;
                    auVar224 = vpternlogd_avx512vl(auVar224,auVar226,auVar225,0xea);
                    auVar228._8_4_ = 0x3f3504f3;
                    auVar228._0_8_ = 0x3f3504f33f3504f3;
                    auVar228._12_4_ = 0x3f3504f3;
                    auVar228._16_4_ = 0x3f3504f3;
                    auVar228._20_4_ = 0x3f3504f3;
                    auVar228._24_4_ = 0x3f3504f3;
                    auVar228._28_4_ = 0x3f3504f3;
                    uVar157 = vcmpps_avx512vl(auVar224,auVar228,1);
                    auVar225 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                    in_ZMM20 = ZEXT3264(auVar225);
                    auVar226 = vaddps_avx512vl(auVar224,auVar225);
                    auVar224 = vaddps_avx512vl(auVar226,auVar224);
                    bVar37 = (bool)((byte)uVar157 & 1);
                    auVar239._0_4_ = (uint)bVar37 * auVar224._0_4_ | (uint)!bVar37 * auVar226._0_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                    auVar239._4_4_ = (uint)bVar37 * auVar224._4_4_ | (uint)!bVar37 * auVar226._4_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                    auVar239._8_4_ = (uint)bVar37 * auVar224._8_4_ | (uint)!bVar37 * auVar226._8_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                    auVar239._12_4_ =
                         (uint)bVar37 * auVar224._12_4_ | (uint)!bVar37 * auVar226._12_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                    auVar239._16_4_ =
                         (uint)bVar37 * auVar224._16_4_ | (uint)!bVar37 * auVar226._16_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                    auVar239._20_4_ =
                         (uint)bVar37 * auVar224._20_4_ | (uint)!bVar37 * auVar226._20_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                    auVar239._24_4_ =
                         (uint)bVar37 * auVar224._24_4_ | (uint)!bVar37 * auVar226._24_4_;
                    bVar37 = SUB81(uVar157 >> 7,0);
                    auVar239._28_4_ =
                         (uint)bVar37 * auVar224._28_4_ | (uint)!bVar37 * auVar226._28_4_;
                    auVar226 = vmulps_avx512vl(auVar239,auVar239);
                    auVar224 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                    auVar229._8_4_ = 0xbdebd1b8;
                    auVar229._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar229._12_4_ = 0xbdebd1b8;
                    auVar229._16_4_ = 0xbdebd1b8;
                    auVar229._20_4_ = 0xbdebd1b8;
                    auVar229._24_4_ = 0xbdebd1b8;
                    auVar229._28_4_ = 0xbdebd1b8;
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar239,auVar229);
                    auVar230._8_4_ = 0x3def251a;
                    auVar230._0_8_ = 0x3def251a3def251a;
                    auVar230._12_4_ = 0x3def251a;
                    auVar230._16_4_ = 0x3def251a;
                    auVar230._20_4_ = 0x3def251a;
                    auVar230._24_4_ = 0x3def251a;
                    auVar230._28_4_ = 0x3def251a;
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar239,auVar230);
                    auVar231._8_4_ = 0xbdfe5d4f;
                    auVar231._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar231._12_4_ = 0xbdfe5d4f;
                    auVar231._16_4_ = 0xbdfe5d4f;
                    auVar231._20_4_ = 0xbdfe5d4f;
                    auVar231._24_4_ = 0xbdfe5d4f;
                    auVar231._28_4_ = 0xbdfe5d4f;
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar239,auVar231);
                    auVar232._8_4_ = 0x3e11e9bf;
                    auVar232._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar232._12_4_ = 0x3e11e9bf;
                    auVar232._16_4_ = 0x3e11e9bf;
                    auVar232._20_4_ = 0x3e11e9bf;
                    auVar232._24_4_ = 0x3e11e9bf;
                    auVar232._28_4_ = 0x3e11e9bf;
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar239,auVar232);
                    auVar233._8_4_ = 0xbe2aae50;
                    auVar233._0_8_ = 0xbe2aae50be2aae50;
                    auVar233._12_4_ = 0xbe2aae50;
                    auVar233._16_4_ = 0xbe2aae50;
                    auVar233._20_4_ = 0xbe2aae50;
                    auVar233._24_4_ = 0xbe2aae50;
                    auVar233._28_4_ = 0xbe2aae50;
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar239,auVar233);
                    auVar234._8_4_ = 0x3e4cceac;
                    auVar234._0_8_ = 0x3e4cceac3e4cceac;
                    auVar234._12_4_ = 0x3e4cceac;
                    auVar234._16_4_ = 0x3e4cceac;
                    auVar234._20_4_ = 0x3e4cceac;
                    auVar234._24_4_ = 0x3e4cceac;
                    auVar234._28_4_ = 0x3e4cceac;
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar239,auVar234);
                    auVar235._8_4_ = 0xbe7ffffc;
                    auVar235._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar235._12_4_ = 0xbe7ffffc;
                    auVar235._16_4_ = 0xbe7ffffc;
                    auVar235._20_4_ = 0xbe7ffffc;
                    auVar235._24_4_ = 0xbe7ffffc;
                    auVar235._28_4_ = 0xbe7ffffc;
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar239,auVar235);
                    auVar236._8_4_ = 0x3eaaaaaa;
                    auVar236._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar236._12_4_ = 0x3eaaaaaa;
                    auVar236._16_4_ = 0x3eaaaaaa;
                    auVar236._20_4_ = 0x3eaaaaaa;
                    auVar236._24_4_ = 0x3eaaaaaa;
                    auVar236._28_4_ = 0x3eaaaaaa;
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar239,auVar236);
                    auVar227 = vmulps_avx512vl(auVar226,auVar239);
                    auVar227 = vmulps_avx512vl(auVar227,auVar224);
                    auVar237._8_4_ = 0xffffff82;
                    auVar237._0_8_ = 0xffffff82ffffff82;
                    auVar237._12_4_ = 0xffffff82;
                    auVar237._16_4_ = 0xffffff82;
                    auVar237._20_4_ = 0xffffff82;
                    auVar237._24_4_ = 0xffffff82;
                    auVar237._28_4_ = 0xffffff82;
                    auVar224 = vpaddd_avx512vl(auVar440,auVar237);
                    auVar224 = vcvtdq2ps_avx(auVar224);
                    auVar228 = vsubps_avx512vl(auVar224,auVar248);
                    bVar37 = (bool)((byte)uVar157 & 1);
                    auVar240._0_4_ = (uint)bVar37 * auVar228._0_4_ | (uint)!bVar37 * auVar224._0_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                    auVar240._4_4_ = (uint)bVar37 * auVar228._4_4_ | (uint)!bVar37 * auVar224._4_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                    auVar240._8_4_ = (uint)bVar37 * auVar228._8_4_ | (uint)!bVar37 * auVar224._8_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                    auVar240._12_4_ =
                         (uint)bVar37 * auVar228._12_4_ | (uint)!bVar37 * auVar224._12_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                    auVar240._16_4_ =
                         (uint)bVar37 * auVar228._16_4_ | (uint)!bVar37 * auVar224._16_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                    auVar240._20_4_ =
                         (uint)bVar37 * auVar228._20_4_ | (uint)!bVar37 * auVar224._20_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                    auVar240._24_4_ =
                         (uint)bVar37 * auVar228._24_4_ | (uint)!bVar37 * auVar224._24_4_;
                    bVar37 = SUB81(uVar157 >> 7,0);
                    auVar240._28_4_ =
                         (uint)bVar37 * auVar228._28_4_ | (uint)!bVar37 * auVar224._28_4_;
                    auVar224 = vfmadd231ps_avx512vl(auVar227,auVar240,auVar255);
                    auVar224 = vfmsub231ps_avx512vl(auVar224,auVar246,auVar226);
                    auVar224 = vsubps_avx512vl(auVar224,auVar239);
                    auVar168 = vfmsub231ps_fma(auVar224,auVar249,auVar240);
                    auVar224 = vmulps_avx512vl(ZEXT1632(auVar168),auVar223);
                    auVar226 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar241._0_4_ = (uint)bVar37 * auVar226._0_4_ | (uint)!bVar37 * auVar224._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar241._4_4_ = (uint)bVar37 * auVar226._4_4_ | (uint)!bVar37 * auVar224._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar241._8_4_ = (uint)bVar37 * auVar226._8_4_ | (uint)!bVar37 * auVar224._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar241._12_4_ =
                         (uint)bVar37 * auVar226._12_4_ | (uint)!bVar37 * auVar224._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar241._16_4_ =
                         (uint)bVar37 * auVar226._16_4_ | (uint)!bVar37 * auVar224._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar241._20_4_ =
                         (uint)bVar37 * auVar226._20_4_ | (uint)!bVar37 * auVar224._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar241._24_4_ =
                         (uint)bVar37 * auVar226._24_4_ | (uint)!bVar37 * auVar224._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar241._28_4_ =
                         (uint)bVar37 * auVar226._28_4_ | (uint)!bVar37 * auVar224._28_4_;
                    auVar224 = vminps_avx(auVar241,auVar244);
                    auVar224 = vmaxps_avx(auVar224,auVar245);
                    auVar168 = vfmadd213ps_fma(auVar247,auVar224,auVar246);
                    auVar226 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar226,1);
                    auVar227 = vsubps_avx512vl(auVar226,auVar248);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar242._0_4_ = (uint)bVar37 * auVar227._0_4_ | (uint)!bVar37 * auVar226._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar242._4_4_ = (uint)bVar37 * auVar227._4_4_ | (uint)!bVar37 * auVar226._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar242._8_4_ = (uint)bVar37 * auVar227._8_4_ | (uint)!bVar37 * auVar226._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar242._12_4_ =
                         (uint)bVar37 * auVar227._12_4_ | (uint)!bVar37 * auVar226._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar242._16_4_ =
                         (uint)bVar37 * auVar227._16_4_ | (uint)!bVar37 * auVar226._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar242._20_4_ =
                         (uint)bVar37 * auVar227._20_4_ | (uint)!bVar37 * auVar226._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar242._24_4_ =
                         (uint)bVar37 * auVar227._24_4_ | (uint)!bVar37 * auVar226._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar242._28_4_ =
                         (uint)bVar37 * auVar227._28_4_ | (uint)!bVar37 * auVar226._28_4_;
                    in_ZMM16 = ZEXT3264(auVar242);
                    auVar224 = vfmsub231ps_avx512vl(auVar224,auVar242,auVar249);
                    auVar224 = vfnmsub231ps_avx512vl(auVar224,auVar242,auVar255);
                    auVar441._0_4_ = auVar224._0_4_ * auVar224._0_4_;
                    auVar441._4_4_ = auVar224._4_4_ * auVar224._4_4_;
                    auVar441._8_4_ = auVar224._8_4_ * auVar224._8_4_;
                    auVar441._12_4_ = auVar224._12_4_ * auVar224._12_4_;
                    auVar441._16_4_ = auVar224._16_4_ * auVar224._16_4_;
                    auVar441._20_4_ = auVar224._20_4_ * auVar224._20_4_;
                    auVar441._24_4_ = auVar224._24_4_ * auVar224._24_4_;
                    auVar441._28_4_ = 0;
                    auVar226 = vfmadd213ps_avx512vl(auVar222,auVar224,auVar250);
                    auVar226 = vfmadd213ps_avx512vl(auVar226,auVar224,auVar251);
                    auVar226 = vfmadd213ps_avx512vl(auVar226,auVar224,auVar252);
                    auVar226 = vfmadd213ps_avx512vl(auVar226,auVar224,auVar253);
                    auVar226 = vfmadd213ps_avx512vl(auVar226,auVar224,auVar246);
                    auVar224 = vfmadd213ps_avx512vl(auVar226,auVar441,auVar224);
                    auVar226 = vaddps_avx512vl(auVar224,auVar248);
                    auVar224 = vcvttps2dq_avx512vl(auVar242);
                    auVar224 = vpslld_avx2(auVar224,0x17);
                    auVar224 = vpaddd_avx2(auVar224,auVar254);
                    auVar168 = vfmadd213ps_fma(auVar224,auVar226,auVar248);
                    auVar224 = vrcpps_avx(ZEXT1632(auVar168));
                    auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar224,auVar248);
                    auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar224,auVar224);
                    auVar224 = vfnmadd213ps_avx512vl(ZEXT1632(auVar168),auVar223,auVar225);
                    auVar275._0_4_ = auVar224._0_4_ * auVar274._0_4_;
                    auVar275._4_4_ = auVar224._4_4_ * auVar274._4_4_;
                    auVar275._8_4_ = auVar224._8_4_ * auVar274._8_4_;
                    auVar275._12_4_ = auVar224._12_4_ * auVar274._12_4_;
                    auVar275._16_4_ = auVar224._16_4_ * auVar274._16_4_;
                    auVar275._20_4_ = auVar224._20_4_ * auVar274._20_4_;
                    auVar275._24_4_ = auVar224._24_4_ * auVar274._24_4_;
                    auVar224 = auVar275._0_32_;
                    break;
                  case 6:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar227._4_4_ = uVar12;
                    auVar227._0_4_ = uVar12;
                    auVar227._8_4_ = uVar12;
                    auVar227._12_4_ = uVar12;
                    auVar227._16_4_ = uVar12;
                    auVar227._20_4_ = uVar12;
                    auVar227._24_4_ = uVar12;
                    auVar227._28_4_ = uVar12;
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                    auVar226._4_4_ = uVar12;
                    auVar226._0_4_ = uVar12;
                    auVar226._8_4_ = uVar12;
                    auVar226._12_4_ = uVar12;
                    auVar226._16_4_ = uVar12;
                    auVar226._20_4_ = uVar12;
                    auVar226._24_4_ = uVar12;
                    auVar226._28_4_ = uVar12;
                    auVar224 = vfmadd213ps_avx512vl(auVar227,auVar224,auVar226);
                    auVar224 = vmaxps_avx(auVar224,auVar225);
                    auVar224 = vminps_avx(auVar224,auVar248);
                    auVar276._0_4_ = auVar224._0_4_ * auVar274._0_4_;
                    auVar276._4_4_ = auVar224._4_4_ * auVar274._4_4_;
                    auVar276._8_4_ = auVar224._8_4_ * auVar274._8_4_;
                    auVar276._12_4_ = auVar224._12_4_ * auVar274._12_4_;
                    auVar276._16_4_ = auVar224._16_4_ * auVar274._16_4_;
                    auVar276._20_4_ = auVar224._20_4_ * auVar274._20_4_;
                    auVar276._24_4_ = auVar224._24_4_ * auVar274._24_4_;
                    auVar276._28_36_ = auVar275._28_36_;
                    auVar224 = auVar276._0_32_;
                  }
                }
                *(undefined1 (*) [32])ppp_Var150 = auVar224;
                ppp_Var150 = ppp_Var150 + 4;
                uVar160 = uVar160 + 1;
                iVar135 = iVar135 + 1;
              } while (uVar160 != local_118.w);
            }
            uVar160 = (int)unaff_R13 + 1;
            unaff_R13 = (ulong)uVar160;
          } while (uVar160 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_118.c);
    }
    afVar326 = _ps512_cephes_log_p8;
    afVar325 = _ps512_cephes_log_p7;
    afVar324 = _ps512_cephes_log_p6;
    afVar323 = _ps512_cephes_log_p5;
    afVar322 = _ps512_cephes_log_p4;
    afVar321 = _ps512_cephes_log_p3;
    afVar474 = _ps512_cephes_log_p2;
    afVar320 = _ps512_cephes_exp_p5;
    afVar319 = _ps512_cephes_exp_p4;
    afVar318 = _ps512_cephes_exp_p3;
    afVar317 = _ps512_cephes_exp_p2;
    afVar316 = _ps512_cephes_exp_p1;
    afVar315 = _ps512_cephes_exp_p0;
    afVar314 = _ps512_cephes_LOG2EF;
    afVar313 = _ps512_exp_lo;
    afVar312 = _ps512_exp_hi;
    afVar311 = _ps512_1;
    if (((iVar9 == 4) && (uVar145 == 0x10)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      in_ZMM20 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar274 = vxorps_avx512dq(in_ZMM20,(undefined1  [64])_ps512_cephes_log_q2);
      auVar275 = vxorps_avx512dq(in_ZMM20,(undefined1  [64])_ps512_cephes_log_q1);
      auVar276 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar277 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,in_ZMM20);
      local_1e0 = 0;
      auVar168 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      in_ZMM29 = ZEXT1664(auVar168);
      auVar291 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar278 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if (0 < local_118.h) {
          uVar13 = bottom_blob->w;
          unaff_R13 = (ulong)uVar13;
          iVar138 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar160 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x40;
          uVar153 = 0;
          do {
            if (0 < local_118.w) {
              uVar161 = 0;
              iVar139 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar279 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar279 = *(undefined1 (*) [64])(lVar155 + local_1e0 * 0x40);
                }
                if (0 < (int)uVar160) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar134 = (((int)uVar157 - uVar11) + 1) * iVar10 + uVar153;
                        if ((((-1 < iVar134) &&
                             (iVar135 = iVar134 / iVar158, iVar134 % iVar158 == 0)) &&
                            (0 < (int)uVar140)) && (iVar135 < iVar138)) {
                          lVar144 = (long)iVar135 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar134 = iVar139;
                          do {
                            if (((-1 < iVar134) &&
                                (iVar135 = iVar134 / iVar156, iVar134 % iVar156 == 0)) &&
                               (iVar135 < (int)uVar13)) {
                              lVar142 = (long)(iVar135 << 2);
                              auVar280 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144)));
                              auVar281 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 4)));
                              in_ZMM16 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              auVar282 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              uVar163 = uVar154 & 0xffffffff;
                              auVar279 = vfmadd231ps_avx512f(auVar279,auVar280,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4));
                              auVar279 = vfmadd231ps_avx512f(auVar279,auVar281,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0x40))
                              ;
                              auVar279 = vfmadd231ps_avx512f(auVar279,in_ZMM16,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0x80))
                              ;
                              auVar279 = vfmadd231ps_avx512f(auVar279,auVar282,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar151 + uVar163 * 4 + 0xc0))
                              ;
                            }
                            uVar154 = uVar154 + 0x40;
                            iVar134 = iVar134 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 0x40;
                      } while (uVar157 != uVar11);
                    }
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x40) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                switch(uVar12) {
                case 1:
                  auVar279 = vmaxps_avx512f(auVar279,in_ZMM29);
                  break;
                case 2:
                  uVar143 = vcmpps_avx512f(auVar279,in_ZMM29,1);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar128._4_4_ = uVar1;
                  auVar128._0_4_ = uVar1;
                  auVar128._8_4_ = uVar1;
                  auVar128._12_4_ = uVar1;
                  auVar128._16_4_ = uVar1;
                  auVar128._20_4_ = uVar1;
                  auVar128._24_4_ = uVar1;
                  auVar128._28_4_ = uVar1;
                  auVar128._32_4_ = uVar1;
                  auVar128._36_4_ = uVar1;
                  auVar128._40_4_ = uVar1;
                  auVar128._44_4_ = uVar1;
                  auVar128._48_4_ = uVar1;
                  auVar128._52_4_ = uVar1;
                  auVar128._56_4_ = uVar1;
                  auVar128._60_4_ = uVar1;
                  auVar280 = vmulps_avx512f(auVar279,auVar128);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar301._0_4_ = (uint)bVar37 * auVar280._0_4_ | (uint)!bVar37 * auVar279._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar301._4_4_ = (uint)bVar37 * auVar280._4_4_ | (uint)!bVar37 * auVar279._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar301._8_4_ = (uint)bVar37 * auVar280._8_4_ | (uint)!bVar37 * auVar279._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar301._12_4_ = (uint)bVar37 * auVar280._12_4_ | (uint)!bVar37 * auVar279._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar301._16_4_ = (uint)bVar37 * auVar280._16_4_ | (uint)!bVar37 * auVar279._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar301._20_4_ = (uint)bVar37 * auVar280._20_4_ | (uint)!bVar37 * auVar279._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar301._24_4_ = (uint)bVar37 * auVar280._24_4_ | (uint)!bVar37 * auVar279._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar301._28_4_ = (uint)bVar37 * auVar280._28_4_ | (uint)!bVar37 * auVar279._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar301._32_4_ = (uint)bVar37 * auVar280._32_4_ | (uint)!bVar37 * auVar279._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar301._36_4_ = (uint)bVar37 * auVar280._36_4_ | (uint)!bVar37 * auVar279._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar301._40_4_ = (uint)bVar37 * auVar280._40_4_ | (uint)!bVar37 * auVar279._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar301._44_4_ = (uint)bVar37 * auVar280._44_4_ | (uint)!bVar37 * auVar279._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar301._48_4_ = (uint)bVar37 * auVar280._48_4_ | (uint)!bVar37 * auVar279._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar301._52_4_ = (uint)bVar37 * auVar280._52_4_ | (uint)!bVar37 * auVar279._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar301._56_4_ = (uint)bVar37 * auVar280._56_4_ | (uint)!bVar37 * auVar279._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar301._60_4_ = (uint)bVar37 * auVar280._60_4_ | (uint)!bVar37 * auVar279._60_4_
                  ;
                  auVar279 = auVar301;
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar126._4_4_ = uVar1;
                  auVar126._0_4_ = uVar1;
                  auVar126._8_4_ = uVar1;
                  auVar126._12_4_ = uVar1;
                  auVar126._16_4_ = uVar1;
                  auVar126._20_4_ = uVar1;
                  auVar126._24_4_ = uVar1;
                  auVar126._28_4_ = uVar1;
                  auVar126._32_4_ = uVar1;
                  auVar126._36_4_ = uVar1;
                  auVar126._40_4_ = uVar1;
                  auVar126._44_4_ = uVar1;
                  auVar126._48_4_ = uVar1;
                  auVar126._52_4_ = uVar1;
                  auVar126._56_4_ = uVar1;
                  auVar126._60_4_ = uVar1;
                  auVar279 = vmaxps_avx512f(auVar279,auVar126);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar127._4_4_ = uVar1;
                  auVar127._0_4_ = uVar1;
                  auVar127._8_4_ = uVar1;
                  auVar127._12_4_ = uVar1;
                  auVar127._16_4_ = uVar1;
                  auVar127._20_4_ = uVar1;
                  auVar127._24_4_ = uVar1;
                  auVar127._28_4_ = uVar1;
                  auVar127._32_4_ = uVar1;
                  auVar127._36_4_ = uVar1;
                  auVar127._40_4_ = uVar1;
                  auVar127._44_4_ = uVar1;
                  auVar127._48_4_ = uVar1;
                  auVar127._52_4_ = uVar1;
                  auVar127._56_4_ = uVar1;
                  auVar127._60_4_ = uVar1;
                  auVar279 = vminps_avx512f(auVar279,auVar127);
                  break;
                case 4:
                  auVar279 = vxorps_avx512dq(auVar279,in_ZMM20);
                  auVar279 = vminps_avx512f(auVar279,(undefined1  [64])afVar312);
                  auVar279 = vmaxps_avx512f(auVar279,(undefined1  [64])afVar313);
                  auVar280 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar279,
                                                 (undefined1  [64])afVar320);
                  auVar281 = vrndscaleps_avx512f(auVar280,1);
                  uVar143 = vcmpps_avx512f(auVar280,auVar281,1);
                  auVar280 = vsubps_avx512f(auVar281,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar300._0_4_ = (uint)bVar37 * auVar280._0_4_ | (uint)!bVar37 * auVar281._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar300._4_4_ = (uint)bVar37 * auVar280._4_4_ | (uint)!bVar37 * auVar281._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar300._8_4_ = (uint)bVar37 * auVar280._8_4_ | (uint)!bVar37 * auVar281._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar300._12_4_ = (uint)bVar37 * auVar280._12_4_ | (uint)!bVar37 * auVar281._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar300._16_4_ = (uint)bVar37 * auVar280._16_4_ | (uint)!bVar37 * auVar281._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar300._20_4_ = (uint)bVar37 * auVar280._20_4_ | (uint)!bVar37 * auVar281._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar300._24_4_ = (uint)bVar37 * auVar280._24_4_ | (uint)!bVar37 * auVar281._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar300._28_4_ = (uint)bVar37 * auVar280._28_4_ | (uint)!bVar37 * auVar281._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar300._32_4_ = (uint)bVar37 * auVar280._32_4_ | (uint)!bVar37 * auVar281._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar300._36_4_ = (uint)bVar37 * auVar280._36_4_ | (uint)!bVar37 * auVar281._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar300._40_4_ = (uint)bVar37 * auVar280._40_4_ | (uint)!bVar37 * auVar281._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar300._44_4_ = (uint)bVar37 * auVar280._44_4_ | (uint)!bVar37 * auVar281._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar300._48_4_ = (uint)bVar37 * auVar280._48_4_ | (uint)!bVar37 * auVar281._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar300._52_4_ = (uint)bVar37 * auVar280._52_4_ | (uint)!bVar37 * auVar281._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar300._56_4_ = (uint)bVar37 * auVar280._56_4_ | (uint)!bVar37 * auVar281._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar300._60_4_ = (uint)bVar37 * auVar280._60_4_ | (uint)!bVar37 * auVar281._60_4_
                  ;
                  auVar279 = vfmadd231ps_avx512f(auVar279,auVar300,auVar274);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar279,auVar300,auVar275);
                  auVar279 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar280 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar280 = vfmadd213ps_avx512f(auVar280,in_ZMM16,(undefined1  [64])afVar317);
                  auVar280 = vfmadd213ps_avx512f(auVar280,in_ZMM16,(undefined1  [64])afVar318);
                  auVar280 = vfmadd213ps_avx512f(auVar280,in_ZMM16,(undefined1  [64])afVar319);
                  auVar280 = vfmadd213ps_avx512f(auVar280,in_ZMM16,(undefined1  [64])afVar320);
                  auVar279 = vfmadd213ps_avx512f(auVar280,auVar279,in_ZMM16);
                  auVar279 = vaddps_avx512f(auVar279,(undefined1  [64])afVar311);
                  auVar280 = vcvttps2dq_avx512f(auVar300);
                  auVar280 = vpaddd_avx512f(auVar280,auVar276);
                  auVar280 = vpslld_avx512f(auVar280,0x17);
                  auVar279 = vfmadd213ps_avx512f(auVar280,auVar279,auVar291);
                  auVar280 = vrcp14ps_avx512f(auVar279);
                  auVar279 = vfmsub213ps_avx512f(auVar279,auVar280,auVar291);
                  auVar279 = vfnmadd132ps_avx512vl(auVar279,auVar280,auVar280);
                  break;
                case 5:
                  auVar280 = vminps_avx512f(auVar279,(undefined1  [64])afVar312);
                  auVar280 = vmaxps_avx512f(auVar280,(undefined1  [64])afVar313);
                  auVar281 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar280,
                                                 (undefined1  [64])afVar320);
                  auVar282 = vrndscaleps_avx512f(auVar281,1);
                  uVar143 = vcmpps_avx512f(auVar281,auVar282,1);
                  auVar281 = vsubps_avx512f(auVar282,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar296._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar282._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar296._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar282._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar296._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar282._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar296._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar282._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar296._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar282._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar296._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar282._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar296._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar282._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar296._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar282._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  auVar296._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar282._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar296._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar282._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar296._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar282._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar296._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar282._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar296._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar282._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar296._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar282._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar296._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar282._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar296._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar282._60_4_
                  ;
                  auVar280 = vfmadd231ps_avx512f(auVar280,auVar296,auVar274);
                  auVar280 = vfmadd231ps_avx512f(auVar280,auVar296,auVar275);
                  auVar281 = vmulps_avx512f(auVar280,auVar280);
                  auVar282 = vfmadd213ps_avx512f(auVar280,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar282 = vfmadd213ps_avx512f(auVar282,auVar280,(undefined1  [64])afVar317);
                  auVar282 = vfmadd213ps_avx512f(auVar282,auVar280,(undefined1  [64])afVar318);
                  auVar282 = vfmadd213ps_avx512f(auVar282,auVar280,(undefined1  [64])afVar319);
                  auVar282 = vfmadd213ps_avx512f(auVar282,auVar280,(undefined1  [64])afVar320);
                  auVar280 = vfmadd213ps_avx512f(auVar282,auVar281,auVar280);
                  auVar280 = vaddps_avx512f(auVar280,(undefined1  [64])afVar311);
                  auVar281 = vcvttps2dq_avx512f(auVar296);
                  auVar281 = vpaddd_avx512f(auVar281,auVar276);
                  auVar281 = vpslld_avx512f(auVar281,0x17);
                  auVar280 = vfmadd213ps_avx512f(auVar281,auVar280,auVar291);
                  auVar281 = vmaxps_avx512f(auVar280,(undefined1  [64])_ps512_min_norm_pos);
                  auVar282 = vpsrld_avx512f(auVar281,0x17);
                  auVar281 = vpternlogd_avx512f(auVar281,(undefined1  [64])afVar320,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar143 = vcmpps_avx512f(auVar281,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar283 = vsubps_avx512f(auVar281,(undefined1  [64])afVar311);
                  auVar281 = vaddps_avx512f(auVar283,auVar281);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar297._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar283._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar297._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar283._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar297._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar283._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar297._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar283._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar297._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar283._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar297._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar283._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar297._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar283._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar297._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar283._28_4_
                  ;
                  bVar31 = (byte)(uVar143 >> 8);
                  bVar37 = (bool)(bVar31 & 1);
                  auVar297._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar283._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar297._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar283._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar297._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar283._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar297._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar283._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar297._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar283._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar297._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar283._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar297._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar283._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar297._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar283._60_4_
                  ;
                  auVar281 = vmulps_avx512f(auVar297,auVar297);
                  auVar283 = vfmadd132ps_avx512f(auVar297,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar297,(undefined1  [64])afVar474);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar297,(undefined1  [64])afVar321);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar297,(undefined1  [64])afVar322);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar297,(undefined1  [64])afVar323);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar297,(undefined1  [64])afVar324);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar297,(undefined1  [64])afVar325);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar297,(undefined1  [64])afVar326);
                  auVar284 = vmulps_avx512f(auVar281,auVar297);
                  auVar283 = vfmadd213ps_avx512f(auVar284,auVar283,auVar297);
                  uVar157 = vcmpps_avx512f(auVar280,in_ZMM29,2);
                  auVar280 = vpsubd_avx512f(auVar282,auVar276);
                  auVar280 = vcvtdq2ps_avx512f(auVar280);
                  auVar282 = vaddps_avx512f(auVar280,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar298._0_4_ = (uint)bVar37 * auVar280._0_4_ | (uint)!bVar37 * auVar282._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar298._4_4_ = (uint)bVar37 * auVar280._4_4_ | (uint)!bVar37 * auVar282._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar298._8_4_ = (uint)bVar37 * auVar280._8_4_ | (uint)!bVar37 * auVar282._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar298._12_4_ = (uint)bVar37 * auVar280._12_4_ | (uint)!bVar37 * auVar282._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  auVar298._16_4_ = (uint)bVar37 * auVar280._16_4_ | (uint)!bVar37 * auVar282._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  auVar298._20_4_ = (uint)bVar37 * auVar280._20_4_ | (uint)!bVar37 * auVar282._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  auVar298._24_4_ = (uint)bVar37 * auVar280._24_4_ | (uint)!bVar37 * auVar282._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  auVar298._28_4_ = (uint)bVar37 * auVar280._28_4_ | (uint)!bVar37 * auVar282._28_4_
                  ;
                  bVar37 = (bool)(bVar31 & 1);
                  auVar298._32_4_ = (uint)bVar37 * auVar280._32_4_ | (uint)!bVar37 * auVar282._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  auVar298._36_4_ = (uint)bVar37 * auVar280._36_4_ | (uint)!bVar37 * auVar282._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  auVar298._40_4_ = (uint)bVar37 * auVar280._40_4_ | (uint)!bVar37 * auVar282._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  auVar298._44_4_ = (uint)bVar37 * auVar280._44_4_ | (uint)!bVar37 * auVar282._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  auVar298._48_4_ = (uint)bVar37 * auVar280._48_4_ | (uint)!bVar37 * auVar282._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  auVar298._52_4_ = (uint)bVar37 * auVar280._52_4_ | (uint)!bVar37 * auVar282._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  auVar298._56_4_ = (uint)bVar37 * auVar280._56_4_ | (uint)!bVar37 * auVar282._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  auVar298._60_4_ = (uint)bVar37 * auVar280._60_4_ | (uint)!bVar37 * auVar282._60_4_
                  ;
                  auVar280 = vfmadd231ps_avx512f(auVar283,auVar298,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar280 = vfmadd231ps_avx512f(auVar280,auVar277,auVar281);
                  auVar280 = vfmadd231ps_avx512f(auVar280,auVar298,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar280 = vmulps_avx512f(auVar280,auVar278);
                  auVar281 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar299._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar280._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar299._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar280._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar299._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar280._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar299._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar280._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  auVar299._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar280._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  auVar299._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar280._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  auVar299._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar280._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  auVar299._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar280._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 8) & 1);
                  auVar299._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar280._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  auVar299._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar280._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  auVar299._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar280._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  auVar299._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar280._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  auVar299._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar280._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  auVar299._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar280._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  auVar299._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar280._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  auVar299._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar280._60_4_
                  ;
                  auVar280 = vminps_avx512f(auVar299,(undefined1  [64])afVar312);
                  auVar280 = vmaxps_avx512f(auVar280,(undefined1  [64])afVar313);
                  auVar281 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar280,
                                                 (undefined1  [64])afVar320);
                  auVar282 = vrndscaleps_avx512f(auVar281,1);
                  uVar143 = vcmpps_avx512f(auVar281,auVar282,1);
                  auVar281 = vsubps_avx512f(auVar282,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  in_ZMM16._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar282._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar282._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar282._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar282._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar282._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar282._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar282._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar282._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar282._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar282._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar282._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar282._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar282._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar282._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar143 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar282._56_4_
                  ;
                  bVar37 = SUB81(uVar143 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar282._60_4_
                  ;
                  auVar280 = vfmadd231ps_avx512f(auVar280,in_ZMM16,auVar274);
                  auVar280 = vfmadd231ps_avx512f(auVar280,in_ZMM16,auVar275);
                  auVar281 = vmulps_avx512f(auVar280,auVar280);
                  auVar282 = vfmadd213ps_avx512f(auVar280,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar282 = vfmadd213ps_avx512f(auVar282,auVar280,(undefined1  [64])afVar317);
                  auVar282 = vfmadd213ps_avx512f(auVar282,auVar280,(undefined1  [64])afVar318);
                  auVar282 = vfmadd213ps_avx512f(auVar282,auVar280,(undefined1  [64])afVar319);
                  auVar282 = vfmadd213ps_avx512f(auVar282,auVar280,(undefined1  [64])afVar320);
                  auVar280 = vfmadd213ps_avx512f(auVar282,auVar281,auVar280);
                  auVar280 = vaddps_avx512f(auVar280,(undefined1  [64])afVar311);
                  auVar281 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar281 = vpaddd_avx512f(auVar281,auVar276);
                  auVar281 = vpslld_avx512f(auVar281,0x17);
                  auVar280 = vfmadd213ps_avx512f(auVar281,auVar280,auVar291);
                  auVar281 = vrcp14ps_avx512f(auVar280);
                  auVar280 = vfmsub213ps_avx512f(auVar280,auVar281,auVar291);
                  auVar280 = vfnmadd132ps_avx512vl(auVar280,auVar281,auVar281);
                  auVar280 = vfnmsub213ps_avx512f(auVar280,auVar278,auVar291);
                  auVar279 = vmulps_avx512f(auVar280,auVar279);
                  break;
                case 6:
                  auVar280 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var141)));
                  uVar146 = (*(uint **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar125._4_4_ = uVar146;
                  auVar125._0_4_ = uVar146;
                  auVar125._8_4_ = uVar146;
                  auVar125._12_4_ = uVar146;
                  auVar125._16_4_ = uVar146;
                  auVar125._20_4_ = uVar146;
                  auVar125._24_4_ = uVar146;
                  auVar125._28_4_ = uVar146;
                  auVar125._32_4_ = uVar146;
                  auVar125._36_4_ = uVar146;
                  auVar125._40_4_ = uVar146;
                  auVar125._44_4_ = uVar146;
                  auVar125._48_4_ = uVar146;
                  auVar125._52_4_ = uVar146;
                  auVar125._56_4_ = uVar146;
                  auVar125._60_4_ = uVar146;
                  auVar280 = vfmadd213ps_avx512f(auVar280,auVar279,auVar125);
                  auVar280 = vmaxps_avx512f(auVar280,in_ZMM29);
                  auVar280 = vminps_avx512f(auVar280,auVar291);
                  auVar279 = vmulps_avx512f(auVar280,auVar279);
                }
                *(undefined1 (*) [64])ppp_Var150 = auVar279;
                ppp_Var150 = ppp_Var150 + 8;
                uVar161 = uVar161 + 1;
                iVar139 = iVar139 + 1;
              } while (uVar161 != local_118.w);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
        in_ZMM13 = afVar318;
        in_ZMM21 = afVar474;
      } while (local_1e0 != local_118.c);
    }
    auVar168 = in_ZMM29._0_16_;
    if (((iVar9 == 0x10) && (uVar145 == 4)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_1e0 = 0;
      auVar191 = ZEXT816(0) << 0x40;
      auVar192._8_4_ = 0x42b0c0a5;
      auVar192._0_8_ = 0x42b0c0a542b0c0a5;
      auVar192._12_4_ = 0x42b0c0a5;
      auVar193._8_4_ = 0xc2b0c0a5;
      auVar193._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar193._12_4_ = 0xc2b0c0a5;
      auVar194._8_4_ = 0x3f000000;
      auVar194._0_8_ = 0x3f0000003f000000;
      auVar194._12_4_ = 0x3f000000;
      auVar195._8_4_ = 0x3fb8aa3b;
      auVar195._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar195._12_4_ = 0x3fb8aa3b;
      auVar196._8_4_ = 0x3f800000;
      auVar196._0_8_ = 0x3f8000003f800000;
      auVar196._12_4_ = 0x3f800000;
      auVar197._8_4_ = 0x3f318000;
      auVar197._0_8_ = 0x3f3180003f318000;
      auVar197._12_4_ = 0x3f318000;
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar209._8_4_ = 0x3ab743ce;
      auVar209._0_8_ = 0x3ab743ce3ab743ce;
      auVar209._12_4_ = 0x3ab743ce;
      auVar202._8_4_ = 0x3c088908;
      auVar202._0_8_ = 0x3c0889083c088908;
      auVar202._12_4_ = 0x3c088908;
      auVar198._8_4_ = 0x3d2aa9c1;
      auVar198._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar198._12_4_ = 0x3d2aa9c1;
      auVar199._8_4_ = 0x3e2aaaaa;
      auVar199._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar199._12_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT1664(auVar199);
      auVar200._8_4_ = 0x3f800000;
      auVar200._0_8_ = 0x3f8000003f800000;
      auVar200._12_4_ = 0x3f800000;
      auVar201._8_4_ = 0xb95e8083;
      auVar201._0_8_ = 0xb95e8083b95e8083;
      auVar201._12_4_ = 0xb95e8083;
      auVar170 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (0 < local_118.h) {
          iVar138 = bottom_blob->w;
          iVar139 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar13 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x10;
          unaff_R13 = 0;
          do {
            if (0 < local_118.w) {
              uVar160 = 0;
              iVar134 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar168 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar168 = *(undefined1 (*) [16])(lVar155 + local_1e0 * 0x10);
                }
                auVar274 = ZEXT1664(auVar168);
                if (0 < (int)uVar13) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar135 = (((int)uVar157 - uVar11) + 1) * iVar10 + (int)unaff_R13;
                        if ((((-1 < iVar135) &&
                             (iVar136 = iVar135 / iVar158, iVar135 % iVar158 == 0)) &&
                            (0 < (int)uVar140)) && (iVar136 < iVar139)) {
                          lVar144 = (long)iVar136 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          uVar154 = (ulong)uVar140;
                          uVar164 = uVar162;
                          iVar135 = iVar134;
                          do {
                            if (((-1 < iVar135) &&
                                (iVar136 = iVar135 / iVar156, iVar135 % iVar156 == 0)) &&
                               (iVar136 < iVar138)) {
                              lVar142 = (long)(iVar136 << 4);
                              uVar1 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144);
                              auVar168._4_4_ = uVar1;
                              auVar168._0_4_ = uVar1;
                              auVar168._8_4_ = uVar1;
                              auVar168._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144 + 4);
                              auVar427._4_4_ = uVar1;
                              auVar427._0_4_ = uVar1;
                              auVar427._8_4_ = uVar1;
                              auVar427._12_4_ = uVar1;
                              auVar171 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              in_ZMM16 = ZEXT1664(auVar171);
                              auVar172 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              auVar173 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x10)))
                              ;
                              auVar174 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x14)))
                              ;
                              in_ZMM20 = ZEXT1664(auVar174);
                              auVar175 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x18)))
                              ;
                              in_ZMM21 = (float  [16])ZEXT1664(auVar175);
                              auVar176 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x1c)))
                              ;
                              auVar177 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x20)))
                              ;
                              auVar178 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x24)))
                              ;
                              auVar179 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x28)))
                              ;
                              auVar180 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x2c)))
                              ;
                              auVar181 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x30)))
                              ;
                              auVar182 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x34)))
                              ;
                              auVar183 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x38)))
                              ;
                              in_ZMM29 = ZEXT1664(auVar183);
                              auVar184 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x3c)))
                              ;
                              uVar163 = uVar164 & 0xffffffff;
                              auVar168 = vfmadd231ps_fma(auVar274._0_16_,auVar168,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar151 + uVar163 * 4));
                              auVar168 = vfmadd231ps_fma(auVar168,auVar427,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar151 + uVar163 * 4 + 0x10));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar171,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x20));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar172,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x30));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar173,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x40));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar174,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x50));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar175,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x60));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar176,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x70));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar177,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x80));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar178,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x90));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar179,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xa0));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar180,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xb0));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar181,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xc0));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar182,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xd0));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar183,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xe0));
                              auVar168 = vfmadd231ps_avx512vl
                                                   (auVar168,auVar184,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xf0));
                              auVar274 = ZEXT1664(auVar168);
                            }
                            uVar164 = uVar164 + 0x40;
                            iVar135 = iVar135 + iVar147;
                            uVar154 = uVar154 - 1;
                          } while (uVar154 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 0x40;
                      } while (uVar157 != uVar11);
                    }
                    auVar168 = auVar274._0_16_;
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x40) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar13);
                }
                switch(uVar12) {
                case 1:
                  auVar168 = vmaxps_avx(auVar168,auVar191);
                  break;
                case 2:
                  auVar171 = vmaxps_avx(auVar168,auVar191);
                  auVar168 = vminps_avx(auVar168,auVar191);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar168 = vfmadd132ps_avx512vl(auVar168,auVar171,auVar49);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar47._4_4_ = uVar1;
                  auVar47._0_4_ = uVar1;
                  auVar47._8_4_ = uVar1;
                  auVar47._12_4_ = uVar1;
                  auVar168 = vmaxps_avx512vl(auVar168,auVar47);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar48._4_4_ = uVar1;
                  auVar48._0_4_ = uVar1;
                  auVar48._8_4_ = uVar1;
                  auVar48._12_4_ = uVar1;
                  auVar168 = vminps_avx512vl(auVar168,auVar48);
                  break;
                case 4:
                  auVar45._8_4_ = 0x80000000;
                  auVar45._0_8_ = 0x8000000080000000;
                  auVar45._12_4_ = 0x80000000;
                  auVar168 = vxorps_avx512vl(auVar168,auVar45);
                  auVar168 = vminps_avx(auVar168,auVar192);
                  auVar168 = vmaxps_avx(auVar168,auVar193);
                  auVar171 = vfmadd231ps_fma(auVar194,auVar168,auVar195);
                  auVar172 = vcvttps2dq_avx512vl(auVar171);
                  auVar172 = vcvtdq2ps_avx512vl(auVar172);
                  uVar143 = vcmpps_avx512vl(auVar171,auVar172,1);
                  auVar171 = vsubps_avx512vl(auVar172,auVar196);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar190._0_4_ = (uint)bVar37 * auVar171._0_4_ | (uint)!bVar37 * auVar172._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar190._4_4_ = (uint)bVar37 * auVar171._4_4_ | (uint)!bVar37 * auVar172._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar190._8_4_ = (uint)bVar37 * auVar171._8_4_ | (uint)!bVar37 * auVar172._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar190._12_4_ = (uint)bVar37 * auVar171._12_4_ | (uint)!bVar37 * auVar172._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar190);
                  auVar168 = vfmsub231ps_avx512vl(auVar168,auVar190,auVar197);
                  auVar46._8_4_ = 0x395e8083;
                  auVar46._0_8_ = 0x395e8083395e8083;
                  auVar46._12_4_ = 0x395e8083;
                  auVar171 = vfmsub231ps_avx512vl(auVar168,auVar190,auVar46);
                  auVar399._0_4_ = auVar171._0_4_ * auVar171._0_4_;
                  auVar399._4_4_ = auVar171._4_4_ * auVar171._4_4_;
                  auVar399._8_4_ = auVar171._8_4_ * auVar171._8_4_;
                  auVar399._12_4_ = auVar171._12_4_ * auVar171._12_4_;
                  auVar168 = vfmadd213ps_fma(auVar169,auVar171,auVar209);
                  auVar168 = vfmadd213ps_fma(auVar168,auVar171,auVar202);
                  auVar168 = vfmadd213ps_fma(auVar168,auVar171,auVar198);
                  auVar168 = vfmadd213ps_fma(auVar168,auVar171,auVar199);
                  auVar168 = vfmadd213ps_fma(auVar168,auVar171,auVar194);
                  auVar168 = vfmadd213ps_fma(auVar168,auVar399,auVar171);
                  auVar400._0_4_ = auVar168._0_4_ + 1.0;
                  auVar400._4_4_ = auVar168._4_4_ + 1.0;
                  auVar400._8_4_ = auVar168._8_4_ + 1.0;
                  auVar400._12_4_ = auVar168._12_4_ + 1.0;
                  auVar168 = vcvttps2dq_avx512vl(auVar190);
                  auVar168 = vpslld_avx(auVar168,0x17);
                  auVar168 = vpaddd_avx(auVar200,auVar168);
                  auVar171 = vfmadd213ps_fma(auVar168,auVar400,auVar196);
                  auVar168 = vrcpps_avx(auVar171);
                  auVar171 = vfmsub213ps_fma(auVar171,auVar168,auVar196);
                  auVar168 = vfnmadd132ps_fma(auVar171,auVar168,auVar168);
                  break;
                case 5:
                  auVar171 = vminps_avx(auVar168,auVar192);
                  auVar171 = vmaxps_avx(auVar171,auVar193);
                  auVar172 = vfmadd213ps_fma(auVar195,auVar171,auVar194);
                  auVar173 = vcvttps2dq_avx512vl(auVar172);
                  auVar173 = vcvtdq2ps_avx512vl(auVar173);
                  uVar143 = vcmpps_avx512vl(auVar172,auVar173,1);
                  auVar172 = vsubps_avx512vl(auVar173,auVar196);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar185._0_4_ = (uint)bVar37 * auVar172._0_4_ | (uint)!bVar37 * auVar173._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar185._4_4_ = (uint)bVar37 * auVar172._4_4_ | (uint)!bVar37 * auVar173._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar185._8_4_ = (uint)bVar37 * auVar172._8_4_ | (uint)!bVar37 * auVar173._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar185._12_4_ = (uint)bVar37 * auVar172._12_4_ | (uint)!bVar37 * auVar173._12_4_
                  ;
                  auVar171 = vfmsub231ps_avx512vl(auVar171,auVar185,auVar197);
                  auVar171 = vfnmsub231ps_avx512vl(auVar171,auVar185,auVar201);
                  auVar428._0_4_ = auVar171._0_4_ * auVar171._0_4_;
                  auVar428._4_4_ = auVar171._4_4_ * auVar171._4_4_;
                  auVar428._8_4_ = auVar171._8_4_ * auVar171._8_4_;
                  auVar428._12_4_ = auVar171._12_4_ * auVar171._12_4_;
                  auVar172 = vfmadd213ps_avx512vl(auVar169,auVar171,auVar209);
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar171,auVar202);
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar171,auVar198);
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar171,auVar199);
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar171,auVar194);
                  auVar171 = vfmadd213ps_avx512vl(auVar172,auVar428,auVar171);
                  auVar172 = vaddps_avx512vl(auVar171,auVar196);
                  auVar171 = vcvttps2dq_avx512vl(auVar185);
                  auVar171 = vpslld_avx(auVar171,0x17);
                  auVar171 = vpaddd_avx(auVar171,auVar200);
                  auVar171 = vfmadd213ps_fma(auVar171,auVar172,auVar196);
                  uVar143 = vcmpps_avx512vl(auVar171,auVar191,2);
                  auVar174._8_4_ = 0x800000;
                  auVar174._0_8_ = 0x80000000800000;
                  auVar174._12_4_ = 0x800000;
                  auVar171 = vmaxps_avx512vl(auVar171,auVar174);
                  auVar174 = vpsrld_avx(auVar171,0x17);
                  auVar172 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar175._8_4_ = 0x3f000000;
                  auVar175._0_8_ = 0x3f0000003f000000;
                  auVar175._12_4_ = 0x3f000000;
                  auVar171 = vpternlogd_avx512vl(auVar171,auVar172,auVar175,0xea);
                  auVar176._8_4_ = 0x3f3504f3;
                  auVar176._0_8_ = 0x3f3504f33f3504f3;
                  auVar176._12_4_ = 0x3f3504f3;
                  uVar157 = vcmpps_avx512vl(auVar171,auVar176,1);
                  auVar177._8_4_ = 0xbf800000;
                  auVar177._0_8_ = 0xbf800000bf800000;
                  auVar177._12_4_ = 0xbf800000;
                  auVar172 = vaddps_avx512vl(auVar171,auVar177);
                  auVar171 = vaddps_avx512vl(auVar172,auVar171);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar186._0_4_ = (uint)bVar37 * auVar171._0_4_ | (uint)!bVar37 * auVar172._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar186._4_4_ = (uint)bVar37 * auVar171._4_4_ | (uint)!bVar37 * auVar172._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar186._8_4_ = (uint)bVar37 * auVar171._8_4_ | (uint)!bVar37 * auVar172._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar186._12_4_ = (uint)bVar37 * auVar171._12_4_ | (uint)!bVar37 * auVar172._12_4_
                  ;
                  auVar172 = vmulps_avx512vl(auVar186,auVar186);
                  auVar171 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
                  auVar178._8_4_ = 0xbdebd1b8;
                  auVar178._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar178._12_4_ = 0xbdebd1b8;
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar186,auVar178);
                  auVar179._8_4_ = 0x3def251a;
                  auVar179._0_8_ = 0x3def251a3def251a;
                  auVar179._12_4_ = 0x3def251a;
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar186,auVar179);
                  auVar180._8_4_ = 0xbdfe5d4f;
                  auVar180._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar180._12_4_ = 0xbdfe5d4f;
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar186,auVar180);
                  auVar181._8_4_ = 0x3e11e9bf;
                  auVar181._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar181._12_4_ = 0x3e11e9bf;
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar186,auVar181);
                  auVar182._8_4_ = 0xbe2aae50;
                  auVar182._0_8_ = 0xbe2aae50be2aae50;
                  auVar182._12_4_ = 0xbe2aae50;
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar186,auVar182);
                  auVar183._8_4_ = 0x3e4cceac;
                  auVar183._0_8_ = 0x3e4cceac3e4cceac;
                  auVar183._12_4_ = 0x3e4cceac;
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar186,auVar183);
                  auVar184._8_4_ = 0xbe7ffffc;
                  auVar184._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar184._12_4_ = 0xbe7ffffc;
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar186,auVar184);
                  auVar43._8_4_ = 0x3eaaaaaa;
                  auVar43._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar43._12_4_ = 0x3eaaaaaa;
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar186,auVar43);
                  auVar173 = vmulps_avx512vl(auVar172,auVar186);
                  auVar173 = vmulps_avx512vl(auVar173,auVar171);
                  auVar44._8_4_ = 0xffffff82;
                  auVar44._0_8_ = 0xffffff82ffffff82;
                  auVar44._12_4_ = 0xffffff82;
                  auVar171 = vpaddd_avx512vl(auVar174,auVar44);
                  auVar171 = vcvtdq2ps_avx(auVar171);
                  auVar174 = vsubps_avx512vl(auVar171,auVar196);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar187._0_4_ = (uint)bVar37 * auVar174._0_4_ | (uint)!bVar37 * auVar171._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar187._4_4_ = (uint)bVar37 * auVar174._4_4_ | (uint)!bVar37 * auVar171._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar187._8_4_ = (uint)bVar37 * auVar174._8_4_ | (uint)!bVar37 * auVar171._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar187._12_4_ = (uint)bVar37 * auVar174._12_4_ | (uint)!bVar37 * auVar171._12_4_
                  ;
                  auVar171 = vfmadd231ps_avx512vl(auVar173,auVar187,auVar201);
                  auVar171 = vfmsub231ps_avx512vl(auVar171,auVar194,auVar172);
                  auVar171 = vsubps_avx512vl(auVar171,auVar186);
                  auVar171 = vfnmadd231ps_fma(auVar171,auVar197,auVar187);
                  auVar172 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar188._0_4_ =
                       (uint)bVar37 * auVar172._0_4_ |
                       (uint)!bVar37 * (int)(auVar171._0_4_ + auVar171._0_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar188._4_4_ =
                       (uint)bVar37 * auVar172._4_4_ |
                       (uint)!bVar37 * (int)(auVar171._4_4_ + auVar171._4_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar188._8_4_ =
                       (uint)bVar37 * auVar172._8_4_ |
                       (uint)!bVar37 * (int)(auVar171._8_4_ + auVar171._8_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar188._12_4_ =
                       (uint)bVar37 * auVar172._12_4_ |
                       (uint)!bVar37 * (int)(auVar171._12_4_ + auVar171._12_4_);
                  auVar171 = vminps_avx(auVar188,auVar192);
                  auVar171 = vmaxps_avx(auVar171,auVar193);
                  auVar172 = vfmadd213ps_fma(auVar195,auVar171,auVar194);
                  auVar173 = vcvttps2dq_avx512vl(auVar172);
                  auVar173 = vcvtdq2ps_avx512vl(auVar173);
                  uVar143 = vcmpps_avx512vl(auVar172,auVar173,1);
                  auVar172 = vsubps_avx512vl(auVar173,auVar196);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar189._0_4_ = (uint)bVar37 * auVar172._0_4_ | (uint)!bVar37 * auVar173._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar189._4_4_ = (uint)bVar37 * auVar172._4_4_ | (uint)!bVar37 * auVar173._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar189._8_4_ = (uint)bVar37 * auVar172._8_4_ | (uint)!bVar37 * auVar173._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar189._12_4_ = (uint)bVar37 * auVar172._12_4_ | (uint)!bVar37 * auVar173._12_4_
                  ;
                  auVar171 = vfmsub231ps_avx512vl(auVar171,auVar189,auVar197);
                  auVar171 = vfnmsub231ps_avx512vl(auVar171,auVar189,auVar201);
                  auVar429._0_4_ = auVar171._0_4_ * auVar171._0_4_;
                  auVar429._4_4_ = auVar171._4_4_ * auVar171._4_4_;
                  auVar429._8_4_ = auVar171._8_4_ * auVar171._8_4_;
                  auVar429._12_4_ = auVar171._12_4_ * auVar171._12_4_;
                  auVar172 = vfmadd213ps_avx512vl(auVar169,auVar171,auVar209);
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar171,auVar202);
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar171,auVar198);
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar171,auVar199);
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar171,auVar194);
                  auVar171 = vfmadd213ps_avx512vl(auVar172,auVar429,auVar171);
                  auVar172 = vaddps_avx512vl(auVar171,auVar196);
                  auVar171 = vcvttps2dq_avx512vl(auVar189);
                  auVar171 = vpslld_avx(auVar171,0x17);
                  auVar171 = vpaddd_avx(auVar171,auVar200);
                  auVar172 = vfmadd213ps_fma(auVar171,auVar172,auVar196);
                  auVar171 = vrcpps_avx(auVar172);
                  auVar173 = vaddps_avx512vl(auVar171,auVar171);
                  in_ZMM16 = ZEXT1664(auVar173);
                  auVar172 = vfmsub213ps_avx512vl(auVar172,auVar173,auVar170);
                  auVar171 = vfnmadd213ps_avx512vl(auVar172,auVar171,auVar173);
                  auVar168 = vfmsub231ps_fma(auVar168,auVar168,auVar171);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar173._4_4_ = uVar1;
                  auVar173._0_4_ = uVar1;
                  auVar173._8_4_ = uVar1;
                  auVar173._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar171._4_4_ = uVar1;
                  auVar171._0_4_ = uVar1;
                  auVar171._8_4_ = uVar1;
                  auVar171._12_4_ = uVar1;
                  auVar171 = vfmadd213ps_avx512vl(auVar173,auVar168,auVar171);
                  auVar171 = vmaxps_avx(auVar171,auVar191);
                  auVar171 = vminps_avx(auVar171,auVar196);
                  auVar172._0_4_ = auVar171._0_4_ * auVar168._0_4_;
                  auVar172._4_4_ = auVar171._4_4_ * auVar168._4_4_;
                  auVar172._8_4_ = auVar171._8_4_ * auVar168._8_4_;
                  auVar172._12_4_ = auVar171._12_4_ * auVar168._12_4_;
                  auVar168 = auVar172;
                }
                *(undefined1 (*) [16])ppp_Var150 = auVar168;
                ppp_Var150 = ppp_Var150 + 2;
                uVar160 = uVar160 + 1;
                iVar134 = iVar134 + 1;
              } while (uVar160 != local_118.w);
            }
            uVar160 = (int)unaff_R13 + 1;
            unaff_R13 = (ulong)uVar160;
          } while (uVar160 != local_118.h);
        }
        auVar168 = in_ZMM29._0_16_;
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_118.c);
    }
    afVar326 = _ps512_cephes_log_p8;
    afVar325 = _ps512_cephes_log_p7;
    afVar324 = _ps512_cephes_log_p6;
    afVar323 = _ps512_cephes_log_p5;
    afVar322 = _ps512_cephes_log_p4;
    afVar321 = _ps512_cephes_log_p3;
    afVar474 = _ps512_cephes_log_p2;
    afVar320 = _ps512_cephes_exp_p5;
    afVar319 = _ps512_cephes_exp_p4;
    afVar318 = _ps512_cephes_exp_p3;
    afVar317 = _ps512_cephes_exp_p2;
    afVar316 = _ps512_cephes_exp_p1;
    afVar315 = _ps512_cephes_exp_p0;
    afVar314 = _ps512_cephes_LOG2EF;
    afVar313 = _ps512_exp_lo;
    afVar312 = _ps512_exp_hi;
    afVar311 = _ps512_1;
    if (((iVar9 == 1) && (uVar145 == 0x10)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar143 = (ulong)uVar140;
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      in_ZMM20 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar274 = vxorps_avx512dq(in_ZMM20,(undefined1  [64])_ps512_cephes_log_q2);
      auVar275 = vxorps_avx512dq(in_ZMM20,(undefined1  [64])_ps512_cephes_log_q1);
      auVar276 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar277 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,in_ZMM20);
      local_1e0 = 0;
      auVar168 = vxorps_avx512vl(auVar168,auVar168);
      auVar279 = ZEXT1664(auVar168);
      auVar291 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar278 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if (0 < local_118.h) {
          iVar138 = bottom_blob->w;
          iVar139 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar13 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x40;
          uVar160 = 0;
          do {
            if (0 < local_118.w) {
              pvVar151 = (void *)0x0;
              iVar134 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar280 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar280 = *(undefined1 (*) [64])(lVar155 + local_1e0 * 0x40);
                }
                if (0 < (int)uVar13) {
                  pvVar152 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar157 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar154 = 0;
                      uVar162 = 0;
                      do {
                        iVar135 = (((int)uVar162 - uVar11) + 1) * iVar10 + uVar160;
                        if ((((-1 < iVar135) &&
                             (iVar136 = iVar135 / iVar158, iVar135 % iVar158 == 0)) &&
                            (iVar136 < iVar139)) && (unaff_R13 = uVar143, 0 < (int)uVar140)) {
                          uVar164 = uVar154;
                          iVar135 = iVar134;
                          do {
                            if (((-1 < iVar135) &&
                                (iVar137 = iVar135 / iVar156, iVar135 % iVar156 == 0)) &&
                               (iVar137 < iVar138)) {
                              auVar281 = vbroadcastss_avx512f
                                                   (ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                     (long)iVar137 * 4 +
                                                                     (long)iVar136 *
                                                                     (long)bottom_blob->w *
                                                                     bottom_blob->elemsize +
                                                                     bottom_blob->cstep *
                                                                     bottom_blob->elemsize * uVar157
                                                                     )));
                              auVar280 = vfmadd231ps_avx512f(auVar280,auVar281,
                                                             *(undefined1 (*) [64])
                                                              ((long)pvVar152 +
                                                              (uVar164 & 0xffffffff) * 4));
                            }
                            uVar164 = uVar164 + 0x10;
                            iVar135 = iVar135 + iVar147;
                            unaff_R13 = unaff_R13 - 1;
                          } while (unaff_R13 != 0);
                        }
                        uVar162 = uVar162 + 1;
                        uVar154 = uVar154 + uVar143 * 0x10;
                      } while (uVar162 != uVar11);
                    }
                    pvVar152 = (void *)((long)pvVar152 + (long)(int)(uVar140 * uVar11 * 0x10) * 4);
                    uVar157 = uVar157 + 1;
                  } while (uVar157 != uVar13);
                }
                switch(uVar12) {
                case 1:
                  auVar280 = vmaxps_avx512f(auVar280,auVar279);
                  break;
                case 2:
                  uVar157 = vcmpps_avx512f(auVar280,auVar279,1);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar132._4_4_ = uVar1;
                  auVar132._0_4_ = uVar1;
                  auVar132._8_4_ = uVar1;
                  auVar132._12_4_ = uVar1;
                  auVar132._16_4_ = uVar1;
                  auVar132._20_4_ = uVar1;
                  auVar132._24_4_ = uVar1;
                  auVar132._28_4_ = uVar1;
                  auVar132._32_4_ = uVar1;
                  auVar132._36_4_ = uVar1;
                  auVar132._40_4_ = uVar1;
                  auVar132._44_4_ = uVar1;
                  auVar132._48_4_ = uVar1;
                  auVar132._52_4_ = uVar1;
                  auVar132._56_4_ = uVar1;
                  auVar132._60_4_ = uVar1;
                  auVar281 = vmulps_avx512f(auVar280,auVar132);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar307._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar280._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar307._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar280._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar307._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar280._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar307._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar280._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  auVar307._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar280._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  auVar307._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar280._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  auVar307._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar280._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  auVar307._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar280._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 8) & 1);
                  auVar307._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar280._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  auVar307._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar280._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  auVar307._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar280._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  auVar307._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar280._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  auVar307._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar280._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  auVar307._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar280._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  auVar307._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar280._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  auVar307._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar280._60_4_
                  ;
                  auVar280 = auVar307;
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar130._4_4_ = uVar1;
                  auVar130._0_4_ = uVar1;
                  auVar130._8_4_ = uVar1;
                  auVar130._12_4_ = uVar1;
                  auVar130._16_4_ = uVar1;
                  auVar130._20_4_ = uVar1;
                  auVar130._24_4_ = uVar1;
                  auVar130._28_4_ = uVar1;
                  auVar130._32_4_ = uVar1;
                  auVar130._36_4_ = uVar1;
                  auVar130._40_4_ = uVar1;
                  auVar130._44_4_ = uVar1;
                  auVar130._48_4_ = uVar1;
                  auVar130._52_4_ = uVar1;
                  auVar130._56_4_ = uVar1;
                  auVar130._60_4_ = uVar1;
                  auVar280 = vmaxps_avx512f(auVar280,auVar130);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar131._4_4_ = uVar1;
                  auVar131._0_4_ = uVar1;
                  auVar131._8_4_ = uVar1;
                  auVar131._12_4_ = uVar1;
                  auVar131._16_4_ = uVar1;
                  auVar131._20_4_ = uVar1;
                  auVar131._24_4_ = uVar1;
                  auVar131._28_4_ = uVar1;
                  auVar131._32_4_ = uVar1;
                  auVar131._36_4_ = uVar1;
                  auVar131._40_4_ = uVar1;
                  auVar131._44_4_ = uVar1;
                  auVar131._48_4_ = uVar1;
                  auVar131._52_4_ = uVar1;
                  auVar131._56_4_ = uVar1;
                  auVar131._60_4_ = uVar1;
                  auVar280 = vminps_avx512f(auVar280,auVar131);
                  break;
                case 4:
                  auVar280 = vxorps_avx512dq(auVar280,in_ZMM20);
                  auVar280 = vminps_avx512f(auVar280,(undefined1  [64])afVar312);
                  auVar280 = vmaxps_avx512f(auVar280,(undefined1  [64])afVar313);
                  auVar281 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar280,
                                                 (undefined1  [64])afVar320);
                  auVar282 = vrndscaleps_avx512f(auVar281,1);
                  uVar157 = vcmpps_avx512f(auVar281,auVar282,1);
                  auVar281 = vsubps_avx512f(auVar282,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar306._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar282._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar306._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar282._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar306._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar282._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar306._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar282._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  auVar306._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar282._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  auVar306._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar282._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  auVar306._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar282._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  auVar306._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar282._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 8) & 1);
                  auVar306._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar282._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  auVar306._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar282._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  auVar306._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar282._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  auVar306._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar282._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  auVar306._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar282._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  auVar306._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar282._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  auVar306._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar282._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  auVar306._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar282._60_4_
                  ;
                  auVar280 = vfmadd231ps_avx512f(auVar280,auVar306,auVar274);
                  in_ZMM16 = vfmadd231ps_avx512f(auVar280,auVar306,auVar275);
                  auVar280 = vmulps_avx512f(in_ZMM16,in_ZMM16);
                  auVar281 = vfmadd213ps_avx512f(in_ZMM16,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar281 = vfmadd213ps_avx512f(auVar281,in_ZMM16,(undefined1  [64])afVar317);
                  auVar281 = vfmadd213ps_avx512f(auVar281,in_ZMM16,(undefined1  [64])afVar318);
                  auVar281 = vfmadd213ps_avx512f(auVar281,in_ZMM16,(undefined1  [64])afVar319);
                  auVar281 = vfmadd213ps_avx512f(auVar281,in_ZMM16,(undefined1  [64])afVar320);
                  auVar280 = vfmadd213ps_avx512f(auVar281,auVar280,in_ZMM16);
                  auVar280 = vaddps_avx512f(auVar280,(undefined1  [64])afVar311);
                  auVar281 = vcvttps2dq_avx512f(auVar306);
                  auVar281 = vpaddd_avx512f(auVar281,auVar276);
                  auVar281 = vpslld_avx512f(auVar281,0x17);
                  auVar280 = vfmadd213ps_avx512f(auVar281,auVar280,auVar291);
                  auVar281 = vrcp14ps_avx512f(auVar280);
                  auVar280 = vfmsub213ps_avx512f(auVar280,auVar281,auVar291);
                  auVar280 = vfnmadd132ps_avx512vl(auVar280,auVar281,auVar281);
                  break;
                case 5:
                  auVar281 = vminps_avx512f(auVar280,(undefined1  [64])afVar312);
                  auVar281 = vmaxps_avx512f(auVar281,(undefined1  [64])afVar313);
                  auVar282 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar281,
                                                 (undefined1  [64])afVar320);
                  auVar283 = vrndscaleps_avx512f(auVar282,1);
                  uVar157 = vcmpps_avx512f(auVar282,auVar283,1);
                  auVar282 = vsubps_avx512f(auVar283,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar302._0_4_ = (uint)bVar37 * auVar282._0_4_ | (uint)!bVar37 * auVar283._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar302._4_4_ = (uint)bVar37 * auVar282._4_4_ | (uint)!bVar37 * auVar283._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar302._8_4_ = (uint)bVar37 * auVar282._8_4_ | (uint)!bVar37 * auVar283._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar302._12_4_ = (uint)bVar37 * auVar282._12_4_ | (uint)!bVar37 * auVar283._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  auVar302._16_4_ = (uint)bVar37 * auVar282._16_4_ | (uint)!bVar37 * auVar283._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  auVar302._20_4_ = (uint)bVar37 * auVar282._20_4_ | (uint)!bVar37 * auVar283._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  auVar302._24_4_ = (uint)bVar37 * auVar282._24_4_ | (uint)!bVar37 * auVar283._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  auVar302._28_4_ = (uint)bVar37 * auVar282._28_4_ | (uint)!bVar37 * auVar283._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 8) & 1);
                  auVar302._32_4_ = (uint)bVar37 * auVar282._32_4_ | (uint)!bVar37 * auVar283._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  auVar302._36_4_ = (uint)bVar37 * auVar282._36_4_ | (uint)!bVar37 * auVar283._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  auVar302._40_4_ = (uint)bVar37 * auVar282._40_4_ | (uint)!bVar37 * auVar283._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  auVar302._44_4_ = (uint)bVar37 * auVar282._44_4_ | (uint)!bVar37 * auVar283._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  auVar302._48_4_ = (uint)bVar37 * auVar282._48_4_ | (uint)!bVar37 * auVar283._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  auVar302._52_4_ = (uint)bVar37 * auVar282._52_4_ | (uint)!bVar37 * auVar283._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  auVar302._56_4_ = (uint)bVar37 * auVar282._56_4_ | (uint)!bVar37 * auVar283._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  auVar302._60_4_ = (uint)bVar37 * auVar282._60_4_ | (uint)!bVar37 * auVar283._60_4_
                  ;
                  auVar281 = vfmadd231ps_avx512f(auVar281,auVar302,auVar274);
                  auVar281 = vfmadd231ps_avx512f(auVar281,auVar302,auVar275);
                  auVar282 = vmulps_avx512f(auVar281,auVar281);
                  auVar283 = vfmadd213ps_avx512f(auVar281,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar317);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar318);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar319);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar320);
                  auVar281 = vfmadd213ps_avx512f(auVar283,auVar282,auVar281);
                  auVar281 = vaddps_avx512f(auVar281,(undefined1  [64])afVar311);
                  auVar282 = vcvttps2dq_avx512f(auVar302);
                  auVar282 = vpaddd_avx512f(auVar282,auVar276);
                  auVar282 = vpslld_avx512f(auVar282,0x17);
                  auVar281 = vfmadd213ps_avx512f(auVar282,auVar281,auVar291);
                  auVar282 = vmaxps_avx512f(auVar281,(undefined1  [64])_ps512_min_norm_pos);
                  auVar283 = vpsrld_avx512f(auVar282,0x17);
                  auVar282 = vpternlogd_avx512f(auVar282,(undefined1  [64])afVar320,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar157 = vcmpps_avx512f(auVar282,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar284 = vsubps_avx512f(auVar282,(undefined1  [64])afVar311);
                  auVar282 = vaddps_avx512f(auVar284,auVar282);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar303._0_4_ = (uint)bVar37 * auVar282._0_4_ | (uint)!bVar37 * auVar284._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar303._4_4_ = (uint)bVar37 * auVar282._4_4_ | (uint)!bVar37 * auVar284._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar303._8_4_ = (uint)bVar37 * auVar282._8_4_ | (uint)!bVar37 * auVar284._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar303._12_4_ = (uint)bVar37 * auVar282._12_4_ | (uint)!bVar37 * auVar284._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  auVar303._16_4_ = (uint)bVar37 * auVar282._16_4_ | (uint)!bVar37 * auVar284._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  auVar303._20_4_ = (uint)bVar37 * auVar282._20_4_ | (uint)!bVar37 * auVar284._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  auVar303._24_4_ = (uint)bVar37 * auVar282._24_4_ | (uint)!bVar37 * auVar284._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  auVar303._28_4_ = (uint)bVar37 * auVar282._28_4_ | (uint)!bVar37 * auVar284._28_4_
                  ;
                  bVar31 = (byte)(uVar157 >> 8);
                  bVar37 = (bool)(bVar31 & 1);
                  auVar303._32_4_ = (uint)bVar37 * auVar282._32_4_ | (uint)!bVar37 * auVar284._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  auVar303._36_4_ = (uint)bVar37 * auVar282._36_4_ | (uint)!bVar37 * auVar284._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  auVar303._40_4_ = (uint)bVar37 * auVar282._40_4_ | (uint)!bVar37 * auVar284._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  auVar303._44_4_ = (uint)bVar37 * auVar282._44_4_ | (uint)!bVar37 * auVar284._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  auVar303._48_4_ = (uint)bVar37 * auVar282._48_4_ | (uint)!bVar37 * auVar284._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  auVar303._52_4_ = (uint)bVar37 * auVar282._52_4_ | (uint)!bVar37 * auVar284._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  auVar303._56_4_ = (uint)bVar37 * auVar282._56_4_ | (uint)!bVar37 * auVar284._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  auVar303._60_4_ = (uint)bVar37 * auVar282._60_4_ | (uint)!bVar37 * auVar284._60_4_
                  ;
                  auVar282 = vmulps_avx512f(auVar303,auVar303);
                  auVar284 = vfmadd132ps_avx512f(auVar303,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar303,(undefined1  [64])afVar474);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar303,(undefined1  [64])afVar321);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar303,(undefined1  [64])afVar322);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar303,(undefined1  [64])afVar323);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar303,(undefined1  [64])afVar324);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar303,(undefined1  [64])afVar325);
                  auVar284 = vfmadd213ps_avx512f(auVar284,auVar303,(undefined1  [64])afVar326);
                  auVar285 = vmulps_avx512f(auVar282,auVar303);
                  auVar284 = vfmadd213ps_avx512f(auVar285,auVar284,auVar303);
                  uVar162 = vcmpps_avx512f(auVar281,auVar279,2);
                  auVar281 = vpsubd_avx512f(auVar283,auVar276);
                  auVar281 = vcvtdq2ps_avx512f(auVar281);
                  auVar283 = vaddps_avx512f(auVar281,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar304._0_4_ = (uint)bVar37 * auVar281._0_4_ | (uint)!bVar37 * auVar283._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar304._4_4_ = (uint)bVar37 * auVar281._4_4_ | (uint)!bVar37 * auVar283._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar304._8_4_ = (uint)bVar37 * auVar281._8_4_ | (uint)!bVar37 * auVar283._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar304._12_4_ = (uint)bVar37 * auVar281._12_4_ | (uint)!bVar37 * auVar283._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  auVar304._16_4_ = (uint)bVar37 * auVar281._16_4_ | (uint)!bVar37 * auVar283._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  auVar304._20_4_ = (uint)bVar37 * auVar281._20_4_ | (uint)!bVar37 * auVar283._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  auVar304._24_4_ = (uint)bVar37 * auVar281._24_4_ | (uint)!bVar37 * auVar283._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  auVar304._28_4_ = (uint)bVar37 * auVar281._28_4_ | (uint)!bVar37 * auVar283._28_4_
                  ;
                  bVar37 = (bool)(bVar31 & 1);
                  auVar304._32_4_ = (uint)bVar37 * auVar281._32_4_ | (uint)!bVar37 * auVar283._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  auVar304._36_4_ = (uint)bVar37 * auVar281._36_4_ | (uint)!bVar37 * auVar283._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  auVar304._40_4_ = (uint)bVar37 * auVar281._40_4_ | (uint)!bVar37 * auVar283._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  auVar304._44_4_ = (uint)bVar37 * auVar281._44_4_ | (uint)!bVar37 * auVar283._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  auVar304._48_4_ = (uint)bVar37 * auVar281._48_4_ | (uint)!bVar37 * auVar283._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  auVar304._52_4_ = (uint)bVar37 * auVar281._52_4_ | (uint)!bVar37 * auVar283._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  auVar304._56_4_ = (uint)bVar37 * auVar281._56_4_ | (uint)!bVar37 * auVar283._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  auVar304._60_4_ = (uint)bVar37 * auVar281._60_4_ | (uint)!bVar37 * auVar283._60_4_
                  ;
                  auVar281 = vfmadd231ps_avx512f(auVar284,auVar304,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar281 = vfmadd231ps_avx512f(auVar281,auVar277,auVar282);
                  auVar281 = vfmadd231ps_avx512f(auVar281,auVar304,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar281 = vmulps_avx512f(auVar281,auVar278);
                  auVar282 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar37 = (bool)((byte)uVar162 & 1);
                  auVar305._0_4_ = (uint)bVar37 * auVar282._0_4_ | (uint)!bVar37 * auVar281._0_4_;
                  bVar37 = (bool)((byte)(uVar162 >> 1) & 1);
                  auVar305._4_4_ = (uint)bVar37 * auVar282._4_4_ | (uint)!bVar37 * auVar281._4_4_;
                  bVar37 = (bool)((byte)(uVar162 >> 2) & 1);
                  auVar305._8_4_ = (uint)bVar37 * auVar282._8_4_ | (uint)!bVar37 * auVar281._8_4_;
                  bVar37 = (bool)((byte)(uVar162 >> 3) & 1);
                  auVar305._12_4_ = (uint)bVar37 * auVar282._12_4_ | (uint)!bVar37 * auVar281._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 4) & 1);
                  auVar305._16_4_ = (uint)bVar37 * auVar282._16_4_ | (uint)!bVar37 * auVar281._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 5) & 1);
                  auVar305._20_4_ = (uint)bVar37 * auVar282._20_4_ | (uint)!bVar37 * auVar281._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 6) & 1);
                  auVar305._24_4_ = (uint)bVar37 * auVar282._24_4_ | (uint)!bVar37 * auVar281._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 7) & 1);
                  auVar305._28_4_ = (uint)bVar37 * auVar282._28_4_ | (uint)!bVar37 * auVar281._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 8) & 1);
                  auVar305._32_4_ = (uint)bVar37 * auVar282._32_4_ | (uint)!bVar37 * auVar281._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 9) & 1);
                  auVar305._36_4_ = (uint)bVar37 * auVar282._36_4_ | (uint)!bVar37 * auVar281._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 10) & 1);
                  auVar305._40_4_ = (uint)bVar37 * auVar282._40_4_ | (uint)!bVar37 * auVar281._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 0xb) & 1);
                  auVar305._44_4_ = (uint)bVar37 * auVar282._44_4_ | (uint)!bVar37 * auVar281._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 0xc) & 1);
                  auVar305._48_4_ = (uint)bVar37 * auVar282._48_4_ | (uint)!bVar37 * auVar281._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 0xd) & 1);
                  auVar305._52_4_ = (uint)bVar37 * auVar282._52_4_ | (uint)!bVar37 * auVar281._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar162 >> 0xe) & 1);
                  auVar305._56_4_ = (uint)bVar37 * auVar282._56_4_ | (uint)!bVar37 * auVar281._56_4_
                  ;
                  bVar37 = SUB81(uVar162 >> 0xf,0);
                  auVar305._60_4_ = (uint)bVar37 * auVar282._60_4_ | (uint)!bVar37 * auVar281._60_4_
                  ;
                  auVar281 = vminps_avx512f(auVar305,(undefined1  [64])afVar312);
                  auVar281 = vmaxps_avx512f(auVar281,(undefined1  [64])afVar313);
                  auVar282 = vfmadd213ps_avx512f((undefined1  [64])afVar314,auVar281,
                                                 (undefined1  [64])afVar320);
                  auVar283 = vrndscaleps_avx512f(auVar282,1);
                  uVar157 = vcmpps_avx512f(auVar282,auVar283,1);
                  auVar282 = vsubps_avx512f(auVar283,(undefined1  [64])afVar311);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  in_ZMM16._0_4_ = (uint)bVar37 * auVar282._0_4_ | (uint)!bVar37 * auVar283._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  in_ZMM16._4_4_ = (uint)bVar37 * auVar282._4_4_ | (uint)!bVar37 * auVar283._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  in_ZMM16._8_4_ = (uint)bVar37 * auVar282._8_4_ | (uint)!bVar37 * auVar283._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  in_ZMM16._12_4_ = (uint)bVar37 * auVar282._12_4_ | (uint)!bVar37 * auVar283._12_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                  in_ZMM16._16_4_ = (uint)bVar37 * auVar282._16_4_ | (uint)!bVar37 * auVar283._16_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                  in_ZMM16._20_4_ = (uint)bVar37 * auVar282._20_4_ | (uint)!bVar37 * auVar283._20_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                  in_ZMM16._24_4_ = (uint)bVar37 * auVar282._24_4_ | (uint)!bVar37 * auVar283._24_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 7) & 1);
                  in_ZMM16._28_4_ = (uint)bVar37 * auVar282._28_4_ | (uint)!bVar37 * auVar283._28_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 8) & 1);
                  in_ZMM16._32_4_ = (uint)bVar37 * auVar282._32_4_ | (uint)!bVar37 * auVar283._32_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 9) & 1);
                  in_ZMM16._36_4_ = (uint)bVar37 * auVar282._36_4_ | (uint)!bVar37 * auVar283._36_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 10) & 1);
                  in_ZMM16._40_4_ = (uint)bVar37 * auVar282._40_4_ | (uint)!bVar37 * auVar283._40_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xb) & 1);
                  in_ZMM16._44_4_ = (uint)bVar37 * auVar282._44_4_ | (uint)!bVar37 * auVar283._44_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xc) & 1);
                  in_ZMM16._48_4_ = (uint)bVar37 * auVar282._48_4_ | (uint)!bVar37 * auVar283._48_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xd) & 1);
                  in_ZMM16._52_4_ = (uint)bVar37 * auVar282._52_4_ | (uint)!bVar37 * auVar283._52_4_
                  ;
                  bVar37 = (bool)((byte)(uVar157 >> 0xe) & 1);
                  in_ZMM16._56_4_ = (uint)bVar37 * auVar282._56_4_ | (uint)!bVar37 * auVar283._56_4_
                  ;
                  bVar37 = SUB81(uVar157 >> 0xf,0);
                  in_ZMM16._60_4_ = (uint)bVar37 * auVar282._60_4_ | (uint)!bVar37 * auVar283._60_4_
                  ;
                  auVar281 = vfmadd231ps_avx512f(auVar281,in_ZMM16,auVar274);
                  auVar281 = vfmadd231ps_avx512f(auVar281,in_ZMM16,auVar275);
                  auVar282 = vmulps_avx512f(auVar281,auVar281);
                  auVar283 = vfmadd213ps_avx512f(auVar281,(undefined1  [64])afVar315,
                                                 (undefined1  [64])afVar316);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar317);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar318);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar319);
                  auVar283 = vfmadd213ps_avx512f(auVar283,auVar281,(undefined1  [64])afVar320);
                  auVar281 = vfmadd213ps_avx512f(auVar283,auVar282,auVar281);
                  auVar281 = vaddps_avx512f(auVar281,(undefined1  [64])afVar311);
                  auVar282 = vcvttps2dq_avx512f(in_ZMM16);
                  auVar282 = vpaddd_avx512f(auVar282,auVar276);
                  auVar282 = vpslld_avx512f(auVar282,0x17);
                  auVar281 = vfmadd213ps_avx512f(auVar282,auVar281,auVar291);
                  auVar282 = vrcp14ps_avx512f(auVar281);
                  auVar281 = vfmsub213ps_avx512f(auVar281,auVar282,auVar291);
                  auVar281 = vfnmadd132ps_avx512vl(auVar281,auVar282,auVar282);
                  auVar281 = vfnmsub213ps_avx512f(auVar281,auVar278,auVar291);
                  auVar280 = vmulps_avx512f(auVar281,auVar280);
                  break;
                case 6:
                  auVar281 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var141)));
                  uVar153 = (*(uint **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar129._4_4_ = uVar153;
                  auVar129._0_4_ = uVar153;
                  auVar129._8_4_ = uVar153;
                  auVar129._12_4_ = uVar153;
                  auVar129._16_4_ = uVar153;
                  auVar129._20_4_ = uVar153;
                  auVar129._24_4_ = uVar153;
                  auVar129._28_4_ = uVar153;
                  auVar129._32_4_ = uVar153;
                  auVar129._36_4_ = uVar153;
                  auVar129._40_4_ = uVar153;
                  auVar129._44_4_ = uVar153;
                  auVar129._48_4_ = uVar153;
                  auVar129._52_4_ = uVar153;
                  auVar129._56_4_ = uVar153;
                  auVar129._60_4_ = uVar153;
                  auVar281 = vfmadd213ps_avx512f(auVar281,auVar280,auVar129);
                  auVar281 = vmaxps_avx512f(auVar281,auVar279);
                  auVar281 = vminps_avx512f(auVar281,auVar291);
                  auVar280 = vmulps_avx512f(auVar281,auVar280);
                }
                *(undefined1 (*) [64])ppp_Var150 = auVar280;
                ppp_Var150 = ppp_Var150 + 8;
                uVar153 = (int)pvVar151 + 1;
                pvVar151 = (void *)(ulong)uVar153;
                iVar134 = iVar134 + 1;
              } while (uVar153 != local_118.w);
            }
            uVar160 = uVar160 + 1;
          } while (uVar160 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
        in_ZMM13 = afVar318;
        in_ZMM21 = afVar474;
      } while (local_1e0 != local_118.c);
    }
    if (((iVar9 == 0x10) && (uVar145 == 1)) && (local_98 = (long)local_118.c, 0 < local_98)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xe4 + (long)p_Var141);
      unaff_R13 = (ulong)uVar140;
      iVar156 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      pvVar151 = (void *)(ulong)uVar13;
      local_a0 = (Allocator *)
                 (CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize) * local_118.cstep);
      local_a8 = (Allocator *)local_118.data;
      iVar138 = bottom_blob->w;
      iVar139 = bottom_blob->h;
      uVar160 = bottom_blob->c;
      local_1e0 = 0;
      do {
        if (0 < iVar8) {
          local_1b8 = (_func_int ***)((long)&local_a8->_vptr_Allocator + (long)local_a0 * local_1e0)
          ;
          local_88._0_8_ =
               (void *)((this->weight_data_tm).cstep * local_1e0 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
          uVar153 = 0;
          do {
            if (0 < iVar7) {
              iVar135 = bottom_blob->w;
              pvVar152 = bottom_blob->data;
              sVar16 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pfVar18 = *(float **)(&this->field_0x118 + (long)p_Var141);
              uVar161 = 0;
              iVar134 = (1 - uVar11) * iVar147;
              do {
                if (lVar155 == 0) {
                  fVar346 = 0.0;
                }
                else {
                  fVar346 = *(float *)(lVar155 + local_1e0 * 4);
                }
                if ((int)uVar160 < 1) {
                  auVar274 = ZEXT864(0);
                }
                else {
                  auVar274 = ZEXT864(0);
                  uVar143 = 0;
                  lVar144 = local_88._0_8_;
                  do {
                    if (0 < (int)uVar13) {
                      uVar157 = 0;
                      pvVar159 = (void *)0x0;
                      do {
                        iVar136 = (((int)pvVar159 - uVar13) + 1) * iVar10 + uVar153;
                        if ((((-1 < iVar136) &&
                             (iVar137 = iVar136 / iVar156, iVar136 % iVar156 == 0)) &&
                            (0 < (int)uVar11)) && (iVar137 < iVar139)) {
                          uVar162 = (ulong)uVar11;
                          uVar154 = uVar157;
                          iVar136 = iVar134;
                          do {
                            if (((-1 < iVar136) && (iVar136 % (int)uVar140 == 0)) &&
                               (iVar136 / (int)uVar140 < iVar138)) {
                              auVar274 = vfmadd231ps_avx512f(auVar274,*(undefined1 (*) [64])
                                                                       ((long)pvVar152 +
                                                                       (long)(iVar136 / (int)uVar140
                                                                             << 4) * 4 +
                                                                       (long)iVar137 *
                                                                       (long)iVar135 * sVar16 +
                                                                       sVar17 * sVar16 * uVar143),
                                                             *(undefined1 (*) [64])
                                                              (lVar144 + (uVar154 & 0xffffffff) * 4)
                                                            );
                            }
                            uVar154 = uVar154 + 0x10;
                            iVar136 = iVar136 + iVar147;
                            uVar162 = uVar162 - 1;
                          } while (uVar162 != 0);
                        }
                        pvVar159 = (void *)((long)pvVar159 + 1);
                        uVar157 = uVar157 + (ulong)uVar11 * 0x10;
                      } while (pvVar159 != pvVar151);
                    }
                    lVar144 = lVar144 + (long)(int)(uVar11 * uVar13 * 0x10) * 4;
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                auVar222 = vextractf64x4_avx512f(auVar274,1);
                fVar360 = auVar274._4_4_ + auVar222._4_4_;
                auVar169._0_4_ = auVar274._0_4_ + auVar222._0_4_ + auVar274._16_4_ + auVar222._16_4_
                ;
                auVar169._4_4_ = fVar360 + fVar360;
                auVar169._8_4_ = auVar274._8_4_ + auVar222._8_4_ + auVar274._24_4_ + auVar222._24_4_
                ;
                auVar169._12_4_ =
                     auVar274._12_4_ + auVar222._12_4_ + auVar274._28_4_ + auVar222._28_4_;
                auVar168 = vshufpd_avx(auVar169,auVar169,1);
                auVar170._0_4_ = auVar168._0_4_ + auVar169._0_4_;
                auVar170._4_4_ = auVar168._4_4_ + auVar169._4_4_;
                auVar170._8_4_ = auVar168._8_4_ + auVar169._8_4_;
                auVar170._12_4_ = auVar168._12_4_ + auVar169._12_4_;
                auVar168 = vmovshdup_avx(auVar170);
                fVar346 = auVar168._0_4_ + fVar346 + auVar170._0_4_;
                auVar168 = ZEXT416((uint)fVar346);
                fVar360 = fVar346;
                if (iVar158 - 1U < 6) {
                  switch(iVar158) {
                  case 1:
                    auVar168 = vmaxss_avx(ZEXT416((uint)fVar346),ZEXT416(0));
                    fVar360 = auVar168._0_4_;
                    break;
                  case 2:
                    uVar148 = vcmpss_avx512f(ZEXT416((uint)fVar346),ZEXT416(0),0xe);
                    bVar37 = (bool)((byte)uVar148 & 1);
                    fVar360 = (float)((uint)bVar37 * 0x3f800000 + (uint)!bVar37 * (int)*pfVar18) *
                              fVar346;
                    break;
                  case 3:
                    auVar168 = vmaxss_avx(auVar168,ZEXT416((uint)*pfVar18));
                    fVar360 = auVar168._0_4_;
                    if (pfVar18[1] < auVar168._0_4_) {
                      fVar360 = pfVar18[1];
                    }
                    break;
                  case 4:
                    auVar168 = vminss_avx(auVar168,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar50._8_4_ = 0x80000000;
                    auVar50._0_8_ = 0x8000000080000000;
                    auVar50._12_4_ = 0x80000000;
                    auVar169 = vxorps_avx512vl(auVar168,auVar50);
                    uVar148 = vcmpss_avx512f(auVar168,ZEXT416(0xc2b0c0a5),1);
                    bVar37 = (bool)((byte)uVar148 & 1);
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar346 = expf((float)((uint)bVar37 * 0x42b0c0a5 +
                                          (uint)!bVar37 * auVar169._0_4_));
                    fVar360 = 1.0 / (fVar346 + 1.0);
                    break;
                  case 5:
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar360 = expf(fVar346);
                    fVar360 = logf(fVar360 + 1.0);
                    fVar360 = tanhf(fVar360);
                    fVar360 = fVar360 * fVar346;
                    break;
                  case 6:
                    fVar2 = *pfVar18;
                    auVar191._8_4_ = 0x80000000;
                    auVar191._0_8_ = 0x8000000080000000;
                    auVar191._12_4_ = 0x80000000;
                    auVar169 = vxorps_avx512vl(ZEXT416((uint)pfVar18[1]),auVar191);
                    fVar367 = auVar169._0_4_ / fVar2;
                    fVar360 = 0.0;
                    if ((fVar367 <= fVar346) &&
                       (fVar360 = fVar346, fVar346 <= fVar367 + 1.0 / fVar2)) {
                      auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar168,
                                                 ZEXT416((uint)pfVar18[1]));
                      fVar360 = auVar168._0_4_ * fVar346;
                    }
                  }
                }
                *(float *)local_1b8 = fVar360;
                local_1b8 = (_func_int ***)((long)local_1b8 + 4);
                uVar161 = uVar161 + 1;
                iVar134 = iVar134 + 1;
              } while (uVar161 != iVar7);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != iVar8);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_98);
    }
    iVar8 = local_118.h;
    iVar7 = local_118.w;
    if (((iVar9 == 8) && (uVar145 == 8)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      iVar138 = *(int *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_1e0 = 0;
      auVar364._8_4_ = 0x42b0c0a5;
      auVar364._0_8_ = 0x42b0c0a542b0c0a5;
      auVar364._12_4_ = 0x42b0c0a5;
      auVar364._16_4_ = 0x42b0c0a5;
      auVar364._20_4_ = 0x42b0c0a5;
      auVar364._24_4_ = 0x42b0c0a5;
      auVar364._28_4_ = 0x42b0c0a5;
      auVar371._8_4_ = 0xc2b0c0a5;
      auVar371._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar371._12_4_ = 0xc2b0c0a5;
      auVar371._16_4_ = 0xc2b0c0a5;
      auVar371._20_4_ = 0xc2b0c0a5;
      auVar371._24_4_ = 0xc2b0c0a5;
      auVar371._28_4_ = 0xc2b0c0a5;
      auVar377._8_4_ = 0x3f000000;
      auVar377._0_8_ = 0x3f0000003f000000;
      auVar377._12_4_ = 0x3f000000;
      auVar377._16_4_ = 0x3f000000;
      auVar377._20_4_ = 0x3f000000;
      auVar377._24_4_ = 0x3f000000;
      auVar377._28_4_ = 0x3f000000;
      auVar383._8_4_ = 0x3fb8aa3b;
      auVar383._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar383._12_4_ = 0x3fb8aa3b;
      auVar383._16_4_ = 0x3fb8aa3b;
      auVar383._20_4_ = 0x3fb8aa3b;
      auVar383._24_4_ = 0x3fb8aa3b;
      auVar383._28_4_ = 0x3fb8aa3b;
      auVar389._8_4_ = 0x3f800000;
      auVar389._0_8_ = 0x3f8000003f800000;
      auVar389._12_4_ = 0x3f800000;
      auVar389._16_4_ = 0x3f800000;
      auVar389._20_4_ = 0x3f800000;
      auVar389._24_4_ = 0x3f800000;
      auVar389._28_4_ = 0x3f800000;
      auVar395._8_4_ = 0x3f318000;
      auVar395._0_8_ = 0x3f3180003f318000;
      auVar395._12_4_ = 0x3f318000;
      auVar395._16_4_ = 0x3f318000;
      auVar395._20_4_ = 0x3f318000;
      auVar395._24_4_ = 0x3f318000;
      auVar395._28_4_ = 0x3f318000;
      auVar222 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar453._8_4_ = 0x3ab743ce;
      auVar453._0_8_ = 0x3ab743ce3ab743ce;
      auVar453._12_4_ = 0x3ab743ce;
      auVar453._16_4_ = 0x3ab743ce;
      auVar453._20_4_ = 0x3ab743ce;
      auVar453._24_4_ = 0x3ab743ce;
      auVar453._28_4_ = 0x3ab743ce;
      auVar459._8_4_ = 0x3c088908;
      auVar459._0_8_ = 0x3c0889083c088908;
      auVar459._12_4_ = 0x3c088908;
      auVar459._16_4_ = 0x3c088908;
      auVar459._20_4_ = 0x3c088908;
      auVar459._24_4_ = 0x3c088908;
      auVar459._28_4_ = 0x3c088908;
      auVar465._8_4_ = 0x3d2aa9c1;
      auVar465._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar465._12_4_ = 0x3d2aa9c1;
      auVar465._16_4_ = 0x3d2aa9c1;
      auVar465._20_4_ = 0x3d2aa9c1;
      auVar465._24_4_ = 0x3d2aa9c1;
      auVar465._28_4_ = 0x3d2aa9c1;
      auVar471._8_4_ = 0x3e2aaaaa;
      auVar471._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar471._12_4_ = 0x3e2aaaaa;
      auVar471._16_4_ = 0x3e2aaaaa;
      auVar471._20_4_ = 0x3e2aaaaa;
      auVar471._24_4_ = 0x3e2aaaaa;
      auVar471._28_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT3264(auVar471);
      auVar478._8_4_ = 0x3f800000;
      auVar478._0_8_ = 0x3f8000003f800000;
      auVar478._12_4_ = 0x3f800000;
      auVar478._16_4_ = 0x3f800000;
      auVar478._20_4_ = 0x3f800000;
      auVar478._24_4_ = 0x3f800000;
      auVar478._28_4_ = 0x3f800000;
      auVar484._8_4_ = 0xb95e8083;
      auVar484._0_8_ = 0xb95e8083b95e8083;
      auVar484._12_4_ = 0xb95e8083;
      auVar484._16_4_ = 0xb95e8083;
      auVar484._20_4_ = 0xb95e8083;
      auVar484._24_4_ = 0xb95e8083;
      auVar484._28_4_ = 0xb95e8083;
      auVar223 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT3264(auVar223);
      auVar244 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar245 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar246 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar247 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar248 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar249 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar250 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar251 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        if (0 < local_118.h) {
          uVar13 = bottom_blob->w;
          unaff_R13 = (ulong)uVar13;
          iVar139 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar160 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x20;
          uVar153 = 0;
          do {
            if (0 < local_118.w) {
              uVar161 = 0;
              iVar134 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar274 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar274 = ZEXT3264(*(undefined1 (*) [32])(lVar155 + local_1e0 * 0x20));
                }
                if (0 < (int)uVar160) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar135 = (((int)uVar157 - uVar11) + 1) * iVar10 + uVar153;
                        if (((-1 < iVar135) && (iVar136 = iVar135 / iVar158, iVar135 % iVar158 == 0)
                            ) && ((0 < (int)uVar140 && (iVar136 < iVar139)))) {
                          lVar144 = (long)iVar136 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar135 = iVar134;
                          do {
                            if (((-1 < iVar135) &&
                                (iVar136 = iVar135 / iVar156, iVar135 % iVar156 == 0)) &&
                               (iVar136 < (int)uVar13)) {
                              lVar142 = (long)(iVar136 << 3);
                              uVar12 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144);
                              auVar415._4_4_ = uVar12;
                              auVar415._0_4_ = uVar12;
                              auVar415._8_4_ = uVar12;
                              auVar415._12_4_ = uVar12;
                              auVar415._16_4_ = uVar12;
                              auVar415._20_4_ = uVar12;
                              auVar415._24_4_ = uVar12;
                              auVar415._28_4_ = uVar12;
                              uVar12 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144 + 4);
                              auVar442._4_4_ = uVar12;
                              auVar442._0_4_ = uVar12;
                              auVar442._8_4_ = uVar12;
                              auVar442._12_4_ = uVar12;
                              auVar442._16_4_ = uVar12;
                              auVar442._20_4_ = uVar12;
                              auVar442._24_4_ = uVar12;
                              auVar442._28_4_ = uVar12;
                              auVar252 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              in_ZMM16 = ZEXT3264(auVar252);
                              auVar253 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              auVar254 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x10)))
                              ;
                              auVar255 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x14)))
                              ;
                              in_ZMM20 = ZEXT3264(auVar255);
                              auVar224 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x18)))
                              ;
                              auVar225 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x1c)))
                              ;
                              uVar163 = uVar154 & 0xffffffff;
                              auVar168 = vfmadd231ps_fma(auVar274._0_32_,auVar415,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar151 + uVar163 * 4));
                              auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar442,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar151 + uVar163 * 4 + 0x20));
                              auVar252 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar168),auVar252,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x40));
                              auVar252 = vfmadd231ps_avx512vl
                                                   (auVar252,auVar253,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x60));
                              auVar252 = vfmadd231ps_avx512vl
                                                   (auVar252,auVar254,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x80));
                              auVar252 = vfmadd231ps_avx512vl
                                                   (auVar252,auVar255,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xa0));
                              auVar252 = vfmadd231ps_avx512vl
                                                   (auVar252,auVar224,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xc0));
                              auVar252 = vfmadd231ps_avx512vl
                                                   (auVar252,auVar225,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0xe0));
                              auVar274 = ZEXT3264(auVar252);
                            }
                            uVar154 = uVar154 + 0x40;
                            iVar135 = iVar135 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 0x40;
                      } while (uVar157 != uVar11);
                    }
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x40) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                auVar252 = auVar274._0_32_;
                if (iVar138 - 1U < 6) {
                  auVar253 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar277._28_36_ = auVar274._28_36_;
                  switch(iVar138) {
                  case 1:
                    auVar252 = vmaxps_avx(auVar252,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar254 = vmaxps_avx(auVar252,auVar253);
                    auVar252 = vminps_avx(auVar252,auVar253);
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar103._4_4_ = uVar12;
                    auVar103._0_4_ = uVar12;
                    auVar103._8_4_ = uVar12;
                    auVar103._12_4_ = uVar12;
                    auVar103._16_4_ = uVar12;
                    auVar103._20_4_ = uVar12;
                    auVar103._24_4_ = uVar12;
                    auVar103._28_4_ = uVar12;
                    auVar252 = vfmadd132ps_avx512vl(auVar252,auVar254,auVar103);
                    break;
                  case 3:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar101._4_4_ = uVar12;
                    auVar101._0_4_ = uVar12;
                    auVar101._8_4_ = uVar12;
                    auVar101._12_4_ = uVar12;
                    auVar101._16_4_ = uVar12;
                    auVar101._20_4_ = uVar12;
                    auVar101._24_4_ = uVar12;
                    auVar101._28_4_ = uVar12;
                    auVar252 = vmaxps_avx512vl(auVar252,auVar101);
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                    auVar102._4_4_ = uVar12;
                    auVar102._0_4_ = uVar12;
                    auVar102._8_4_ = uVar12;
                    auVar102._12_4_ = uVar12;
                    auVar102._16_4_ = uVar12;
                    auVar102._20_4_ = uVar12;
                    auVar102._24_4_ = uVar12;
                    auVar102._28_4_ = uVar12;
                    auVar252 = vminps_avx512vl(auVar252,auVar102);
                    break;
                  case 4:
                    auVar99._8_4_ = 0x80000000;
                    auVar99._0_8_ = 0x8000000080000000;
                    auVar99._12_4_ = 0x80000000;
                    auVar99._16_4_ = 0x80000000;
                    auVar99._20_4_ = 0x80000000;
                    auVar99._24_4_ = 0x80000000;
                    auVar99._28_4_ = 0x80000000;
                    auVar252 = vxorps_avx512vl(auVar252,auVar99);
                    auVar252 = vminps_avx(auVar252,auVar364);
                    auVar252 = vmaxps_avx(auVar252,auVar371);
                    auVar168 = vfmadd231ps_fma(auVar377,auVar252,auVar383);
                    auVar253 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar253,1);
                    auVar254 = vsubps_avx512vl(auVar253,auVar389);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar261._0_4_ = (uint)bVar37 * auVar254._0_4_ | (uint)!bVar37 * auVar253._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar261._4_4_ = (uint)bVar37 * auVar254._4_4_ | (uint)!bVar37 * auVar253._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar261._8_4_ = (uint)bVar37 * auVar254._8_4_ | (uint)!bVar37 * auVar253._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar261._12_4_ =
                         (uint)bVar37 * auVar254._12_4_ | (uint)!bVar37 * auVar253._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar261._16_4_ =
                         (uint)bVar37 * auVar254._16_4_ | (uint)!bVar37 * auVar253._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar261._20_4_ =
                         (uint)bVar37 * auVar254._20_4_ | (uint)!bVar37 * auVar253._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar261._24_4_ =
                         (uint)bVar37 * auVar254._24_4_ | (uint)!bVar37 * auVar253._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar261._28_4_ =
                         (uint)bVar37 * auVar254._28_4_ | (uint)!bVar37 * auVar253._28_4_;
                    in_ZMM16 = ZEXT3264(auVar261);
                    auVar252 = vfmsub231ps_avx512vl(auVar252,auVar261,auVar395);
                    auVar100._8_4_ = 0x395e8083;
                    auVar100._0_8_ = 0x395e8083395e8083;
                    auVar100._12_4_ = 0x395e8083;
                    auVar100._16_4_ = 0x395e8083;
                    auVar100._20_4_ = 0x395e8083;
                    auVar100._24_4_ = 0x395e8083;
                    auVar100._28_4_ = 0x395e8083;
                    auVar252 = vfmsub231ps_avx512vl(auVar252,auVar261,auVar100);
                    auVar416._0_4_ = auVar252._0_4_ * auVar252._0_4_;
                    auVar416._4_4_ = auVar252._4_4_ * auVar252._4_4_;
                    auVar416._8_4_ = auVar252._8_4_ * auVar252._8_4_;
                    auVar416._12_4_ = auVar252._12_4_ * auVar252._12_4_;
                    auVar416._16_4_ = auVar252._16_4_ * auVar252._16_4_;
                    auVar416._20_4_ = auVar252._20_4_ * auVar252._20_4_;
                    auVar416._24_4_ = auVar252._24_4_ * auVar252._24_4_;
                    auVar416._28_4_ = 0;
                    auVar168 = vfmadd213ps_fma(auVar222,auVar252,auVar453);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar252,auVar459);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar252,auVar465);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar252,auVar471);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar252,auVar377);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar416,auVar252);
                    auVar417._0_4_ = auVar168._0_4_ + 1.0;
                    auVar417._4_4_ = auVar168._4_4_ + 1.0;
                    auVar417._8_4_ = auVar168._8_4_ + 1.0;
                    auVar417._12_4_ = auVar168._12_4_ + 1.0;
                    auVar417._16_4_ = 0x3f800000;
                    auVar417._20_4_ = 0x3f800000;
                    auVar417._24_4_ = 0x3f800000;
                    auVar417._28_4_ = 0x3f800000;
                    auVar252 = vcvttps2dq_avx512vl(auVar261);
                    auVar252 = vpslld_avx2(auVar252,0x17);
                    auVar252 = vpaddd_avx2(auVar478,auVar252);
                    auVar168 = vfmadd213ps_fma(auVar252,auVar417,auVar389);
                    auVar252 = vrcpps_avx(ZEXT1632(auVar168));
                    auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar252,auVar389);
                    auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar252,auVar252);
                    auVar252 = ZEXT1632(auVar168);
                    break;
                  case 5:
                    auVar252 = vminps_avx(auVar252,auVar364);
                    auVar252 = vmaxps_avx(auVar252,auVar371);
                    auVar168 = vfmadd213ps_fma(auVar383,auVar252,auVar377);
                    auVar254 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar254,1);
                    auVar255 = vsubps_avx512vl(auVar254,auVar389);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar256._0_4_ = (uint)bVar37 * auVar255._0_4_ | (uint)!bVar37 * auVar254._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar256._4_4_ = (uint)bVar37 * auVar255._4_4_ | (uint)!bVar37 * auVar254._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar256._8_4_ = (uint)bVar37 * auVar255._8_4_ | (uint)!bVar37 * auVar254._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar256._12_4_ =
                         (uint)bVar37 * auVar255._12_4_ | (uint)!bVar37 * auVar254._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar256._16_4_ =
                         (uint)bVar37 * auVar255._16_4_ | (uint)!bVar37 * auVar254._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar256._20_4_ =
                         (uint)bVar37 * auVar255._20_4_ | (uint)!bVar37 * auVar254._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar256._24_4_ =
                         (uint)bVar37 * auVar255._24_4_ | (uint)!bVar37 * auVar254._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar256._28_4_ =
                         (uint)bVar37 * auVar255._28_4_ | (uint)!bVar37 * auVar254._28_4_;
                    auVar252 = vfmsub231ps_avx512vl(auVar252,auVar256,auVar395);
                    auVar252 = vfnmsub231ps_avx512vl(auVar252,auVar256,auVar484);
                    auVar443._0_4_ = auVar252._0_4_ * auVar252._0_4_;
                    auVar443._4_4_ = auVar252._4_4_ * auVar252._4_4_;
                    auVar443._8_4_ = auVar252._8_4_ * auVar252._8_4_;
                    auVar443._12_4_ = auVar252._12_4_ * auVar252._12_4_;
                    auVar443._16_4_ = auVar252._16_4_ * auVar252._16_4_;
                    auVar443._20_4_ = auVar252._20_4_ * auVar252._20_4_;
                    auVar443._24_4_ = auVar252._24_4_ * auVar252._24_4_;
                    auVar443._28_4_ = 0;
                    auVar254 = vfmadd213ps_avx512vl(auVar222,auVar252,auVar453);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar252,auVar459);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar252,auVar465);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar252,auVar471);
                    auVar254 = vfmadd213ps_avx512vl(auVar254,auVar252,auVar377);
                    auVar252 = vfmadd213ps_avx512vl(auVar254,auVar443,auVar252);
                    auVar254 = vaddps_avx512vl(auVar252,auVar389);
                    auVar252 = vcvttps2dq_avx512vl(auVar256);
                    auVar252 = vpslld_avx2(auVar252,0x17);
                    auVar252 = vpaddd_avx2(auVar252,auVar478);
                    auVar168 = vfmadd213ps_fma(auVar252,auVar254,auVar389);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar253,2);
                    auVar93._8_4_ = 0x800000;
                    auVar93._0_8_ = 0x80000000800000;
                    auVar93._12_4_ = 0x800000;
                    auVar93._16_4_ = 0x800000;
                    auVar93._20_4_ = 0x800000;
                    auVar93._24_4_ = 0x800000;
                    auVar93._28_4_ = 0x800000;
                    auVar252 = vmaxps_avx512vl(ZEXT1632(auVar168),auVar93);
                    auVar255 = vpsrld_avx2(auVar252,0x17);
                    auVar253 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar94._8_4_ = 0x3f000000;
                    auVar94._0_8_ = 0x3f0000003f000000;
                    auVar94._12_4_ = 0x3f000000;
                    auVar94._16_4_ = 0x3f000000;
                    auVar94._20_4_ = 0x3f000000;
                    auVar94._24_4_ = 0x3f000000;
                    auVar94._28_4_ = 0x3f000000;
                    auVar252 = vpternlogd_avx512vl(auVar252,auVar253,auVar94,0xea);
                    auVar95._8_4_ = 0x3f3504f3;
                    auVar95._0_8_ = 0x3f3504f33f3504f3;
                    auVar95._12_4_ = 0x3f3504f3;
                    auVar95._16_4_ = 0x3f3504f3;
                    auVar95._20_4_ = 0x3f3504f3;
                    auVar95._24_4_ = 0x3f3504f3;
                    auVar95._28_4_ = 0x3f3504f3;
                    uVar157 = vcmpps_avx512vl(auVar252,auVar95,1);
                    auVar253 = vaddps_avx512vl(auVar252,auVar223);
                    auVar252 = vaddps_avx512vl(auVar253,auVar252);
                    bVar37 = (bool)((byte)uVar157 & 1);
                    auVar257._0_4_ = (uint)bVar37 * auVar252._0_4_ | (uint)!bVar37 * auVar253._0_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                    auVar257._4_4_ = (uint)bVar37 * auVar252._4_4_ | (uint)!bVar37 * auVar253._4_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                    auVar257._8_4_ = (uint)bVar37 * auVar252._8_4_ | (uint)!bVar37 * auVar253._8_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                    auVar257._12_4_ =
                         (uint)bVar37 * auVar252._12_4_ | (uint)!bVar37 * auVar253._12_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                    auVar257._16_4_ =
                         (uint)bVar37 * auVar252._16_4_ | (uint)!bVar37 * auVar253._16_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                    auVar257._20_4_ =
                         (uint)bVar37 * auVar252._20_4_ | (uint)!bVar37 * auVar253._20_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                    auVar257._24_4_ =
                         (uint)bVar37 * auVar252._24_4_ | (uint)!bVar37 * auVar253._24_4_;
                    bVar37 = SUB81(uVar157 >> 7,0);
                    auVar257._28_4_ =
                         (uint)bVar37 * auVar252._28_4_ | (uint)!bVar37 * auVar253._28_4_;
                    auVar253 = vmulps_avx512vl(auVar257,auVar257);
                    auVar96._8_4_ = 0xbdebd1b8;
                    auVar96._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar96._12_4_ = 0xbdebd1b8;
                    auVar96._16_4_ = 0xbdebd1b8;
                    auVar96._20_4_ = 0xbdebd1b8;
                    auVar96._24_4_ = 0xbdebd1b8;
                    auVar96._28_4_ = 0xbdebd1b8;
                    auVar252 = vfmadd213ps_avx512vl(auVar244,auVar257,auVar96);
                    auVar97._8_4_ = 0x3def251a;
                    auVar97._0_8_ = 0x3def251a3def251a;
                    auVar97._12_4_ = 0x3def251a;
                    auVar97._16_4_ = 0x3def251a;
                    auVar97._20_4_ = 0x3def251a;
                    auVar97._24_4_ = 0x3def251a;
                    auVar97._28_4_ = 0x3def251a;
                    auVar252 = vfmadd213ps_avx512vl(auVar252,auVar257,auVar97);
                    auVar252 = vfmadd213ps_avx512vl(auVar252,auVar257,auVar245);
                    auVar252 = vfmadd213ps_avx512vl(auVar252,auVar257,auVar246);
                    auVar252 = vfmadd213ps_avx512vl(auVar252,auVar257,auVar247);
                    auVar252 = vfmadd213ps_avx512vl(auVar252,auVar257,auVar248);
                    auVar252 = vfmadd213ps_avx512vl(auVar252,auVar257,auVar249);
                    auVar252 = vfmadd213ps_avx512vl(auVar252,auVar257,auVar250);
                    auVar254 = vmulps_avx512vl(auVar253,auVar257);
                    auVar254 = vmulps_avx512vl(auVar254,auVar252);
                    auVar98._8_4_ = 0xffffff82;
                    auVar98._0_8_ = 0xffffff82ffffff82;
                    auVar98._12_4_ = 0xffffff82;
                    auVar98._16_4_ = 0xffffff82;
                    auVar98._20_4_ = 0xffffff82;
                    auVar98._24_4_ = 0xffffff82;
                    auVar98._28_4_ = 0xffffff82;
                    auVar252 = vpaddd_avx512vl(auVar255,auVar98);
                    auVar252 = vcvtdq2ps_avx(auVar252);
                    auVar255 = vsubps_avx512vl(auVar252,auVar389);
                    bVar37 = (bool)((byte)uVar157 & 1);
                    auVar258._0_4_ = (uint)bVar37 * auVar255._0_4_ | (uint)!bVar37 * auVar252._0_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                    auVar258._4_4_ = (uint)bVar37 * auVar255._4_4_ | (uint)!bVar37 * auVar252._4_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                    auVar258._8_4_ = (uint)bVar37 * auVar255._8_4_ | (uint)!bVar37 * auVar252._8_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                    auVar258._12_4_ =
                         (uint)bVar37 * auVar255._12_4_ | (uint)!bVar37 * auVar252._12_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                    auVar258._16_4_ =
                         (uint)bVar37 * auVar255._16_4_ | (uint)!bVar37 * auVar252._16_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                    auVar258._20_4_ =
                         (uint)bVar37 * auVar255._20_4_ | (uint)!bVar37 * auVar252._20_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                    auVar258._24_4_ =
                         (uint)bVar37 * auVar255._24_4_ | (uint)!bVar37 * auVar252._24_4_;
                    bVar37 = SUB81(uVar157 >> 7,0);
                    auVar258._28_4_ =
                         (uint)bVar37 * auVar255._28_4_ | (uint)!bVar37 * auVar252._28_4_;
                    auVar252 = vfmadd231ps_avx512vl(auVar254,auVar258,auVar484);
                    auVar252 = vfmsub231ps_avx512vl(auVar252,auVar377,auVar253);
                    auVar252 = vsubps_avx512vl(auVar252,auVar257);
                    auVar168 = vfmsub231ps_fma(auVar252,auVar395,auVar258);
                    auVar252 = vmulps_avx512vl(ZEXT1632(auVar168),auVar251);
                    auVar253 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar259._0_4_ = (uint)bVar37 * auVar253._0_4_ | (uint)!bVar37 * auVar252._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar259._4_4_ = (uint)bVar37 * auVar253._4_4_ | (uint)!bVar37 * auVar252._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar259._8_4_ = (uint)bVar37 * auVar253._8_4_ | (uint)!bVar37 * auVar252._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar259._12_4_ =
                         (uint)bVar37 * auVar253._12_4_ | (uint)!bVar37 * auVar252._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar259._16_4_ =
                         (uint)bVar37 * auVar253._16_4_ | (uint)!bVar37 * auVar252._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar259._20_4_ =
                         (uint)bVar37 * auVar253._20_4_ | (uint)!bVar37 * auVar252._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar259._24_4_ =
                         (uint)bVar37 * auVar253._24_4_ | (uint)!bVar37 * auVar252._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar259._28_4_ =
                         (uint)bVar37 * auVar253._28_4_ | (uint)!bVar37 * auVar252._28_4_;
                    auVar252 = vminps_avx(auVar259,auVar364);
                    auVar252 = vmaxps_avx(auVar252,auVar371);
                    auVar168 = vfmadd213ps_fma(auVar383,auVar252,auVar377);
                    auVar253 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar253,1);
                    auVar254 = vsubps_avx512vl(auVar253,auVar389);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar260._0_4_ = (uint)bVar37 * auVar254._0_4_ | (uint)!bVar37 * auVar253._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar260._4_4_ = (uint)bVar37 * auVar254._4_4_ | (uint)!bVar37 * auVar253._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar260._8_4_ = (uint)bVar37 * auVar254._8_4_ | (uint)!bVar37 * auVar253._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar260._12_4_ =
                         (uint)bVar37 * auVar254._12_4_ | (uint)!bVar37 * auVar253._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar260._16_4_ =
                         (uint)bVar37 * auVar254._16_4_ | (uint)!bVar37 * auVar253._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar260._20_4_ =
                         (uint)bVar37 * auVar254._20_4_ | (uint)!bVar37 * auVar253._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar260._24_4_ =
                         (uint)bVar37 * auVar254._24_4_ | (uint)!bVar37 * auVar253._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar260._28_4_ =
                         (uint)bVar37 * auVar254._28_4_ | (uint)!bVar37 * auVar253._28_4_;
                    in_ZMM16 = ZEXT3264(auVar260);
                    auVar252 = vfmsub231ps_avx512vl(auVar252,auVar260,auVar395);
                    auVar252 = vfnmsub231ps_avx512vl(auVar252,auVar260,auVar484);
                    auVar444._0_4_ = auVar252._0_4_ * auVar252._0_4_;
                    auVar444._4_4_ = auVar252._4_4_ * auVar252._4_4_;
                    auVar444._8_4_ = auVar252._8_4_ * auVar252._8_4_;
                    auVar444._12_4_ = auVar252._12_4_ * auVar252._12_4_;
                    auVar444._16_4_ = auVar252._16_4_ * auVar252._16_4_;
                    auVar444._20_4_ = auVar252._20_4_ * auVar252._20_4_;
                    auVar444._24_4_ = auVar252._24_4_ * auVar252._24_4_;
                    auVar444._28_4_ = 0;
                    auVar253 = vfmadd213ps_avx512vl(auVar222,auVar252,auVar453);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar252,auVar459);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar252,auVar465);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar252,auVar471);
                    auVar253 = vfmadd213ps_avx512vl(auVar253,auVar252,auVar377);
                    auVar252 = vfmadd213ps_avx512vl(auVar253,auVar444,auVar252);
                    auVar253 = vaddps_avx512vl(auVar252,auVar389);
                    auVar252 = vcvttps2dq_avx512vl(auVar260);
                    auVar252 = vpslld_avx2(auVar252,0x17);
                    auVar252 = vpaddd_avx2(auVar252,auVar478);
                    auVar168 = vfmadd213ps_fma(auVar252,auVar253,auVar389);
                    auVar252 = vrcpps_avx(ZEXT1632(auVar168));
                    auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar252,auVar389);
                    auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar252,auVar252);
                    auVar252 = vfnmadd213ps_avx512vl(ZEXT1632(auVar168),auVar251,auVar223);
                    auVar277._0_4_ = auVar252._0_4_ * auVar274._0_4_;
                    auVar277._4_4_ = auVar252._4_4_ * auVar274._4_4_;
                    auVar277._8_4_ = auVar252._8_4_ * auVar274._8_4_;
                    auVar277._12_4_ = auVar252._12_4_ * auVar274._12_4_;
                    auVar277._16_4_ = auVar252._16_4_ * auVar274._16_4_;
                    auVar277._20_4_ = auVar252._20_4_ * auVar274._20_4_;
                    auVar277._24_4_ = auVar252._24_4_ * auVar274._24_4_;
                    auVar252 = auVar277._0_32_;
                    break;
                  case 6:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar418._4_4_ = uVar12;
                    auVar418._0_4_ = uVar12;
                    auVar418._8_4_ = uVar12;
                    auVar418._12_4_ = uVar12;
                    auVar418._16_4_ = uVar12;
                    auVar418._20_4_ = uVar12;
                    auVar418._24_4_ = uVar12;
                    auVar418._28_4_ = uVar12;
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                    auVar92._4_4_ = uVar12;
                    auVar92._0_4_ = uVar12;
                    auVar92._8_4_ = uVar12;
                    auVar92._12_4_ = uVar12;
                    auVar92._16_4_ = uVar12;
                    auVar92._20_4_ = uVar12;
                    auVar92._24_4_ = uVar12;
                    auVar92._28_4_ = uVar12;
                    auVar252 = vfmadd213ps_avx512vl(auVar418,auVar252,auVar92);
                    auVar252 = vmaxps_avx(auVar252,auVar253);
                    auVar252 = vminps_avx(auVar252,auVar389);
                    auVar355._0_4_ = auVar252._0_4_ * auVar274._0_4_;
                    auVar355._4_4_ = auVar252._4_4_ * auVar274._4_4_;
                    auVar355._8_4_ = auVar252._8_4_ * auVar274._8_4_;
                    auVar355._12_4_ = auVar252._12_4_ * auVar274._12_4_;
                    auVar355._16_4_ = auVar252._16_4_ * auVar274._16_4_;
                    auVar355._20_4_ = auVar252._20_4_ * auVar274._20_4_;
                    auVar355._24_4_ = auVar252._24_4_ * auVar274._24_4_;
                    auVar355._28_36_ = auVar277._28_36_;
                    auVar252 = auVar355._0_32_;
                  }
                }
                *(undefined1 (*) [32])ppp_Var150 = auVar252;
                ppp_Var150 = ppp_Var150 + 4;
                uVar161 = uVar161 + 1;
                iVar134 = iVar134 + 1;
              } while (uVar161 != local_118.w);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_118.c);
    }
    if (((iVar9 == 4) && (uVar145 == 8)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      iVar138 = *(int *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_1e0 = 0;
      auVar365._8_4_ = 0x42b0c0a5;
      auVar365._0_8_ = 0x42b0c0a542b0c0a5;
      auVar365._12_4_ = 0x42b0c0a5;
      auVar365._16_4_ = 0x42b0c0a5;
      auVar365._20_4_ = 0x42b0c0a5;
      auVar365._24_4_ = 0x42b0c0a5;
      auVar365._28_4_ = 0x42b0c0a5;
      auVar372._8_4_ = 0xc2b0c0a5;
      auVar372._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar372._12_4_ = 0xc2b0c0a5;
      auVar372._16_4_ = 0xc2b0c0a5;
      auVar372._20_4_ = 0xc2b0c0a5;
      auVar372._24_4_ = 0xc2b0c0a5;
      auVar372._28_4_ = 0xc2b0c0a5;
      auVar378._8_4_ = 0x3f000000;
      auVar378._0_8_ = 0x3f0000003f000000;
      auVar378._12_4_ = 0x3f000000;
      auVar378._16_4_ = 0x3f000000;
      auVar378._20_4_ = 0x3f000000;
      auVar378._24_4_ = 0x3f000000;
      auVar378._28_4_ = 0x3f000000;
      auVar384._8_4_ = 0x3fb8aa3b;
      auVar384._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar384._12_4_ = 0x3fb8aa3b;
      auVar384._16_4_ = 0x3fb8aa3b;
      auVar384._20_4_ = 0x3fb8aa3b;
      auVar384._24_4_ = 0x3fb8aa3b;
      auVar384._28_4_ = 0x3fb8aa3b;
      auVar390._8_4_ = 0x3f800000;
      auVar390._0_8_ = 0x3f8000003f800000;
      auVar390._12_4_ = 0x3f800000;
      auVar390._16_4_ = 0x3f800000;
      auVar390._20_4_ = 0x3f800000;
      auVar390._24_4_ = 0x3f800000;
      auVar390._28_4_ = 0x3f800000;
      auVar396._8_4_ = 0x3f318000;
      auVar396._0_8_ = 0x3f3180003f318000;
      auVar396._12_4_ = 0x3f318000;
      auVar396._16_4_ = 0x3f318000;
      auVar396._20_4_ = 0x3f318000;
      auVar396._24_4_ = 0x3f318000;
      auVar396._28_4_ = 0x3f318000;
      auVar222 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar454._8_4_ = 0x3ab743ce;
      auVar454._0_8_ = 0x3ab743ce3ab743ce;
      auVar454._12_4_ = 0x3ab743ce;
      auVar454._16_4_ = 0x3ab743ce;
      auVar454._20_4_ = 0x3ab743ce;
      auVar454._24_4_ = 0x3ab743ce;
      auVar454._28_4_ = 0x3ab743ce;
      auVar460._8_4_ = 0x3c088908;
      auVar460._0_8_ = 0x3c0889083c088908;
      auVar460._12_4_ = 0x3c088908;
      auVar460._16_4_ = 0x3c088908;
      auVar460._20_4_ = 0x3c088908;
      auVar460._24_4_ = 0x3c088908;
      auVar460._28_4_ = 0x3c088908;
      auVar466._8_4_ = 0x3d2aa9c1;
      auVar466._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar466._12_4_ = 0x3d2aa9c1;
      auVar466._16_4_ = 0x3d2aa9c1;
      auVar466._20_4_ = 0x3d2aa9c1;
      auVar466._24_4_ = 0x3d2aa9c1;
      auVar466._28_4_ = 0x3d2aa9c1;
      auVar472._8_4_ = 0x3e2aaaaa;
      auVar472._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar472._12_4_ = 0x3e2aaaaa;
      auVar472._16_4_ = 0x3e2aaaaa;
      auVar472._20_4_ = 0x3e2aaaaa;
      auVar472._24_4_ = 0x3e2aaaaa;
      auVar472._28_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT3264(auVar472);
      auVar479._8_4_ = 0x3f800000;
      auVar479._0_8_ = 0x3f8000003f800000;
      auVar479._12_4_ = 0x3f800000;
      auVar479._16_4_ = 0x3f800000;
      auVar479._20_4_ = 0x3f800000;
      auVar479._24_4_ = 0x3f800000;
      auVar479._28_4_ = 0x3f800000;
      auVar485._8_4_ = 0xb95e8083;
      auVar485._0_8_ = 0xb95e8083b95e8083;
      auVar485._12_4_ = 0xb95e8083;
      auVar485._16_4_ = 0xb95e8083;
      auVar485._20_4_ = 0xb95e8083;
      auVar485._24_4_ = 0xb95e8083;
      auVar485._28_4_ = 0xb95e8083;
      auVar223 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      in_ZMM20 = ZEXT3264(auVar223);
      auVar244 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT3264(auVar244);
      auVar245 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar246 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar247 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar248 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar249 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar250 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar251 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar252 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar253 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar254 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        if (0 < local_118.h) {
          uVar13 = bottom_blob->w;
          unaff_R13 = (ulong)uVar13;
          iVar139 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar160 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x20;
          uVar153 = 0;
          do {
            if (0 < local_118.w) {
              uVar161 = 0;
              iVar134 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar274 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar274 = ZEXT3264(*(undefined1 (*) [32])(lVar155 + local_1e0 * 0x20));
                }
                if (0 < (int)uVar160) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar135 = (((int)uVar157 - uVar11) + 1) * iVar10 + uVar153;
                        if (((-1 < iVar135) && (iVar136 = iVar135 / iVar158, iVar135 % iVar158 == 0)
                            ) && ((0 < (int)uVar140 && (iVar136 < iVar139)))) {
                          lVar144 = (long)iVar136 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar135 = iVar134;
                          do {
                            if (((-1 < iVar135) &&
                                (iVar136 = iVar135 / iVar156, iVar135 % iVar156 == 0)) &&
                               (iVar136 < (int)uVar13)) {
                              lVar142 = (long)(iVar136 << 2);
                              uVar12 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144);
                              auVar419._4_4_ = uVar12;
                              auVar419._0_4_ = uVar12;
                              auVar419._8_4_ = uVar12;
                              auVar419._12_4_ = uVar12;
                              auVar419._16_4_ = uVar12;
                              auVar419._20_4_ = uVar12;
                              auVar419._24_4_ = uVar12;
                              auVar419._28_4_ = uVar12;
                              uVar12 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144 + 4);
                              auVar445._4_4_ = uVar12;
                              auVar445._0_4_ = uVar12;
                              auVar445._8_4_ = uVar12;
                              auVar445._12_4_ = uVar12;
                              auVar445._16_4_ = uVar12;
                              auVar445._20_4_ = uVar12;
                              auVar445._24_4_ = uVar12;
                              auVar445._28_4_ = uVar12;
                              auVar255 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              in_ZMM16 = ZEXT3264(auVar255);
                              auVar224 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              uVar163 = uVar154 & 0xffffffff;
                              auVar168 = vfmadd231ps_fma(auVar274._0_32_,auVar419,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar151 + uVar163 * 4));
                              auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar445,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar151 + uVar163 * 4 + 0x20));
                              auVar255 = vfmadd231ps_avx512vl
                                                   (ZEXT1632(auVar168),auVar255,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x40));
                              auVar255 = vfmadd231ps_avx512vl
                                                   (auVar255,auVar224,
                                                    *(undefined1 (*) [32])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x60));
                              auVar274 = ZEXT3264(auVar255);
                            }
                            uVar154 = uVar154 + 0x20;
                            iVar135 = iVar135 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 0x20;
                      } while (uVar157 != uVar11);
                    }
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x20) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                auVar255 = auVar274._0_32_;
                if (iVar138 - 1U < 6) {
                  auVar224 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar356._28_36_ = auVar274._28_36_;
                  switch(iVar138) {
                  case 1:
                    auVar255 = vmaxps_avx(auVar255,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar225 = vmaxps_avx(auVar255,auVar224);
                    auVar255 = vminps_avx(auVar255,auVar224);
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar112._4_4_ = uVar12;
                    auVar112._0_4_ = uVar12;
                    auVar112._8_4_ = uVar12;
                    auVar112._12_4_ = uVar12;
                    auVar112._16_4_ = uVar12;
                    auVar112._20_4_ = uVar12;
                    auVar112._24_4_ = uVar12;
                    auVar112._28_4_ = uVar12;
                    auVar255 = vfmadd132ps_avx512vl(auVar255,auVar225,auVar112);
                    break;
                  case 3:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar110._4_4_ = uVar12;
                    auVar110._0_4_ = uVar12;
                    auVar110._8_4_ = uVar12;
                    auVar110._12_4_ = uVar12;
                    auVar110._16_4_ = uVar12;
                    auVar110._20_4_ = uVar12;
                    auVar110._24_4_ = uVar12;
                    auVar110._28_4_ = uVar12;
                    auVar255 = vmaxps_avx512vl(auVar255,auVar110);
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                    auVar111._4_4_ = uVar12;
                    auVar111._0_4_ = uVar12;
                    auVar111._8_4_ = uVar12;
                    auVar111._12_4_ = uVar12;
                    auVar111._16_4_ = uVar12;
                    auVar111._20_4_ = uVar12;
                    auVar111._24_4_ = uVar12;
                    auVar111._28_4_ = uVar12;
                    auVar255 = vminps_avx512vl(auVar255,auVar111);
                    break;
                  case 4:
                    auVar108._8_4_ = 0x80000000;
                    auVar108._0_8_ = 0x8000000080000000;
                    auVar108._12_4_ = 0x80000000;
                    auVar108._16_4_ = 0x80000000;
                    auVar108._20_4_ = 0x80000000;
                    auVar108._24_4_ = 0x80000000;
                    auVar108._28_4_ = 0x80000000;
                    auVar255 = vxorps_avx512vl(auVar255,auVar108);
                    auVar255 = vminps_avx(auVar255,auVar365);
                    auVar255 = vmaxps_avx(auVar255,auVar372);
                    auVar168 = vfmadd231ps_fma(auVar378,auVar255,auVar384);
                    auVar224 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar224,1);
                    auVar225 = vsubps_avx512vl(auVar224,auVar390);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar267._0_4_ = (uint)bVar37 * auVar225._0_4_ | (uint)!bVar37 * auVar224._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar267._4_4_ = (uint)bVar37 * auVar225._4_4_ | (uint)!bVar37 * auVar224._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar267._8_4_ = (uint)bVar37 * auVar225._8_4_ | (uint)!bVar37 * auVar224._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar267._12_4_ =
                         (uint)bVar37 * auVar225._12_4_ | (uint)!bVar37 * auVar224._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar267._16_4_ =
                         (uint)bVar37 * auVar225._16_4_ | (uint)!bVar37 * auVar224._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar267._20_4_ =
                         (uint)bVar37 * auVar225._20_4_ | (uint)!bVar37 * auVar224._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar267._24_4_ =
                         (uint)bVar37 * auVar225._24_4_ | (uint)!bVar37 * auVar224._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar267._28_4_ =
                         (uint)bVar37 * auVar225._28_4_ | (uint)!bVar37 * auVar224._28_4_;
                    in_ZMM16 = ZEXT3264(auVar267);
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar267,auVar396);
                    auVar109._8_4_ = 0x395e8083;
                    auVar109._0_8_ = 0x395e8083395e8083;
                    auVar109._12_4_ = 0x395e8083;
                    auVar109._16_4_ = 0x395e8083;
                    auVar109._20_4_ = 0x395e8083;
                    auVar109._24_4_ = 0x395e8083;
                    auVar109._28_4_ = 0x395e8083;
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar267,auVar109);
                    auVar420._0_4_ = auVar255._0_4_ * auVar255._0_4_;
                    auVar420._4_4_ = auVar255._4_4_ * auVar255._4_4_;
                    auVar420._8_4_ = auVar255._8_4_ * auVar255._8_4_;
                    auVar420._12_4_ = auVar255._12_4_ * auVar255._12_4_;
                    auVar420._16_4_ = auVar255._16_4_ * auVar255._16_4_;
                    auVar420._20_4_ = auVar255._20_4_ * auVar255._20_4_;
                    auVar420._24_4_ = auVar255._24_4_ * auVar255._24_4_;
                    auVar420._28_4_ = 0;
                    auVar168 = vfmadd213ps_fma(auVar222,auVar255,auVar454);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar255,auVar460);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar255,auVar466);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar255,auVar472);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar255,auVar378);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar420,auVar255);
                    auVar421._0_4_ = auVar168._0_4_ + 1.0;
                    auVar421._4_4_ = auVar168._4_4_ + 1.0;
                    auVar421._8_4_ = auVar168._8_4_ + 1.0;
                    auVar421._12_4_ = auVar168._12_4_ + 1.0;
                    auVar421._16_4_ = 0x3f800000;
                    auVar421._20_4_ = 0x3f800000;
                    auVar421._24_4_ = 0x3f800000;
                    auVar421._28_4_ = 0x3f800000;
                    auVar255 = vcvttps2dq_avx512vl(auVar267);
                    auVar255 = vpslld_avx2(auVar255,0x17);
                    auVar255 = vpaddd_avx2(auVar479,auVar255);
                    auVar168 = vfmadd213ps_fma(auVar255,auVar421,auVar390);
                    auVar255 = vrcpps_avx(ZEXT1632(auVar168));
                    auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar255,auVar390);
                    auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar255,auVar255);
                    auVar255 = ZEXT1632(auVar168);
                    break;
                  case 5:
                    auVar255 = vminps_avx(auVar255,auVar365);
                    auVar255 = vmaxps_avx(auVar255,auVar372);
                    auVar168 = vfmadd213ps_fma(auVar384,auVar255,auVar378);
                    auVar225 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar225,1);
                    auVar226 = vsubps_avx512vl(auVar225,auVar390);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar262._0_4_ = (uint)bVar37 * auVar226._0_4_ | (uint)!bVar37 * auVar225._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar262._4_4_ = (uint)bVar37 * auVar226._4_4_ | (uint)!bVar37 * auVar225._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar262._8_4_ = (uint)bVar37 * auVar226._8_4_ | (uint)!bVar37 * auVar225._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar262._12_4_ =
                         (uint)bVar37 * auVar226._12_4_ | (uint)!bVar37 * auVar225._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar262._16_4_ =
                         (uint)bVar37 * auVar226._16_4_ | (uint)!bVar37 * auVar225._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar262._20_4_ =
                         (uint)bVar37 * auVar226._20_4_ | (uint)!bVar37 * auVar225._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar262._24_4_ =
                         (uint)bVar37 * auVar226._24_4_ | (uint)!bVar37 * auVar225._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar262._28_4_ =
                         (uint)bVar37 * auVar226._28_4_ | (uint)!bVar37 * auVar225._28_4_;
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar262,auVar396);
                    auVar255 = vfnmsub231ps_avx512vl(auVar255,auVar262,auVar485);
                    auVar446._0_4_ = auVar255._0_4_ * auVar255._0_4_;
                    auVar446._4_4_ = auVar255._4_4_ * auVar255._4_4_;
                    auVar446._8_4_ = auVar255._8_4_ * auVar255._8_4_;
                    auVar446._12_4_ = auVar255._12_4_ * auVar255._12_4_;
                    auVar446._16_4_ = auVar255._16_4_ * auVar255._16_4_;
                    auVar446._20_4_ = auVar255._20_4_ * auVar255._20_4_;
                    auVar446._24_4_ = auVar255._24_4_ * auVar255._24_4_;
                    auVar446._28_4_ = 0;
                    auVar225 = vfmadd213ps_avx512vl(auVar222,auVar255,auVar454);
                    auVar225 = vfmadd213ps_avx512vl(auVar225,auVar255,auVar460);
                    auVar225 = vfmadd213ps_avx512vl(auVar225,auVar255,auVar466);
                    auVar225 = vfmadd213ps_avx512vl(auVar225,auVar255,auVar472);
                    auVar225 = vfmadd213ps_avx512vl(auVar225,auVar255,auVar378);
                    auVar255 = vfmadd213ps_avx512vl(auVar225,auVar446,auVar255);
                    auVar225 = vaddps_avx512vl(auVar255,auVar390);
                    auVar255 = vcvttps2dq_avx512vl(auVar262);
                    auVar255 = vpslld_avx2(auVar255,0x17);
                    auVar255 = vpaddd_avx2(auVar255,auVar479);
                    auVar168 = vfmadd213ps_fma(auVar255,auVar225,auVar390);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar224,2);
                    auVar105._8_4_ = 0x800000;
                    auVar105._0_8_ = 0x80000000800000;
                    auVar105._12_4_ = 0x800000;
                    auVar105._16_4_ = 0x800000;
                    auVar105._20_4_ = 0x800000;
                    auVar105._24_4_ = 0x800000;
                    auVar105._28_4_ = 0x800000;
                    auVar255 = vmaxps_avx512vl(ZEXT1632(auVar168),auVar105);
                    auVar226 = vpsrld_avx2(auVar255,0x17);
                    auVar224 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar106._8_4_ = 0x3f000000;
                    auVar106._0_8_ = 0x3f0000003f000000;
                    auVar106._12_4_ = 0x3f000000;
                    auVar106._16_4_ = 0x3f000000;
                    auVar106._20_4_ = 0x3f000000;
                    auVar106._24_4_ = 0x3f000000;
                    auVar106._28_4_ = 0x3f000000;
                    auVar255 = vpternlogd_avx512vl(auVar255,auVar224,auVar106,0xea);
                    uVar157 = vcmpps_avx512vl(auVar255,auVar223,1);
                    auVar224 = vaddps_avx512vl(auVar255,auVar244);
                    auVar255 = vaddps_avx512vl(auVar224,auVar255);
                    bVar37 = (bool)((byte)uVar157 & 1);
                    auVar263._0_4_ = (uint)bVar37 * auVar255._0_4_ | (uint)!bVar37 * auVar224._0_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                    auVar263._4_4_ = (uint)bVar37 * auVar255._4_4_ | (uint)!bVar37 * auVar224._4_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                    auVar263._8_4_ = (uint)bVar37 * auVar255._8_4_ | (uint)!bVar37 * auVar224._8_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                    auVar263._12_4_ =
                         (uint)bVar37 * auVar255._12_4_ | (uint)!bVar37 * auVar224._12_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                    auVar263._16_4_ =
                         (uint)bVar37 * auVar255._16_4_ | (uint)!bVar37 * auVar224._16_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                    auVar263._20_4_ =
                         (uint)bVar37 * auVar255._20_4_ | (uint)!bVar37 * auVar224._20_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                    auVar263._24_4_ =
                         (uint)bVar37 * auVar255._24_4_ | (uint)!bVar37 * auVar224._24_4_;
                    bVar37 = SUB81(uVar157 >> 7,0);
                    auVar263._28_4_ =
                         (uint)bVar37 * auVar255._28_4_ | (uint)!bVar37 * auVar224._28_4_;
                    auVar224 = vmulps_avx512vl(auVar263,auVar263);
                    auVar255 = vfmadd213ps_avx512vl(auVar245,auVar263,auVar246);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar263,auVar247);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar263,auVar248);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar263,auVar249);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar263,auVar250);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar263,auVar251);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar263,auVar252);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar263,auVar253);
                    auVar225 = vmulps_avx512vl(auVar224,auVar263);
                    auVar225 = vmulps_avx512vl(auVar225,auVar255);
                    auVar107._8_4_ = 0xffffff82;
                    auVar107._0_8_ = 0xffffff82ffffff82;
                    auVar107._12_4_ = 0xffffff82;
                    auVar107._16_4_ = 0xffffff82;
                    auVar107._20_4_ = 0xffffff82;
                    auVar107._24_4_ = 0xffffff82;
                    auVar107._28_4_ = 0xffffff82;
                    auVar255 = vpaddd_avx512vl(auVar226,auVar107);
                    auVar255 = vcvtdq2ps_avx(auVar255);
                    auVar226 = vsubps_avx512vl(auVar255,auVar390);
                    bVar37 = (bool)((byte)uVar157 & 1);
                    auVar264._0_4_ = (uint)bVar37 * auVar226._0_4_ | (uint)!bVar37 * auVar255._0_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                    auVar264._4_4_ = (uint)bVar37 * auVar226._4_4_ | (uint)!bVar37 * auVar255._4_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                    auVar264._8_4_ = (uint)bVar37 * auVar226._8_4_ | (uint)!bVar37 * auVar255._8_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                    auVar264._12_4_ =
                         (uint)bVar37 * auVar226._12_4_ | (uint)!bVar37 * auVar255._12_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                    auVar264._16_4_ =
                         (uint)bVar37 * auVar226._16_4_ | (uint)!bVar37 * auVar255._16_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                    auVar264._20_4_ =
                         (uint)bVar37 * auVar226._20_4_ | (uint)!bVar37 * auVar255._20_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                    auVar264._24_4_ =
                         (uint)bVar37 * auVar226._24_4_ | (uint)!bVar37 * auVar255._24_4_;
                    bVar37 = SUB81(uVar157 >> 7,0);
                    auVar264._28_4_ =
                         (uint)bVar37 * auVar226._28_4_ | (uint)!bVar37 * auVar255._28_4_;
                    auVar255 = vfmadd231ps_avx512vl(auVar225,auVar264,auVar485);
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar378,auVar224);
                    auVar255 = vsubps_avx512vl(auVar255,auVar263);
                    auVar168 = vfmsub231ps_fma(auVar255,auVar396,auVar264);
                    auVar255 = vmulps_avx512vl(ZEXT1632(auVar168),auVar254);
                    auVar224 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar265._0_4_ = (uint)bVar37 * auVar224._0_4_ | (uint)!bVar37 * auVar255._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar265._4_4_ = (uint)bVar37 * auVar224._4_4_ | (uint)!bVar37 * auVar255._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar265._8_4_ = (uint)bVar37 * auVar224._8_4_ | (uint)!bVar37 * auVar255._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar265._12_4_ =
                         (uint)bVar37 * auVar224._12_4_ | (uint)!bVar37 * auVar255._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar265._16_4_ =
                         (uint)bVar37 * auVar224._16_4_ | (uint)!bVar37 * auVar255._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar265._20_4_ =
                         (uint)bVar37 * auVar224._20_4_ | (uint)!bVar37 * auVar255._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar265._24_4_ =
                         (uint)bVar37 * auVar224._24_4_ | (uint)!bVar37 * auVar255._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar265._28_4_ =
                         (uint)bVar37 * auVar224._28_4_ | (uint)!bVar37 * auVar255._28_4_;
                    auVar255 = vminps_avx(auVar265,auVar365);
                    auVar255 = vmaxps_avx(auVar255,auVar372);
                    auVar168 = vfmadd213ps_fma(auVar384,auVar255,auVar378);
                    auVar224 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar224,1);
                    auVar225 = vsubps_avx512vl(auVar224,auVar390);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar266._0_4_ = (uint)bVar37 * auVar225._0_4_ | (uint)!bVar37 * auVar224._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar266._4_4_ = (uint)bVar37 * auVar225._4_4_ | (uint)!bVar37 * auVar224._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar266._8_4_ = (uint)bVar37 * auVar225._8_4_ | (uint)!bVar37 * auVar224._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar266._12_4_ =
                         (uint)bVar37 * auVar225._12_4_ | (uint)!bVar37 * auVar224._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar266._16_4_ =
                         (uint)bVar37 * auVar225._16_4_ | (uint)!bVar37 * auVar224._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar266._20_4_ =
                         (uint)bVar37 * auVar225._20_4_ | (uint)!bVar37 * auVar224._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar266._24_4_ =
                         (uint)bVar37 * auVar225._24_4_ | (uint)!bVar37 * auVar224._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar266._28_4_ =
                         (uint)bVar37 * auVar225._28_4_ | (uint)!bVar37 * auVar224._28_4_;
                    in_ZMM16 = ZEXT3264(auVar266);
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar266,auVar396);
                    auVar255 = vfnmsub231ps_avx512vl(auVar255,auVar266,auVar485);
                    auVar447._0_4_ = auVar255._0_4_ * auVar255._0_4_;
                    auVar447._4_4_ = auVar255._4_4_ * auVar255._4_4_;
                    auVar447._8_4_ = auVar255._8_4_ * auVar255._8_4_;
                    auVar447._12_4_ = auVar255._12_4_ * auVar255._12_4_;
                    auVar447._16_4_ = auVar255._16_4_ * auVar255._16_4_;
                    auVar447._20_4_ = auVar255._20_4_ * auVar255._20_4_;
                    auVar447._24_4_ = auVar255._24_4_ * auVar255._24_4_;
                    auVar447._28_4_ = 0;
                    auVar224 = vfmadd213ps_avx512vl(auVar222,auVar255,auVar454);
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar255,auVar460);
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar255,auVar466);
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar255,auVar472);
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar255,auVar378);
                    auVar255 = vfmadd213ps_avx512vl(auVar224,auVar447,auVar255);
                    auVar224 = vaddps_avx512vl(auVar255,auVar390);
                    auVar255 = vcvttps2dq_avx512vl(auVar266);
                    auVar255 = vpslld_avx2(auVar255,0x17);
                    auVar255 = vpaddd_avx2(auVar255,auVar479);
                    auVar168 = vfmadd213ps_fma(auVar255,auVar224,auVar390);
                    auVar255 = vrcpps_avx(ZEXT1632(auVar168));
                    auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar255,auVar390);
                    auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar255,auVar255);
                    auVar255 = vfnmadd213ps_avx512vl(ZEXT1632(auVar168),auVar254,auVar244);
                    auVar356._0_4_ = auVar255._0_4_ * auVar274._0_4_;
                    auVar356._4_4_ = auVar255._4_4_ * auVar274._4_4_;
                    auVar356._8_4_ = auVar255._8_4_ * auVar274._8_4_;
                    auVar356._12_4_ = auVar255._12_4_ * auVar274._12_4_;
                    auVar356._16_4_ = auVar255._16_4_ * auVar274._16_4_;
                    auVar356._20_4_ = auVar255._20_4_ * auVar274._20_4_;
                    auVar356._24_4_ = auVar255._24_4_ * auVar274._24_4_;
                    auVar255 = auVar356._0_32_;
                    break;
                  case 6:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar422._4_4_ = uVar12;
                    auVar422._0_4_ = uVar12;
                    auVar422._8_4_ = uVar12;
                    auVar422._12_4_ = uVar12;
                    auVar422._16_4_ = uVar12;
                    auVar422._20_4_ = uVar12;
                    auVar422._24_4_ = uVar12;
                    auVar422._28_4_ = uVar12;
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                    auVar104._4_4_ = uVar12;
                    auVar104._0_4_ = uVar12;
                    auVar104._8_4_ = uVar12;
                    auVar104._12_4_ = uVar12;
                    auVar104._16_4_ = uVar12;
                    auVar104._20_4_ = uVar12;
                    auVar104._24_4_ = uVar12;
                    auVar104._28_4_ = uVar12;
                    auVar255 = vfmadd213ps_avx512vl(auVar422,auVar255,auVar104);
                    auVar255 = vmaxps_avx(auVar255,auVar224);
                    auVar255 = vminps_avx(auVar255,auVar390);
                    auVar357._0_4_ = auVar255._0_4_ * auVar274._0_4_;
                    auVar357._4_4_ = auVar255._4_4_ * auVar274._4_4_;
                    auVar357._8_4_ = auVar255._8_4_ * auVar274._8_4_;
                    auVar357._12_4_ = auVar255._12_4_ * auVar274._12_4_;
                    auVar357._16_4_ = auVar255._16_4_ * auVar274._16_4_;
                    auVar357._20_4_ = auVar255._20_4_ * auVar274._20_4_;
                    auVar357._24_4_ = auVar255._24_4_ * auVar274._24_4_;
                    auVar357._28_36_ = auVar356._28_36_;
                    auVar255 = auVar357._0_32_;
                  }
                }
                *(undefined1 (*) [32])ppp_Var150 = auVar255;
                ppp_Var150 = ppp_Var150 + 4;
                uVar161 = uVar161 + 1;
                iVar134 = iVar134 + 1;
              } while (uVar161 != local_118.w);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_118.c);
    }
    if (((iVar9 == 8) && (uVar145 == 4)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_1e0 = 0;
      auVar209 = ZEXT816(0) << 0x40;
      auVar361._8_4_ = 0x42b0c0a5;
      auVar361._0_8_ = 0x42b0c0a542b0c0a5;
      auVar361._12_4_ = 0x42b0c0a5;
      auVar368._8_4_ = 0xc2b0c0a5;
      auVar368._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar368._12_4_ = 0xc2b0c0a5;
      auVar374._8_4_ = 0x3f000000;
      auVar374._0_8_ = 0x3f0000003f000000;
      auVar374._12_4_ = 0x3f000000;
      auVar380._8_4_ = 0x3fb8aa3b;
      auVar380._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar380._12_4_ = 0x3fb8aa3b;
      auVar386._8_4_ = 0x3f800000;
      auVar386._0_8_ = 0x3f8000003f800000;
      auVar386._12_4_ = 0x3f800000;
      auVar392._8_4_ = 0x3f318000;
      auVar392._0_8_ = 0x3f3180003f318000;
      auVar392._12_4_ = 0x3f318000;
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar450._8_4_ = 0x3ab743ce;
      auVar450._0_8_ = 0x3ab743ce3ab743ce;
      auVar450._12_4_ = 0x3ab743ce;
      auVar456._8_4_ = 0x3c088908;
      auVar456._0_8_ = 0x3c0889083c088908;
      auVar456._12_4_ = 0x3c088908;
      auVar462._8_4_ = 0x3d2aa9c1;
      auVar462._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar462._12_4_ = 0x3d2aa9c1;
      auVar468._8_4_ = 0x3e2aaaaa;
      auVar468._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar468._12_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT1664(auVar468);
      auVar475._8_4_ = 0x3f800000;
      auVar475._0_8_ = 0x3f8000003f800000;
      auVar475._12_4_ = 0x3f800000;
      auVar481._8_4_ = 0xb95e8083;
      auVar481._0_8_ = 0xb95e8083b95e8083;
      auVar481._12_4_ = 0xb95e8083;
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar170 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar191 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar192 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar193 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar194 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar195 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar196 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar197 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (0 < local_118.h) {
          uVar13 = bottom_blob->w;
          unaff_R13 = (ulong)uVar13;
          iVar138 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar160 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x10;
          uVar153 = 0;
          do {
            if (0 < local_118.w) {
              uVar161 = 0;
              iVar139 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar202 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar202 = *(undefined1 (*) [16])(lVar155 + local_1e0 * 0x10);
                }
                auVar274 = ZEXT1664(auVar202);
                if (0 < (int)uVar160) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar134 = (((int)uVar157 - uVar11) + 1) * iVar10 + uVar153;
                        if (((-1 < iVar134) && (iVar135 = iVar134 / iVar158, iVar134 % iVar158 == 0)
                            ) && ((0 < (int)uVar140 && (iVar135 < iVar138)))) {
                          lVar144 = (long)iVar135 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar134 = iVar139;
                          do {
                            if (((-1 < iVar134) &&
                                (iVar135 = iVar134 / iVar156, iVar134 % iVar156 == 0)) &&
                               (iVar135 < (int)uVar13)) {
                              lVar142 = (long)(iVar135 << 3);
                              uVar1 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144);
                              auVar401._4_4_ = uVar1;
                              auVar401._0_4_ = uVar1;
                              auVar401._8_4_ = uVar1;
                              auVar401._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144 + 4);
                              auVar430._4_4_ = uVar1;
                              auVar430._0_4_ = uVar1;
                              auVar430._8_4_ = uVar1;
                              auVar430._12_4_ = uVar1;
                              auVar198 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              in_ZMM16 = ZEXT1664(auVar198);
                              auVar199 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              auVar200 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x10)))
                              ;
                              auVar201 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x14)))
                              ;
                              in_ZMM20 = ZEXT1664(auVar201);
                              auVar171 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x18)))
                              ;
                              in_ZMM21 = (float  [16])ZEXT1664(auVar171);
                              auVar172 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0x1c)))
                              ;
                              uVar163 = uVar154 & 0xffffffff;
                              auVar202 = vfmadd231ps_fma(auVar274._0_16_,auVar401,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar151 + uVar163 * 4));
                              auVar202 = vfmadd231ps_fma(auVar202,auVar430,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar151 + uVar163 * 4 + 0x10));
                              auVar202 = vfmadd231ps_avx512vl
                                                   (auVar202,auVar198,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x20));
                              auVar202 = vfmadd231ps_avx512vl
                                                   (auVar202,auVar199,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x30));
                              auVar202 = vfmadd231ps_avx512vl
                                                   (auVar202,auVar200,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x40));
                              auVar202 = vfmadd231ps_avx512vl
                                                   (auVar202,auVar201,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x50));
                              auVar202 = vfmadd231ps_avx512vl
                                                   (auVar202,auVar171,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x60));
                              auVar202 = vfmadd231ps_avx512vl
                                                   (auVar202,auVar172,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x70));
                              auVar274 = ZEXT1664(auVar202);
                            }
                            uVar154 = uVar154 + 0x20;
                            iVar134 = iVar134 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 0x20;
                      } while (uVar157 != uVar11);
                    }
                    auVar202 = auVar274._0_16_;
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x20) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                switch(uVar12) {
                case 1:
                  auVar202 = vmaxps_avx(auVar202,auVar209);
                  break;
                case 2:
                  auVar198 = vmaxps_avx(auVar202,auVar209);
                  auVar202 = vminps_avx(auVar202,auVar209);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar62._4_4_ = uVar1;
                  auVar62._0_4_ = uVar1;
                  auVar62._8_4_ = uVar1;
                  auVar62._12_4_ = uVar1;
                  auVar202 = vfmadd132ps_avx512vl(auVar202,auVar198,auVar62);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar60._4_4_ = uVar1;
                  auVar60._0_4_ = uVar1;
                  auVar60._8_4_ = uVar1;
                  auVar60._12_4_ = uVar1;
                  auVar202 = vmaxps_avx512vl(auVar202,auVar60);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar61._4_4_ = uVar1;
                  auVar61._0_4_ = uVar1;
                  auVar61._8_4_ = uVar1;
                  auVar61._12_4_ = uVar1;
                  auVar202 = vminps_avx512vl(auVar202,auVar61);
                  break;
                case 4:
                  auVar58._8_4_ = 0x80000000;
                  auVar58._0_8_ = 0x8000000080000000;
                  auVar58._12_4_ = 0x80000000;
                  auVar202 = vxorps_avx512vl(auVar202,auVar58);
                  auVar202 = vminps_avx(auVar202,auVar361);
                  auVar202 = vmaxps_avx(auVar202,auVar368);
                  auVar198 = vfmadd231ps_fma(auVar374,auVar202,auVar380);
                  auVar199 = vcvttps2dq_avx512vl(auVar198);
                  auVar199 = vcvtdq2ps_avx512vl(auVar199);
                  uVar143 = vcmpps_avx512vl(auVar198,auVar199,1);
                  auVar198 = vsubps_avx512vl(auVar199,auVar386);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar208._0_4_ = (uint)bVar37 * auVar198._0_4_ | (uint)!bVar37 * auVar199._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar208._4_4_ = (uint)bVar37 * auVar198._4_4_ | (uint)!bVar37 * auVar199._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar208._8_4_ = (uint)bVar37 * auVar198._8_4_ | (uint)!bVar37 * auVar199._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar208._12_4_ = (uint)bVar37 * auVar198._12_4_ | (uint)!bVar37 * auVar199._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar208);
                  auVar202 = vfmsub231ps_avx512vl(auVar202,auVar208,auVar392);
                  auVar59._8_4_ = 0x395e8083;
                  auVar59._0_8_ = 0x395e8083395e8083;
                  auVar59._12_4_ = 0x395e8083;
                  auVar198 = vfmsub231ps_avx512vl(auVar202,auVar208,auVar59);
                  auVar402._0_4_ = auVar198._0_4_ * auVar198._0_4_;
                  auVar402._4_4_ = auVar198._4_4_ * auVar198._4_4_;
                  auVar402._8_4_ = auVar198._8_4_ * auVar198._8_4_;
                  auVar402._12_4_ = auVar198._12_4_ * auVar198._12_4_;
                  auVar202 = vfmadd213ps_fma(auVar168,auVar198,auVar450);
                  auVar202 = vfmadd213ps_fma(auVar202,auVar198,auVar456);
                  auVar202 = vfmadd213ps_fma(auVar202,auVar198,auVar462);
                  auVar202 = vfmadd213ps_fma(auVar202,auVar198,auVar468);
                  auVar202 = vfmadd213ps_fma(auVar202,auVar198,auVar374);
                  auVar202 = vfmadd213ps_fma(auVar202,auVar402,auVar198);
                  auVar403._0_4_ = auVar202._0_4_ + 1.0;
                  auVar403._4_4_ = auVar202._4_4_ + 1.0;
                  auVar403._8_4_ = auVar202._8_4_ + 1.0;
                  auVar403._12_4_ = auVar202._12_4_ + 1.0;
                  auVar202 = vcvttps2dq_avx512vl(auVar208);
                  auVar202 = vpslld_avx(auVar202,0x17);
                  auVar202 = vpaddd_avx(auVar475,auVar202);
                  auVar198 = vfmadd213ps_fma(auVar202,auVar403,auVar386);
                  auVar202 = vrcpps_avx(auVar198);
                  auVar198 = vfmsub213ps_fma(auVar198,auVar202,auVar386);
                  auVar202 = vfnmadd132ps_fma(auVar198,auVar202,auVar202);
                  break;
                case 5:
                  auVar198 = vminps_avx(auVar202,auVar361);
                  auVar198 = vmaxps_avx(auVar198,auVar368);
                  auVar199 = vfmadd213ps_fma(auVar380,auVar198,auVar374);
                  auVar200 = vcvttps2dq_avx512vl(auVar199);
                  auVar200 = vcvtdq2ps_avx512vl(auVar200);
                  uVar143 = vcmpps_avx512vl(auVar199,auVar200,1);
                  auVar199 = vsubps_avx512vl(auVar200,auVar386);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar203._0_4_ = (uint)bVar37 * auVar199._0_4_ | (uint)!bVar37 * auVar200._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar203._4_4_ = (uint)bVar37 * auVar199._4_4_ | (uint)!bVar37 * auVar200._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar203._8_4_ = (uint)bVar37 * auVar199._8_4_ | (uint)!bVar37 * auVar200._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar203._12_4_ = (uint)bVar37 * auVar199._12_4_ | (uint)!bVar37 * auVar200._12_4_
                  ;
                  auVar198 = vfmsub231ps_avx512vl(auVar198,auVar203,auVar392);
                  auVar198 = vfnmsub231ps_avx512vl(auVar198,auVar203,auVar481);
                  auVar431._0_4_ = auVar198._0_4_ * auVar198._0_4_;
                  auVar431._4_4_ = auVar198._4_4_ * auVar198._4_4_;
                  auVar431._8_4_ = auVar198._8_4_ * auVar198._8_4_;
                  auVar431._12_4_ = auVar198._12_4_ * auVar198._12_4_;
                  auVar199 = vfmadd213ps_avx512vl(auVar168,auVar198,auVar450);
                  auVar199 = vfmadd213ps_avx512vl(auVar199,auVar198,auVar456);
                  auVar199 = vfmadd213ps_avx512vl(auVar199,auVar198,auVar462);
                  auVar199 = vfmadd213ps_avx512vl(auVar199,auVar198,auVar468);
                  auVar199 = vfmadd213ps_avx512vl(auVar199,auVar198,auVar374);
                  auVar198 = vfmadd213ps_avx512vl(auVar199,auVar431,auVar198);
                  auVar199 = vaddps_avx512vl(auVar198,auVar386);
                  auVar198 = vcvttps2dq_avx512vl(auVar203);
                  auVar198 = vpslld_avx(auVar198,0x17);
                  auVar198 = vpaddd_avx(auVar198,auVar475);
                  auVar198 = vfmadd213ps_fma(auVar198,auVar199,auVar386);
                  uVar143 = vcmpps_avx512vl(auVar198,auVar209,2);
                  auVar52._8_4_ = 0x800000;
                  auVar52._0_8_ = 0x80000000800000;
                  auVar52._12_4_ = 0x800000;
                  auVar198 = vmaxps_avx512vl(auVar198,auVar52);
                  auVar201 = vpsrld_avx(auVar198,0x17);
                  auVar199 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar53._8_4_ = 0x3f000000;
                  auVar53._0_8_ = 0x3f0000003f000000;
                  auVar53._12_4_ = 0x3f000000;
                  auVar198 = vpternlogd_avx512vl(auVar198,auVar199,auVar53,0xea);
                  auVar54._8_4_ = 0x3f3504f3;
                  auVar54._0_8_ = 0x3f3504f33f3504f3;
                  auVar54._12_4_ = 0x3f3504f3;
                  uVar157 = vcmpps_avx512vl(auVar198,auVar54,1);
                  auVar55._8_4_ = 0xbf800000;
                  auVar55._0_8_ = 0xbf800000bf800000;
                  auVar55._12_4_ = 0xbf800000;
                  auVar199 = vaddps_avx512vl(auVar198,auVar55);
                  auVar198 = vaddps_avx512vl(auVar199,auVar198);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar204._0_4_ = (uint)bVar37 * auVar198._0_4_ | (uint)!bVar37 * auVar199._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar204._4_4_ = (uint)bVar37 * auVar198._4_4_ | (uint)!bVar37 * auVar199._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar204._8_4_ = (uint)bVar37 * auVar198._8_4_ | (uint)!bVar37 * auVar199._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar204._12_4_ = (uint)bVar37 * auVar198._12_4_ | (uint)!bVar37 * auVar199._12_4_
                  ;
                  auVar199 = vmulps_avx512vl(auVar204,auVar204);
                  auVar56._8_4_ = 0xbdebd1b8;
                  auVar56._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar56._12_4_ = 0xbdebd1b8;
                  auVar198 = vfmadd213ps_avx512vl(auVar169,auVar204,auVar56);
                  auVar198 = vfmadd213ps_avx512vl(auVar198,auVar204,auVar170);
                  auVar198 = vfmadd213ps_avx512vl(auVar198,auVar204,auVar191);
                  auVar198 = vfmadd213ps_avx512vl(auVar198,auVar204,auVar192);
                  auVar198 = vfmadd213ps_avx512vl(auVar198,auVar204,auVar193);
                  auVar198 = vfmadd213ps_avx512vl(auVar198,auVar204,auVar194);
                  auVar198 = vfmadd213ps_avx512vl(auVar198,auVar204,auVar195);
                  auVar198 = vfmadd213ps_avx512vl(auVar198,auVar204,auVar196);
                  auVar200 = vmulps_avx512vl(auVar199,auVar204);
                  auVar200 = vmulps_avx512vl(auVar200,auVar198);
                  auVar57._8_4_ = 0xffffff82;
                  auVar57._0_8_ = 0xffffff82ffffff82;
                  auVar57._12_4_ = 0xffffff82;
                  auVar198 = vpaddd_avx512vl(auVar201,auVar57);
                  auVar198 = vcvtdq2ps_avx(auVar198);
                  auVar201 = vsubps_avx512vl(auVar198,auVar386);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar205._0_4_ = (uint)bVar37 * auVar201._0_4_ | (uint)!bVar37 * auVar198._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar205._4_4_ = (uint)bVar37 * auVar201._4_4_ | (uint)!bVar37 * auVar198._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar205._8_4_ = (uint)bVar37 * auVar201._8_4_ | (uint)!bVar37 * auVar198._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar205._12_4_ = (uint)bVar37 * auVar201._12_4_ | (uint)!bVar37 * auVar198._12_4_
                  ;
                  auVar198 = vfmadd231ps_avx512vl(auVar200,auVar205,auVar481);
                  auVar198 = vfmsub231ps_avx512vl(auVar198,auVar374,auVar199);
                  auVar198 = vsubps_avx512vl(auVar198,auVar204);
                  auVar198 = vfnmadd231ps_fma(auVar198,auVar392,auVar205);
                  auVar199 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar206._0_4_ =
                       (uint)bVar37 * auVar199._0_4_ |
                       (uint)!bVar37 * (int)(auVar198._0_4_ + auVar198._0_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar206._4_4_ =
                       (uint)bVar37 * auVar199._4_4_ |
                       (uint)!bVar37 * (int)(auVar198._4_4_ + auVar198._4_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar206._8_4_ =
                       (uint)bVar37 * auVar199._8_4_ |
                       (uint)!bVar37 * (int)(auVar198._8_4_ + auVar198._8_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar206._12_4_ =
                       (uint)bVar37 * auVar199._12_4_ |
                       (uint)!bVar37 * (int)(auVar198._12_4_ + auVar198._12_4_);
                  auVar198 = vminps_avx(auVar206,auVar361);
                  auVar198 = vmaxps_avx(auVar198,auVar368);
                  auVar199 = vfmadd213ps_fma(auVar380,auVar198,auVar374);
                  auVar200 = vcvttps2dq_avx512vl(auVar199);
                  auVar200 = vcvtdq2ps_avx512vl(auVar200);
                  uVar143 = vcmpps_avx512vl(auVar199,auVar200,1);
                  auVar199 = vsubps_avx512vl(auVar200,auVar386);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar207._0_4_ = (uint)bVar37 * auVar199._0_4_ | (uint)!bVar37 * auVar200._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar207._4_4_ = (uint)bVar37 * auVar199._4_4_ | (uint)!bVar37 * auVar200._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar207._8_4_ = (uint)bVar37 * auVar199._8_4_ | (uint)!bVar37 * auVar200._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar207._12_4_ = (uint)bVar37 * auVar199._12_4_ | (uint)!bVar37 * auVar200._12_4_
                  ;
                  auVar198 = vfmsub231ps_avx512vl(auVar198,auVar207,auVar392);
                  auVar198 = vfnmsub231ps_avx512vl(auVar198,auVar207,auVar481);
                  auVar432._0_4_ = auVar198._0_4_ * auVar198._0_4_;
                  auVar432._4_4_ = auVar198._4_4_ * auVar198._4_4_;
                  auVar432._8_4_ = auVar198._8_4_ * auVar198._8_4_;
                  auVar432._12_4_ = auVar198._12_4_ * auVar198._12_4_;
                  auVar199 = vfmadd213ps_avx512vl(auVar168,auVar198,auVar450);
                  auVar199 = vfmadd213ps_avx512vl(auVar199,auVar198,auVar456);
                  auVar199 = vfmadd213ps_avx512vl(auVar199,auVar198,auVar462);
                  auVar199 = vfmadd213ps_avx512vl(auVar199,auVar198,auVar468);
                  auVar199 = vfmadd213ps_avx512vl(auVar199,auVar198,auVar374);
                  auVar198 = vfmadd213ps_avx512vl(auVar199,auVar432,auVar198);
                  auVar199 = vaddps_avx512vl(auVar198,auVar386);
                  auVar198 = vcvttps2dq_avx512vl(auVar207);
                  auVar198 = vpslld_avx(auVar198,0x17);
                  auVar198 = vpaddd_avx(auVar198,auVar475);
                  auVar199 = vfmadd213ps_fma(auVar198,auVar199,auVar386);
                  auVar198 = vrcpps_avx(auVar199);
                  auVar200 = vaddps_avx512vl(auVar198,auVar198);
                  in_ZMM16 = ZEXT1664(auVar200);
                  auVar199 = vfmsub213ps_avx512vl(auVar199,auVar200,auVar197);
                  auVar198 = vfnmadd213ps_avx512vl(auVar199,auVar198,auVar200);
                  auVar202 = vfmsub231ps_fma(auVar202,auVar202,auVar198);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar404._4_4_ = uVar1;
                  auVar404._0_4_ = uVar1;
                  auVar404._8_4_ = uVar1;
                  auVar404._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar51._4_4_ = uVar1;
                  auVar51._0_4_ = uVar1;
                  auVar51._8_4_ = uVar1;
                  auVar51._12_4_ = uVar1;
                  auVar198 = vfmadd213ps_avx512vl(auVar404,auVar202,auVar51);
                  auVar198 = vmaxps_avx(auVar198,auVar209);
                  auVar198 = vminps_avx(auVar198,auVar386);
                  auVar347._0_4_ = auVar198._0_4_ * auVar202._0_4_;
                  auVar347._4_4_ = auVar198._4_4_ * auVar202._4_4_;
                  auVar347._8_4_ = auVar198._8_4_ * auVar202._8_4_;
                  auVar347._12_4_ = auVar198._12_4_ * auVar202._12_4_;
                  auVar202 = auVar347;
                }
                *(undefined1 (*) [16])ppp_Var150 = auVar202;
                ppp_Var150 = ppp_Var150 + 2;
                uVar161 = uVar161 + 1;
                iVar139 = iVar139 + 1;
              } while (uVar161 != local_118.w);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_118.c);
    }
    if (((iVar9 == 1) && (uVar145 == 8)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      iVar138 = *(int *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_1e0 = 0;
      auVar366._8_4_ = 0x42b0c0a5;
      auVar366._0_8_ = 0x42b0c0a542b0c0a5;
      auVar366._12_4_ = 0x42b0c0a5;
      auVar366._16_4_ = 0x42b0c0a5;
      auVar366._20_4_ = 0x42b0c0a5;
      auVar366._24_4_ = 0x42b0c0a5;
      auVar366._28_4_ = 0x42b0c0a5;
      auVar373._8_4_ = 0xc2b0c0a5;
      auVar373._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar373._12_4_ = 0xc2b0c0a5;
      auVar373._16_4_ = 0xc2b0c0a5;
      auVar373._20_4_ = 0xc2b0c0a5;
      auVar373._24_4_ = 0xc2b0c0a5;
      auVar373._28_4_ = 0xc2b0c0a5;
      auVar379._8_4_ = 0x3f000000;
      auVar379._0_8_ = 0x3f0000003f000000;
      auVar379._12_4_ = 0x3f000000;
      auVar379._16_4_ = 0x3f000000;
      auVar379._20_4_ = 0x3f000000;
      auVar379._24_4_ = 0x3f000000;
      auVar379._28_4_ = 0x3f000000;
      auVar385._8_4_ = 0x3fb8aa3b;
      auVar385._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar385._12_4_ = 0x3fb8aa3b;
      auVar385._16_4_ = 0x3fb8aa3b;
      auVar385._20_4_ = 0x3fb8aa3b;
      auVar385._24_4_ = 0x3fb8aa3b;
      auVar385._28_4_ = 0x3fb8aa3b;
      auVar391._8_4_ = 0x3f800000;
      auVar391._0_8_ = 0x3f8000003f800000;
      auVar391._12_4_ = 0x3f800000;
      auVar391._16_4_ = 0x3f800000;
      auVar391._20_4_ = 0x3f800000;
      auVar391._24_4_ = 0x3f800000;
      auVar391._28_4_ = 0x3f800000;
      auVar397._8_4_ = 0x3f318000;
      auVar397._0_8_ = 0x3f3180003f318000;
      auVar397._12_4_ = 0x3f318000;
      auVar397._16_4_ = 0x3f318000;
      auVar397._20_4_ = 0x3f318000;
      auVar397._24_4_ = 0x3f318000;
      auVar397._28_4_ = 0x3f318000;
      auVar222 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar455._8_4_ = 0x3ab743ce;
      auVar455._0_8_ = 0x3ab743ce3ab743ce;
      auVar455._12_4_ = 0x3ab743ce;
      auVar455._16_4_ = 0x3ab743ce;
      auVar455._20_4_ = 0x3ab743ce;
      auVar455._24_4_ = 0x3ab743ce;
      auVar455._28_4_ = 0x3ab743ce;
      auVar461._8_4_ = 0x3c088908;
      auVar461._0_8_ = 0x3c0889083c088908;
      auVar461._12_4_ = 0x3c088908;
      auVar461._16_4_ = 0x3c088908;
      auVar461._20_4_ = 0x3c088908;
      auVar461._24_4_ = 0x3c088908;
      auVar461._28_4_ = 0x3c088908;
      auVar467._8_4_ = 0x3d2aa9c1;
      auVar467._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar467._12_4_ = 0x3d2aa9c1;
      auVar467._16_4_ = 0x3d2aa9c1;
      auVar467._20_4_ = 0x3d2aa9c1;
      auVar467._24_4_ = 0x3d2aa9c1;
      auVar467._28_4_ = 0x3d2aa9c1;
      auVar473._8_4_ = 0x3e2aaaaa;
      auVar473._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar473._12_4_ = 0x3e2aaaaa;
      auVar473._16_4_ = 0x3e2aaaaa;
      auVar473._20_4_ = 0x3e2aaaaa;
      auVar473._24_4_ = 0x3e2aaaaa;
      auVar473._28_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT3264(auVar473);
      auVar480._8_4_ = 0x3f800000;
      auVar480._0_8_ = 0x3f8000003f800000;
      auVar480._12_4_ = 0x3f800000;
      auVar480._16_4_ = 0x3f800000;
      auVar480._20_4_ = 0x3f800000;
      auVar480._24_4_ = 0x3f800000;
      auVar480._28_4_ = 0x3f800000;
      auVar486._8_4_ = 0xb95e8083;
      auVar486._0_8_ = 0xb95e8083b95e8083;
      auVar486._12_4_ = 0xb95e8083;
      auVar486._16_4_ = 0xb95e8083;
      auVar486._20_4_ = 0xb95e8083;
      auVar486._24_4_ = 0xb95e8083;
      auVar486._28_4_ = 0xb95e8083;
      auVar223 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      in_ZMM20 = ZEXT3264(auVar223);
      auVar244 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT3264(auVar244);
      auVar245 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar246 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar247 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar248 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar249 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar250 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar251 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar252 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar253 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar254 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      do {
        if (0 < local_118.h) {
          uVar13 = bottom_blob->w;
          unaff_R13 = (ulong)uVar13;
          iVar139 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar160 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x20;
          uVar153 = 0;
          do {
            if (0 < local_118.w) {
              uVar161 = 0;
              iVar134 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar274 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar274 = ZEXT3264(*(undefined1 (*) [32])(lVar155 + local_1e0 * 0x20));
                }
                if (0 < (int)uVar160) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar135 = (((int)uVar157 - uVar11) + 1) * iVar10 + uVar153;
                        if (((-1 < iVar135) && (iVar136 = iVar135 / iVar158, iVar135 % iVar158 == 0)
                            ) && ((iVar136 < iVar139 && (0 < (int)uVar140)))) {
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar135 = iVar134;
                          do {
                            if (((-1 < iVar135) &&
                                (iVar137 = iVar135 / iVar156, iVar135 % iVar156 == 0)) &&
                               (iVar137 < (int)uVar13)) {
                              uVar12 = *(undefined4 *)
                                        ((long)bottom_blob->data +
                                        (long)iVar137 * 4 +
                                        (long)iVar136 * (long)bottom_blob->w * bottom_blob->elemsize
                                        + bottom_blob->cstep * bottom_blob->elemsize * uVar143);
                              auVar423._4_4_ = uVar12;
                              auVar423._0_4_ = uVar12;
                              auVar423._8_4_ = uVar12;
                              auVar423._12_4_ = uVar12;
                              auVar423._16_4_ = uVar12;
                              auVar423._20_4_ = uVar12;
                              auVar423._24_4_ = uVar12;
                              auVar423._28_4_ = uVar12;
                              auVar168 = vfmadd231ps_fma(auVar274._0_32_,auVar423,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar151 +
                                                          (uVar154 & 0xffffffff) * 4));
                              auVar274 = ZEXT1664(auVar168);
                            }
                            uVar154 = uVar154 + 8;
                            iVar135 = iVar135 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 8;
                      } while (uVar157 != uVar11);
                    }
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 8) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                auVar255 = auVar274._0_32_;
                if (iVar138 - 1U < 6) {
                  auVar224 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar358._28_36_ = auVar274._28_36_;
                  switch(iVar138) {
                  case 1:
                    auVar255 = vmaxps_avx(auVar255,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar225 = vmaxps_avx(auVar255,auVar224);
                    auVar255 = vminps_avx(auVar255,auVar224);
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar121._4_4_ = uVar12;
                    auVar121._0_4_ = uVar12;
                    auVar121._8_4_ = uVar12;
                    auVar121._12_4_ = uVar12;
                    auVar121._16_4_ = uVar12;
                    auVar121._20_4_ = uVar12;
                    auVar121._24_4_ = uVar12;
                    auVar121._28_4_ = uVar12;
                    auVar255 = vfmadd132ps_avx512vl(auVar255,auVar225,auVar121);
                    break;
                  case 3:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar119._4_4_ = uVar12;
                    auVar119._0_4_ = uVar12;
                    auVar119._8_4_ = uVar12;
                    auVar119._12_4_ = uVar12;
                    auVar119._16_4_ = uVar12;
                    auVar119._20_4_ = uVar12;
                    auVar119._24_4_ = uVar12;
                    auVar119._28_4_ = uVar12;
                    auVar255 = vmaxps_avx512vl(auVar255,auVar119);
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                    auVar120._4_4_ = uVar12;
                    auVar120._0_4_ = uVar12;
                    auVar120._8_4_ = uVar12;
                    auVar120._12_4_ = uVar12;
                    auVar120._16_4_ = uVar12;
                    auVar120._20_4_ = uVar12;
                    auVar120._24_4_ = uVar12;
                    auVar120._28_4_ = uVar12;
                    auVar255 = vminps_avx512vl(auVar255,auVar120);
                    break;
                  case 4:
                    auVar117._8_4_ = 0x80000000;
                    auVar117._0_8_ = 0x8000000080000000;
                    auVar117._12_4_ = 0x80000000;
                    auVar117._16_4_ = 0x80000000;
                    auVar117._20_4_ = 0x80000000;
                    auVar117._24_4_ = 0x80000000;
                    auVar117._28_4_ = 0x80000000;
                    auVar255 = vxorps_avx512vl(auVar255,auVar117);
                    auVar255 = vminps_avx(auVar255,auVar366);
                    auVar255 = vmaxps_avx(auVar255,auVar373);
                    auVar168 = vfmadd231ps_fma(auVar379,auVar255,auVar385);
                    auVar224 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar224,1);
                    auVar225 = vsubps_avx512vl(auVar224,auVar391);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar273._0_4_ = (uint)bVar37 * auVar225._0_4_ | (uint)!bVar37 * auVar224._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar273._4_4_ = (uint)bVar37 * auVar225._4_4_ | (uint)!bVar37 * auVar224._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar273._8_4_ = (uint)bVar37 * auVar225._8_4_ | (uint)!bVar37 * auVar224._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar273._12_4_ =
                         (uint)bVar37 * auVar225._12_4_ | (uint)!bVar37 * auVar224._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar273._16_4_ =
                         (uint)bVar37 * auVar225._16_4_ | (uint)!bVar37 * auVar224._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar273._20_4_ =
                         (uint)bVar37 * auVar225._20_4_ | (uint)!bVar37 * auVar224._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar273._24_4_ =
                         (uint)bVar37 * auVar225._24_4_ | (uint)!bVar37 * auVar224._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar273._28_4_ =
                         (uint)bVar37 * auVar225._28_4_ | (uint)!bVar37 * auVar224._28_4_;
                    in_ZMM16 = ZEXT3264(auVar273);
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar273,auVar397);
                    auVar118._8_4_ = 0x395e8083;
                    auVar118._0_8_ = 0x395e8083395e8083;
                    auVar118._12_4_ = 0x395e8083;
                    auVar118._16_4_ = 0x395e8083;
                    auVar118._20_4_ = 0x395e8083;
                    auVar118._24_4_ = 0x395e8083;
                    auVar118._28_4_ = 0x395e8083;
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar273,auVar118);
                    auVar424._0_4_ = auVar255._0_4_ * auVar255._0_4_;
                    auVar424._4_4_ = auVar255._4_4_ * auVar255._4_4_;
                    auVar424._8_4_ = auVar255._8_4_ * auVar255._8_4_;
                    auVar424._12_4_ = auVar255._12_4_ * auVar255._12_4_;
                    auVar424._16_4_ = auVar255._16_4_ * auVar255._16_4_;
                    auVar424._20_4_ = auVar255._20_4_ * auVar255._20_4_;
                    auVar424._24_4_ = auVar255._24_4_ * auVar255._24_4_;
                    auVar424._28_4_ = 0;
                    auVar168 = vfmadd213ps_fma(auVar222,auVar255,auVar455);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar255,auVar461);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar255,auVar467);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar255,auVar473);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar255,auVar379);
                    auVar168 = vfmadd213ps_fma(ZEXT1632(auVar168),auVar424,auVar255);
                    auVar425._0_4_ = auVar168._0_4_ + 1.0;
                    auVar425._4_4_ = auVar168._4_4_ + 1.0;
                    auVar425._8_4_ = auVar168._8_4_ + 1.0;
                    auVar425._12_4_ = auVar168._12_4_ + 1.0;
                    auVar425._16_4_ = 0x3f800000;
                    auVar425._20_4_ = 0x3f800000;
                    auVar425._24_4_ = 0x3f800000;
                    auVar425._28_4_ = 0x3f800000;
                    auVar255 = vcvttps2dq_avx512vl(auVar273);
                    auVar255 = vpslld_avx2(auVar255,0x17);
                    auVar255 = vpaddd_avx2(auVar480,auVar255);
                    auVar168 = vfmadd213ps_fma(auVar255,auVar425,auVar391);
                    auVar255 = vrcpps_avx(ZEXT1632(auVar168));
                    auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar255,auVar391);
                    auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar255,auVar255);
                    auVar255 = ZEXT1632(auVar168);
                    break;
                  case 5:
                    auVar255 = vminps_avx(auVar255,auVar366);
                    auVar255 = vmaxps_avx(auVar255,auVar373);
                    auVar168 = vfmadd213ps_fma(auVar385,auVar255,auVar379);
                    auVar225 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar225,1);
                    auVar226 = vsubps_avx512vl(auVar225,auVar391);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar268._0_4_ = (uint)bVar37 * auVar226._0_4_ | (uint)!bVar37 * auVar225._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar268._4_4_ = (uint)bVar37 * auVar226._4_4_ | (uint)!bVar37 * auVar225._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar268._8_4_ = (uint)bVar37 * auVar226._8_4_ | (uint)!bVar37 * auVar225._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar268._12_4_ =
                         (uint)bVar37 * auVar226._12_4_ | (uint)!bVar37 * auVar225._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar268._16_4_ =
                         (uint)bVar37 * auVar226._16_4_ | (uint)!bVar37 * auVar225._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar268._20_4_ =
                         (uint)bVar37 * auVar226._20_4_ | (uint)!bVar37 * auVar225._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar268._24_4_ =
                         (uint)bVar37 * auVar226._24_4_ | (uint)!bVar37 * auVar225._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar268._28_4_ =
                         (uint)bVar37 * auVar226._28_4_ | (uint)!bVar37 * auVar225._28_4_;
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar268,auVar397);
                    auVar255 = vfnmsub231ps_avx512vl(auVar255,auVar268,auVar486);
                    auVar448._0_4_ = auVar255._0_4_ * auVar255._0_4_;
                    auVar448._4_4_ = auVar255._4_4_ * auVar255._4_4_;
                    auVar448._8_4_ = auVar255._8_4_ * auVar255._8_4_;
                    auVar448._12_4_ = auVar255._12_4_ * auVar255._12_4_;
                    auVar448._16_4_ = auVar255._16_4_ * auVar255._16_4_;
                    auVar448._20_4_ = auVar255._20_4_ * auVar255._20_4_;
                    auVar448._24_4_ = auVar255._24_4_ * auVar255._24_4_;
                    auVar448._28_4_ = 0;
                    auVar225 = vfmadd213ps_avx512vl(auVar222,auVar255,auVar455);
                    auVar225 = vfmadd213ps_avx512vl(auVar225,auVar255,auVar461);
                    auVar225 = vfmadd213ps_avx512vl(auVar225,auVar255,auVar467);
                    auVar225 = vfmadd213ps_avx512vl(auVar225,auVar255,auVar473);
                    auVar225 = vfmadd213ps_avx512vl(auVar225,auVar255,auVar379);
                    auVar255 = vfmadd213ps_avx512vl(auVar225,auVar448,auVar255);
                    auVar225 = vaddps_avx512vl(auVar255,auVar391);
                    auVar255 = vcvttps2dq_avx512vl(auVar268);
                    auVar255 = vpslld_avx2(auVar255,0x17);
                    auVar255 = vpaddd_avx2(auVar255,auVar480);
                    auVar168 = vfmadd213ps_fma(auVar255,auVar225,auVar391);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar224,2);
                    auVar114._8_4_ = 0x800000;
                    auVar114._0_8_ = 0x80000000800000;
                    auVar114._12_4_ = 0x800000;
                    auVar114._16_4_ = 0x800000;
                    auVar114._20_4_ = 0x800000;
                    auVar114._24_4_ = 0x800000;
                    auVar114._28_4_ = 0x800000;
                    auVar255 = vmaxps_avx512vl(ZEXT1632(auVar168),auVar114);
                    auVar226 = vpsrld_avx2(auVar255,0x17);
                    auVar224 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar115._8_4_ = 0x3f000000;
                    auVar115._0_8_ = 0x3f0000003f000000;
                    auVar115._12_4_ = 0x3f000000;
                    auVar115._16_4_ = 0x3f000000;
                    auVar115._20_4_ = 0x3f000000;
                    auVar115._24_4_ = 0x3f000000;
                    auVar115._28_4_ = 0x3f000000;
                    auVar255 = vpternlogd_avx512vl(auVar255,auVar224,auVar115,0xea);
                    uVar157 = vcmpps_avx512vl(auVar255,auVar223,1);
                    auVar224 = vaddps_avx512vl(auVar255,auVar244);
                    auVar255 = vaddps_avx512vl(auVar224,auVar255);
                    bVar37 = (bool)((byte)uVar157 & 1);
                    auVar269._0_4_ = (uint)bVar37 * auVar255._0_4_ | (uint)!bVar37 * auVar224._0_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                    auVar269._4_4_ = (uint)bVar37 * auVar255._4_4_ | (uint)!bVar37 * auVar224._4_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                    auVar269._8_4_ = (uint)bVar37 * auVar255._8_4_ | (uint)!bVar37 * auVar224._8_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                    auVar269._12_4_ =
                         (uint)bVar37 * auVar255._12_4_ | (uint)!bVar37 * auVar224._12_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                    auVar269._16_4_ =
                         (uint)bVar37 * auVar255._16_4_ | (uint)!bVar37 * auVar224._16_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                    auVar269._20_4_ =
                         (uint)bVar37 * auVar255._20_4_ | (uint)!bVar37 * auVar224._20_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                    auVar269._24_4_ =
                         (uint)bVar37 * auVar255._24_4_ | (uint)!bVar37 * auVar224._24_4_;
                    bVar37 = SUB81(uVar157 >> 7,0);
                    auVar269._28_4_ =
                         (uint)bVar37 * auVar255._28_4_ | (uint)!bVar37 * auVar224._28_4_;
                    auVar224 = vmulps_avx512vl(auVar269,auVar269);
                    auVar255 = vfmadd213ps_avx512vl(auVar245,auVar269,auVar246);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar269,auVar247);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar269,auVar248);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar269,auVar249);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar269,auVar250);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar269,auVar251);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar269,auVar252);
                    auVar255 = vfmadd213ps_avx512vl(auVar255,auVar269,auVar253);
                    auVar225 = vmulps_avx512vl(auVar224,auVar269);
                    auVar225 = vmulps_avx512vl(auVar225,auVar255);
                    auVar116._8_4_ = 0xffffff82;
                    auVar116._0_8_ = 0xffffff82ffffff82;
                    auVar116._12_4_ = 0xffffff82;
                    auVar116._16_4_ = 0xffffff82;
                    auVar116._20_4_ = 0xffffff82;
                    auVar116._24_4_ = 0xffffff82;
                    auVar116._28_4_ = 0xffffff82;
                    auVar255 = vpaddd_avx512vl(auVar226,auVar116);
                    auVar255 = vcvtdq2ps_avx(auVar255);
                    auVar226 = vsubps_avx512vl(auVar255,auVar391);
                    bVar37 = (bool)((byte)uVar157 & 1);
                    auVar270._0_4_ = (uint)bVar37 * auVar226._0_4_ | (uint)!bVar37 * auVar255._0_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                    auVar270._4_4_ = (uint)bVar37 * auVar226._4_4_ | (uint)!bVar37 * auVar255._4_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                    auVar270._8_4_ = (uint)bVar37 * auVar226._8_4_ | (uint)!bVar37 * auVar255._8_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                    auVar270._12_4_ =
                         (uint)bVar37 * auVar226._12_4_ | (uint)!bVar37 * auVar255._12_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 4) & 1);
                    auVar270._16_4_ =
                         (uint)bVar37 * auVar226._16_4_ | (uint)!bVar37 * auVar255._16_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 5) & 1);
                    auVar270._20_4_ =
                         (uint)bVar37 * auVar226._20_4_ | (uint)!bVar37 * auVar255._20_4_;
                    bVar37 = (bool)((byte)(uVar157 >> 6) & 1);
                    auVar270._24_4_ =
                         (uint)bVar37 * auVar226._24_4_ | (uint)!bVar37 * auVar255._24_4_;
                    bVar37 = SUB81(uVar157 >> 7,0);
                    auVar270._28_4_ =
                         (uint)bVar37 * auVar226._28_4_ | (uint)!bVar37 * auVar255._28_4_;
                    auVar255 = vfmadd231ps_avx512vl(auVar225,auVar270,auVar486);
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar379,auVar224);
                    auVar255 = vsubps_avx512vl(auVar255,auVar269);
                    auVar168 = vfmsub231ps_fma(auVar255,auVar397,auVar270);
                    auVar255 = vmulps_avx512vl(ZEXT1632(auVar168),auVar254);
                    auVar224 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar271._0_4_ = (uint)bVar37 * auVar224._0_4_ | (uint)!bVar37 * auVar255._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar271._4_4_ = (uint)bVar37 * auVar224._4_4_ | (uint)!bVar37 * auVar255._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar271._8_4_ = (uint)bVar37 * auVar224._8_4_ | (uint)!bVar37 * auVar255._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar271._12_4_ =
                         (uint)bVar37 * auVar224._12_4_ | (uint)!bVar37 * auVar255._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar271._16_4_ =
                         (uint)bVar37 * auVar224._16_4_ | (uint)!bVar37 * auVar255._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar271._20_4_ =
                         (uint)bVar37 * auVar224._20_4_ | (uint)!bVar37 * auVar255._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar271._24_4_ =
                         (uint)bVar37 * auVar224._24_4_ | (uint)!bVar37 * auVar255._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar271._28_4_ =
                         (uint)bVar37 * auVar224._28_4_ | (uint)!bVar37 * auVar255._28_4_;
                    auVar255 = vminps_avx(auVar271,auVar366);
                    auVar255 = vmaxps_avx(auVar255,auVar373);
                    auVar168 = vfmadd213ps_fma(auVar385,auVar255,auVar379);
                    auVar224 = vrndscaleps_avx512vl(ZEXT1632(auVar168),1);
                    uVar143 = vcmpps_avx512vl(ZEXT1632(auVar168),auVar224,1);
                    auVar225 = vsubps_avx512vl(auVar224,auVar391);
                    bVar37 = (bool)((byte)uVar143 & 1);
                    auVar272._0_4_ = (uint)bVar37 * auVar225._0_4_ | (uint)!bVar37 * auVar224._0_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                    auVar272._4_4_ = (uint)bVar37 * auVar225._4_4_ | (uint)!bVar37 * auVar224._4_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                    auVar272._8_4_ = (uint)bVar37 * auVar225._8_4_ | (uint)!bVar37 * auVar224._8_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                    auVar272._12_4_ =
                         (uint)bVar37 * auVar225._12_4_ | (uint)!bVar37 * auVar224._12_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 4) & 1);
                    auVar272._16_4_ =
                         (uint)bVar37 * auVar225._16_4_ | (uint)!bVar37 * auVar224._16_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 5) & 1);
                    auVar272._20_4_ =
                         (uint)bVar37 * auVar225._20_4_ | (uint)!bVar37 * auVar224._20_4_;
                    bVar37 = (bool)((byte)(uVar143 >> 6) & 1);
                    auVar272._24_4_ =
                         (uint)bVar37 * auVar225._24_4_ | (uint)!bVar37 * auVar224._24_4_;
                    bVar37 = SUB81(uVar143 >> 7,0);
                    auVar272._28_4_ =
                         (uint)bVar37 * auVar225._28_4_ | (uint)!bVar37 * auVar224._28_4_;
                    in_ZMM16 = ZEXT3264(auVar272);
                    auVar255 = vfmsub231ps_avx512vl(auVar255,auVar272,auVar397);
                    auVar255 = vfnmsub231ps_avx512vl(auVar255,auVar272,auVar486);
                    auVar449._0_4_ = auVar255._0_4_ * auVar255._0_4_;
                    auVar449._4_4_ = auVar255._4_4_ * auVar255._4_4_;
                    auVar449._8_4_ = auVar255._8_4_ * auVar255._8_4_;
                    auVar449._12_4_ = auVar255._12_4_ * auVar255._12_4_;
                    auVar449._16_4_ = auVar255._16_4_ * auVar255._16_4_;
                    auVar449._20_4_ = auVar255._20_4_ * auVar255._20_4_;
                    auVar449._24_4_ = auVar255._24_4_ * auVar255._24_4_;
                    auVar449._28_4_ = 0;
                    auVar224 = vfmadd213ps_avx512vl(auVar222,auVar255,auVar455);
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar255,auVar461);
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar255,auVar467);
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar255,auVar473);
                    auVar224 = vfmadd213ps_avx512vl(auVar224,auVar255,auVar379);
                    auVar255 = vfmadd213ps_avx512vl(auVar224,auVar449,auVar255);
                    auVar224 = vaddps_avx512vl(auVar255,auVar391);
                    auVar255 = vcvttps2dq_avx512vl(auVar272);
                    auVar255 = vpslld_avx2(auVar255,0x17);
                    auVar255 = vpaddd_avx2(auVar255,auVar480);
                    auVar168 = vfmadd213ps_fma(auVar255,auVar224,auVar391);
                    auVar255 = vrcpps_avx(ZEXT1632(auVar168));
                    auVar168 = vfmsub213ps_fma(ZEXT1632(auVar168),auVar255,auVar391);
                    auVar168 = vfnmadd132ps_fma(ZEXT1632(auVar168),auVar255,auVar255);
                    auVar255 = vfnmadd213ps_avx512vl(ZEXT1632(auVar168),auVar254,auVar244);
                    auVar358._0_4_ = auVar255._0_4_ * auVar274._0_4_;
                    auVar358._4_4_ = auVar255._4_4_ * auVar274._4_4_;
                    auVar358._8_4_ = auVar255._8_4_ * auVar274._8_4_;
                    auVar358._12_4_ = auVar255._12_4_ * auVar274._12_4_;
                    auVar358._16_4_ = auVar255._16_4_ * auVar274._16_4_;
                    auVar358._20_4_ = auVar255._20_4_ * auVar274._20_4_;
                    auVar358._24_4_ = auVar255._24_4_ * auVar274._24_4_;
                    auVar255 = auVar358._0_32_;
                    break;
                  case 6:
                    uVar12 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                    auVar426._4_4_ = uVar12;
                    auVar426._0_4_ = uVar12;
                    auVar426._8_4_ = uVar12;
                    auVar426._12_4_ = uVar12;
                    auVar426._16_4_ = uVar12;
                    auVar426._20_4_ = uVar12;
                    auVar426._24_4_ = uVar12;
                    auVar426._28_4_ = uVar12;
                    uVar12 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                    auVar113._4_4_ = uVar12;
                    auVar113._0_4_ = uVar12;
                    auVar113._8_4_ = uVar12;
                    auVar113._12_4_ = uVar12;
                    auVar113._16_4_ = uVar12;
                    auVar113._20_4_ = uVar12;
                    auVar113._24_4_ = uVar12;
                    auVar113._28_4_ = uVar12;
                    auVar255 = vfmadd213ps_avx512vl(auVar426,auVar255,auVar113);
                    auVar255 = vmaxps_avx(auVar255,auVar224);
                    auVar255 = vminps_avx(auVar255,auVar391);
                    auVar359._0_4_ = auVar255._0_4_ * auVar274._0_4_;
                    auVar359._4_4_ = auVar255._4_4_ * auVar274._4_4_;
                    auVar359._8_4_ = auVar255._8_4_ * auVar274._8_4_;
                    auVar359._12_4_ = auVar255._12_4_ * auVar274._12_4_;
                    auVar359._16_4_ = auVar255._16_4_ * auVar274._16_4_;
                    auVar359._20_4_ = auVar255._20_4_ * auVar274._20_4_;
                    auVar359._24_4_ = auVar255._24_4_ * auVar274._24_4_;
                    auVar359._28_36_ = auVar358._28_36_;
                    auVar255 = auVar359._0_32_;
                  }
                }
                *(undefined1 (*) [32])ppp_Var150 = auVar255;
                ppp_Var150 = ppp_Var150 + 4;
                uVar161 = uVar161 + 1;
                iVar134 = iVar134 + 1;
              } while (uVar161 != local_118.w);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_118.c);
    }
    if (((iVar9 == 8) && (uVar145 == 1)) && (local_98 = (long)local_118.c, 0 < local_98)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xe4 + (long)p_Var141);
      pvVar151 = (void *)(ulong)uVar140;
      iVar156 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_a0 = (Allocator *)local_118.data;
      local_a8 = (Allocator *)
                 (CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize) * local_118.cstep);
      uVar160 = bottom_blob->w;
      unaff_R13 = (ulong)uVar160;
      iVar138 = bottom_blob->h;
      uVar153 = bottom_blob->c;
      local_1e0 = 0;
      do {
        if (0 < iVar8) {
          local_1b8 = (_func_int ***)((long)&local_a0->_vptr_Allocator + (long)local_a8 * local_1e0)
          ;
          local_88._0_8_ =
               (void *)((this->weight_data_tm).cstep * local_1e0 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
          uVar161 = 0;
          do {
            if (0 < iVar7) {
              iVar134 = bottom_blob->w;
              pvVar152 = bottom_blob->data;
              sVar16 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pfVar18 = *(float **)(&this->field_0x118 + (long)p_Var141);
              uVar146 = 0;
              iVar139 = (1 - uVar11) * iVar147;
              do {
                if (lVar155 == 0) {
                  fVar346 = 0.0;
                }
                else {
                  fVar346 = *(float *)(lVar155 + local_1e0 * 4);
                }
                if ((int)uVar153 < 1) {
                  auVar222 = SUB6432(ZEXT864(0),0);
                }
                else {
                  auVar274 = ZEXT864(0);
                  uVar143 = 0;
                  lVar144 = local_88._0_8_;
                  do {
                    if (0 < (int)uVar13) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar135 = (((int)uVar157 - uVar13) + 1) * iVar10 + uVar161;
                        if (((-1 < iVar135) && (iVar136 = iVar135 / iVar156, iVar135 % iVar156 == 0)
                            ) && ((0 < (int)uVar11 && (iVar136 < iVar138)))) {
                          uVar154 = (ulong)uVar11;
                          uVar164 = uVar162;
                          iVar135 = iVar139;
                          do {
                            if (((-1 < iVar135) && (iVar135 % (int)uVar140 == 0)) &&
                               (iVar135 / (int)uVar140 < (int)uVar160)) {
                              auVar168 = vfmadd231ps_fma(auVar274._0_32_,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar152 +
                                                          (long)(iVar135 / (int)uVar140 << 3) * 4 +
                                                          (long)iVar136 * (long)iVar134 * sVar16 +
                                                          sVar17 * sVar16 * uVar143),
                                                         *(undefined1 (*) [32])
                                                          (lVar144 + (uVar164 & 0xffffffff) * 4));
                              auVar274 = ZEXT1664(auVar168);
                            }
                            uVar164 = uVar164 + 8;
                            iVar135 = iVar135 + iVar147;
                            uVar154 = uVar154 - 1;
                          } while (uVar154 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar11 * 8;
                      } while (uVar157 != uVar13);
                    }
                    auVar222 = auVar274._0_32_;
                    lVar144 = lVar144 + (long)(int)(uVar11 * uVar13 * 8) * 4;
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar153);
                }
                auVar348._0_4_ = auVar222._16_4_ + auVar222._0_4_;
                auVar348._4_4_ = auVar222._20_4_ + auVar222._4_4_;
                auVar348._8_4_ = auVar222._24_4_ + auVar222._8_4_;
                auVar348._12_4_ = auVar222._28_4_ + auVar222._12_4_;
                auVar168 = vshufpd_avx(auVar348,auVar348,1);
                auVar349._0_4_ = auVar168._0_4_ + auVar348._0_4_;
                auVar349._4_4_ = auVar168._4_4_ + auVar348._4_4_;
                auVar349._8_4_ = auVar168._8_4_ + auVar348._8_4_;
                auVar349._12_4_ = auVar168._12_4_ + auVar348._12_4_;
                auVar168 = vmovshdup_avx(auVar349);
                fVar346 = auVar168._0_4_ + fVar346 + auVar349._0_4_;
                auVar168 = ZEXT416((uint)fVar346);
                fVar360 = fVar346;
                if (iVar158 - 1U < 6) {
                  switch(iVar158) {
                  case 1:
                    auVar168 = vmaxss_avx(ZEXT416((uint)fVar346),ZEXT416(0));
                    fVar360 = auVar168._0_4_;
                    break;
                  case 2:
                    uVar148 = vcmpss_avx512f(ZEXT416((uint)fVar346),ZEXT416(0),0xe);
                    bVar37 = (bool)((byte)uVar148 & 1);
                    fVar360 = (float)((uint)bVar37 * 0x3f800000 + (uint)!bVar37 * (int)*pfVar18) *
                              fVar346;
                    break;
                  case 3:
                    auVar168 = vmaxss_avx(auVar168,ZEXT416((uint)*pfVar18));
                    fVar360 = auVar168._0_4_;
                    if (pfVar18[1] < auVar168._0_4_) {
                      fVar360 = pfVar18[1];
                    }
                    break;
                  case 4:
                    auVar168 = vminss_avx(auVar168,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar64._8_4_ = 0x80000000;
                    auVar64._0_8_ = 0x8000000080000000;
                    auVar64._12_4_ = 0x80000000;
                    auVar169 = vxorps_avx512vl(auVar168,auVar64);
                    uVar148 = vcmpss_avx512f(auVar168,ZEXT416(0xc2b0c0a5),1);
                    bVar37 = (bool)((byte)uVar148 & 1);
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar346 = expf((float)((uint)bVar37 * 0x42b0c0a5 +
                                          (uint)!bVar37 * auVar169._0_4_));
                    fVar360 = 1.0 / (fVar346 + 1.0);
                    break;
                  case 5:
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar360 = expf(fVar346);
                    fVar360 = logf(fVar360 + 1.0);
                    fVar360 = tanhf(fVar360);
                    fVar360 = fVar360 * fVar346;
                    break;
                  case 6:
                    fVar2 = *pfVar18;
                    auVar63._8_4_ = 0x80000000;
                    auVar63._0_8_ = 0x8000000080000000;
                    auVar63._12_4_ = 0x80000000;
                    auVar169 = vxorps_avx512vl(ZEXT416((uint)pfVar18[1]),auVar63);
                    fVar367 = auVar169._0_4_ / fVar2;
                    fVar360 = 0.0;
                    if ((fVar367 <= fVar346) &&
                       (fVar360 = fVar346, fVar346 <= fVar367 + 1.0 / fVar2)) {
                      auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar168,
                                                 ZEXT416((uint)pfVar18[1]));
                      fVar360 = auVar168._0_4_ * fVar346;
                    }
                  }
                }
                *(float *)local_1b8 = fVar360;
                local_1b8 = (_func_int ***)((long)local_1b8 + 4);
                uVar146 = uVar146 + 1;
                iVar139 = iVar139 + 1;
              } while (uVar146 != iVar7);
            }
            uVar161 = uVar161 + 1;
          } while (uVar161 != iVar8);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_98);
    }
    iVar8 = local_118.h;
    iVar7 = local_118.w;
    if (((iVar9 == 4) && (uVar145 == 4)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_1e0 = 0;
      auVar199 = ZEXT816(0) << 0x40;
      auVar362._8_4_ = 0x42b0c0a5;
      auVar362._0_8_ = 0x42b0c0a542b0c0a5;
      auVar362._12_4_ = 0x42b0c0a5;
      auVar369._8_4_ = 0xc2b0c0a5;
      auVar369._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar369._12_4_ = 0xc2b0c0a5;
      auVar375._8_4_ = 0x3f000000;
      auVar375._0_8_ = 0x3f0000003f000000;
      auVar375._12_4_ = 0x3f000000;
      auVar381._8_4_ = 0x3fb8aa3b;
      auVar381._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar381._12_4_ = 0x3fb8aa3b;
      auVar387._8_4_ = 0x3f800000;
      auVar387._0_8_ = 0x3f8000003f800000;
      auVar387._12_4_ = 0x3f800000;
      auVar393._8_4_ = 0x3f318000;
      auVar393._0_8_ = 0x3f3180003f318000;
      auVar393._12_4_ = 0x3f318000;
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar451._8_4_ = 0x3ab743ce;
      auVar451._0_8_ = 0x3ab743ce3ab743ce;
      auVar451._12_4_ = 0x3ab743ce;
      auVar457._8_4_ = 0x3c088908;
      auVar457._0_8_ = 0x3c0889083c088908;
      auVar457._12_4_ = 0x3c088908;
      auVar463._8_4_ = 0x3d2aa9c1;
      auVar463._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar463._12_4_ = 0x3d2aa9c1;
      auVar469._8_4_ = 0x3e2aaaaa;
      auVar469._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar469._12_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT1664(auVar469);
      auVar476._8_4_ = 0x3f800000;
      auVar476._0_8_ = 0x3f8000003f800000;
      auVar476._12_4_ = 0x3f800000;
      auVar482._8_4_ = 0xb95e8083;
      auVar482._0_8_ = 0xb95e8083b95e8083;
      auVar482._12_4_ = 0xb95e8083;
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      in_ZMM20 = ZEXT1664(auVar169);
      auVar170 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT1664(auVar170);
      auVar191 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar192 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar194 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar195 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar196 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar197 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar209 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar202 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar198 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (0 < local_118.h) {
          uVar13 = bottom_blob->w;
          unaff_R13 = (ulong)uVar13;
          iVar138 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar160 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x10;
          uVar153 = 0;
          do {
            if (0 < local_118.w) {
              uVar161 = 0;
              iVar139 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar200 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar200 = *(undefined1 (*) [16])(lVar155 + local_1e0 * 0x10);
                }
                auVar274 = ZEXT1664(auVar200);
                if (0 < (int)uVar160) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  pvVar152 = bottom_blob->data;
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar134 = (((int)uVar157 - uVar11) + 1) * iVar10 + uVar153;
                        if (((-1 < iVar134) && (iVar135 = iVar134 / iVar158, iVar134 % iVar158 == 0)
                            ) && ((0 < (int)uVar140 && (iVar135 < iVar138)))) {
                          lVar144 = (long)iVar135 * (long)bottom_blob->w * bottom_blob->elemsize +
                                    bottom_blob->cstep * bottom_blob->elemsize * uVar143;
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar134 = iVar139;
                          do {
                            if (((-1 < iVar134) &&
                                (iVar135 = iVar134 / iVar156, iVar134 % iVar156 == 0)) &&
                               (iVar135 < (int)uVar13)) {
                              lVar142 = (long)(iVar135 << 2);
                              uVar1 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144);
                              auVar405._4_4_ = uVar1;
                              auVar405._0_4_ = uVar1;
                              auVar405._8_4_ = uVar1;
                              auVar405._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar152 + lVar142 * 4 + lVar144 + 4);
                              auVar433._4_4_ = uVar1;
                              auVar433._0_4_ = uVar1;
                              auVar433._8_4_ = uVar1;
                              auVar433._12_4_ = uVar1;
                              auVar201 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 8)));
                              in_ZMM16 = ZEXT1664(auVar201);
                              auVar171 = vbroadcastss_avx512vl
                                                   (ZEXT416(*(uint *)((long)pvVar152 +
                                                                     lVar142 * 4 + lVar144 + 0xc)));
                              uVar163 = uVar154 & 0xffffffff;
                              auVar200 = vfmadd231ps_fma(auVar274._0_16_,auVar405,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar151 + uVar163 * 4));
                              auVar200 = vfmadd231ps_fma(auVar200,auVar433,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar151 + uVar163 * 4 + 0x10));
                              auVar200 = vfmadd231ps_avx512vl
                                                   (auVar200,auVar201,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x20));
                              auVar200 = vfmadd231ps_avx512vl
                                                   (auVar200,auVar171,
                                                    *(undefined1 (*) [16])
                                                     ((long)pvVar151 + uVar163 * 4 + 0x30));
                              auVar274 = ZEXT1664(auVar200);
                            }
                            uVar154 = uVar154 + 0x10;
                            iVar134 = iVar134 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 0x10;
                      } while (uVar157 != uVar11);
                    }
                    auVar200 = auVar274._0_16_;
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 0x10) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                switch(uVar12) {
                case 1:
                  auVar200 = vmaxps_avx(auVar200,auVar199);
                  break;
                case 2:
                  auVar201 = vmaxps_avx(auVar200,auVar199);
                  auVar200 = vminps_avx(auVar200,auVar199);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar73._4_4_ = uVar1;
                  auVar73._0_4_ = uVar1;
                  auVar73._8_4_ = uVar1;
                  auVar73._12_4_ = uVar1;
                  auVar200 = vfmadd132ps_avx512vl(auVar200,auVar201,auVar73);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar71._4_4_ = uVar1;
                  auVar71._0_4_ = uVar1;
                  auVar71._8_4_ = uVar1;
                  auVar71._12_4_ = uVar1;
                  auVar200 = vmaxps_avx512vl(auVar200,auVar71);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar72._4_4_ = uVar1;
                  auVar72._0_4_ = uVar1;
                  auVar72._8_4_ = uVar1;
                  auVar72._12_4_ = uVar1;
                  auVar200 = vminps_avx512vl(auVar200,auVar72);
                  break;
                case 4:
                  auVar69._8_4_ = 0x80000000;
                  auVar69._0_8_ = 0x8000000080000000;
                  auVar69._12_4_ = 0x80000000;
                  auVar200 = vxorps_avx512vl(auVar200,auVar69);
                  auVar200 = vminps_avx(auVar200,auVar362);
                  auVar200 = vmaxps_avx(auVar200,auVar369);
                  auVar201 = vfmadd231ps_fma(auVar375,auVar200,auVar381);
                  auVar171 = vcvttps2dq_avx512vl(auVar201);
                  auVar171 = vcvtdq2ps_avx512vl(auVar171);
                  uVar143 = vcmpps_avx512vl(auVar201,auVar171,1);
                  auVar201 = vsubps_avx512vl(auVar171,auVar387);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar215._0_4_ = (uint)bVar37 * auVar201._0_4_ | (uint)!bVar37 * auVar171._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar215._4_4_ = (uint)bVar37 * auVar201._4_4_ | (uint)!bVar37 * auVar171._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar215._8_4_ = (uint)bVar37 * auVar201._8_4_ | (uint)!bVar37 * auVar171._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar215._12_4_ = (uint)bVar37 * auVar201._12_4_ | (uint)!bVar37 * auVar171._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar215);
                  auVar200 = vfmsub231ps_avx512vl(auVar200,auVar215,auVar393);
                  auVar70._8_4_ = 0x395e8083;
                  auVar70._0_8_ = 0x395e8083395e8083;
                  auVar70._12_4_ = 0x395e8083;
                  auVar201 = vfmsub231ps_avx512vl(auVar200,auVar215,auVar70);
                  auVar406._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar406._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar406._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar406._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar200 = vfmadd213ps_fma(auVar168,auVar201,auVar451);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar201,auVar457);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar201,auVar463);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar201,auVar469);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar201,auVar375);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar406,auVar201);
                  auVar407._0_4_ = auVar200._0_4_ + 1.0;
                  auVar407._4_4_ = auVar200._4_4_ + 1.0;
                  auVar407._8_4_ = auVar200._8_4_ + 1.0;
                  auVar407._12_4_ = auVar200._12_4_ + 1.0;
                  auVar200 = vcvttps2dq_avx512vl(auVar215);
                  auVar200 = vpslld_avx(auVar200,0x17);
                  auVar200 = vpaddd_avx(auVar476,auVar200);
                  auVar201 = vfmadd213ps_fma(auVar200,auVar407,auVar387);
                  auVar200 = vrcpps_avx(auVar201);
                  auVar201 = vfmsub213ps_fma(auVar201,auVar200,auVar387);
                  auVar200 = vfnmadd132ps_fma(auVar201,auVar200,auVar200);
                  break;
                case 5:
                  auVar201 = vminps_avx(auVar200,auVar362);
                  auVar201 = vmaxps_avx(auVar201,auVar369);
                  auVar171 = vfmadd213ps_fma(auVar381,auVar201,auVar375);
                  auVar172 = vcvttps2dq_avx512vl(auVar171);
                  auVar172 = vcvtdq2ps_avx512vl(auVar172);
                  uVar143 = vcmpps_avx512vl(auVar171,auVar172,1);
                  auVar171 = vsubps_avx512vl(auVar172,auVar387);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar210._0_4_ = (uint)bVar37 * auVar171._0_4_ | (uint)!bVar37 * auVar172._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar210._4_4_ = (uint)bVar37 * auVar171._4_4_ | (uint)!bVar37 * auVar172._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar210._8_4_ = (uint)bVar37 * auVar171._8_4_ | (uint)!bVar37 * auVar172._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar210._12_4_ = (uint)bVar37 * auVar171._12_4_ | (uint)!bVar37 * auVar172._12_4_
                  ;
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar210,auVar393);
                  auVar201 = vfnmsub231ps_avx512vl(auVar201,auVar210,auVar482);
                  auVar434._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar434._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar434._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar434._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar171 = vfmadd213ps_avx512vl(auVar168,auVar201,auVar451);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar457);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar463);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar469);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar375);
                  auVar201 = vfmadd213ps_avx512vl(auVar171,auVar434,auVar201);
                  auVar171 = vaddps_avx512vl(auVar201,auVar387);
                  auVar201 = vcvttps2dq_avx512vl(auVar210);
                  auVar201 = vpslld_avx(auVar201,0x17);
                  auVar201 = vpaddd_avx(auVar201,auVar476);
                  auVar201 = vfmadd213ps_fma(auVar201,auVar171,auVar387);
                  uVar143 = vcmpps_avx512vl(auVar201,auVar199,2);
                  auVar66._8_4_ = 0x800000;
                  auVar66._0_8_ = 0x80000000800000;
                  auVar66._12_4_ = 0x800000;
                  auVar201 = vmaxps_avx512vl(auVar201,auVar66);
                  auVar173 = vpsrld_avx(auVar201,0x17);
                  auVar171 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar67._8_4_ = 0x3f000000;
                  auVar67._0_8_ = 0x3f0000003f000000;
                  auVar67._12_4_ = 0x3f000000;
                  auVar201 = vpternlogd_avx512vl(auVar201,auVar171,auVar67,0xea);
                  uVar157 = vcmpps_avx512vl(auVar201,auVar169,1);
                  auVar171 = vaddps_avx512vl(auVar201,auVar170);
                  auVar201 = vaddps_avx512vl(auVar171,auVar201);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar211._0_4_ = (uint)bVar37 * auVar201._0_4_ | (uint)!bVar37 * auVar171._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar211._4_4_ = (uint)bVar37 * auVar201._4_4_ | (uint)!bVar37 * auVar171._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar211._8_4_ = (uint)bVar37 * auVar201._8_4_ | (uint)!bVar37 * auVar171._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar211._12_4_ = (uint)bVar37 * auVar201._12_4_ | (uint)!bVar37 * auVar171._12_4_
                  ;
                  auVar171 = vmulps_avx512vl(auVar211,auVar211);
                  auVar201 = vfmadd213ps_avx512vl(auVar191,auVar211,auVar192);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar211,auVar193);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar211,auVar194);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar211,auVar195);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar211,auVar196);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar211,auVar197);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar211,auVar209);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar211,auVar202);
                  auVar172 = vmulps_avx512vl(auVar171,auVar211);
                  auVar172 = vmulps_avx512vl(auVar172,auVar201);
                  auVar68._8_4_ = 0xffffff82;
                  auVar68._0_8_ = 0xffffff82ffffff82;
                  auVar68._12_4_ = 0xffffff82;
                  auVar201 = vpaddd_avx512vl(auVar173,auVar68);
                  auVar201 = vcvtdq2ps_avx(auVar201);
                  auVar173 = vsubps_avx512vl(auVar201,auVar387);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar212._0_4_ = (uint)bVar37 * auVar173._0_4_ | (uint)!bVar37 * auVar201._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar212._4_4_ = (uint)bVar37 * auVar173._4_4_ | (uint)!bVar37 * auVar201._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar212._8_4_ = (uint)bVar37 * auVar173._8_4_ | (uint)!bVar37 * auVar201._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar212._12_4_ = (uint)bVar37 * auVar173._12_4_ | (uint)!bVar37 * auVar201._12_4_
                  ;
                  auVar201 = vfmadd231ps_avx512vl(auVar172,auVar212,auVar482);
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar375,auVar171);
                  auVar201 = vsubps_avx512vl(auVar201,auVar211);
                  auVar201 = vfnmadd231ps_fma(auVar201,auVar393,auVar212);
                  auVar171 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar213._0_4_ =
                       (uint)bVar37 * auVar171._0_4_ |
                       (uint)!bVar37 * (int)(auVar201._0_4_ + auVar201._0_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar213._4_4_ =
                       (uint)bVar37 * auVar171._4_4_ |
                       (uint)!bVar37 * (int)(auVar201._4_4_ + auVar201._4_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar213._8_4_ =
                       (uint)bVar37 * auVar171._8_4_ |
                       (uint)!bVar37 * (int)(auVar201._8_4_ + auVar201._8_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar213._12_4_ =
                       (uint)bVar37 * auVar171._12_4_ |
                       (uint)!bVar37 * (int)(auVar201._12_4_ + auVar201._12_4_);
                  auVar201 = vminps_avx(auVar213,auVar362);
                  auVar201 = vmaxps_avx(auVar201,auVar369);
                  auVar171 = vfmadd213ps_fma(auVar381,auVar201,auVar375);
                  auVar172 = vcvttps2dq_avx512vl(auVar171);
                  auVar172 = vcvtdq2ps_avx512vl(auVar172);
                  uVar143 = vcmpps_avx512vl(auVar171,auVar172,1);
                  auVar171 = vsubps_avx512vl(auVar172,auVar387);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar214._0_4_ = (uint)bVar37 * auVar171._0_4_ | (uint)!bVar37 * auVar172._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar214._4_4_ = (uint)bVar37 * auVar171._4_4_ | (uint)!bVar37 * auVar172._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar214._8_4_ = (uint)bVar37 * auVar171._8_4_ | (uint)!bVar37 * auVar172._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar214._12_4_ = (uint)bVar37 * auVar171._12_4_ | (uint)!bVar37 * auVar172._12_4_
                  ;
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar214,auVar393);
                  auVar201 = vfnmsub231ps_avx512vl(auVar201,auVar214,auVar482);
                  auVar435._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar435._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar435._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar435._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar171 = vfmadd213ps_avx512vl(auVar168,auVar201,auVar451);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar457);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar463);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar469);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar375);
                  auVar201 = vfmadd213ps_avx512vl(auVar171,auVar435,auVar201);
                  auVar171 = vaddps_avx512vl(auVar201,auVar387);
                  auVar201 = vcvttps2dq_avx512vl(auVar214);
                  auVar201 = vpslld_avx(auVar201,0x17);
                  auVar201 = vpaddd_avx(auVar201,auVar476);
                  auVar171 = vfmadd213ps_fma(auVar201,auVar171,auVar387);
                  auVar201 = vrcpps_avx(auVar171);
                  auVar172 = vaddps_avx512vl(auVar201,auVar201);
                  in_ZMM16 = ZEXT1664(auVar172);
                  auVar171 = vfmsub213ps_avx512vl(auVar171,auVar172,auVar198);
                  auVar201 = vfnmadd213ps_avx512vl(auVar171,auVar201,auVar172);
                  auVar200 = vfmsub231ps_fma(auVar200,auVar200,auVar201);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar408._4_4_ = uVar1;
                  auVar408._0_4_ = uVar1;
                  auVar408._8_4_ = uVar1;
                  auVar408._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar65._4_4_ = uVar1;
                  auVar65._0_4_ = uVar1;
                  auVar65._8_4_ = uVar1;
                  auVar65._12_4_ = uVar1;
                  auVar201 = vfmadd213ps_avx512vl(auVar408,auVar200,auVar65);
                  auVar201 = vmaxps_avx(auVar201,auVar199);
                  auVar201 = vminps_avx(auVar201,auVar387);
                  auVar350._0_4_ = auVar201._0_4_ * auVar200._0_4_;
                  auVar350._4_4_ = auVar201._4_4_ * auVar200._4_4_;
                  auVar350._8_4_ = auVar201._8_4_ * auVar200._8_4_;
                  auVar350._12_4_ = auVar201._12_4_ * auVar200._12_4_;
                  auVar200 = auVar350;
                }
                *(undefined1 (*) [16])ppp_Var150 = auVar200;
                ppp_Var150 = ppp_Var150 + 2;
                uVar161 = uVar161 + 1;
                iVar139 = iVar139 + 1;
              } while (uVar161 != local_118.w);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_118.c);
    }
    if (((iVar9 == 1) && (uVar145 == 4)) && (0 < (long)local_118.c)) {
      p_Var141 = pp_Var15[-3];
      iVar147 = *(int *)(&this->field_0xdc + (long)p_Var141);
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar140 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_1e0 = 0;
      auVar199 = ZEXT816(0) << 0x40;
      auVar363._8_4_ = 0x42b0c0a5;
      auVar363._0_8_ = 0x42b0c0a542b0c0a5;
      auVar363._12_4_ = 0x42b0c0a5;
      auVar370._8_4_ = 0xc2b0c0a5;
      auVar370._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar370._12_4_ = 0xc2b0c0a5;
      auVar376._8_4_ = 0x3f000000;
      auVar376._0_8_ = 0x3f0000003f000000;
      auVar376._12_4_ = 0x3f000000;
      auVar382._8_4_ = 0x3fb8aa3b;
      auVar382._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar382._12_4_ = 0x3fb8aa3b;
      auVar388._8_4_ = 0x3f800000;
      auVar388._0_8_ = 0x3f8000003f800000;
      auVar388._12_4_ = 0x3f800000;
      auVar394._8_4_ = 0x3f318000;
      auVar394._0_8_ = 0x3f3180003f318000;
      auVar394._12_4_ = 0x3f318000;
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar452._8_4_ = 0x3ab743ce;
      auVar452._0_8_ = 0x3ab743ce3ab743ce;
      auVar452._12_4_ = 0x3ab743ce;
      auVar458._8_4_ = 0x3c088908;
      auVar458._0_8_ = 0x3c0889083c088908;
      auVar458._12_4_ = 0x3c088908;
      auVar464._8_4_ = 0x3d2aa9c1;
      auVar464._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar464._12_4_ = 0x3d2aa9c1;
      auVar470._8_4_ = 0x3e2aaaaa;
      auVar470._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar470._12_4_ = 0x3e2aaaaa;
      in_ZMM13 = (float  [16])ZEXT1664(auVar470);
      auVar477._8_4_ = 0x3f800000;
      auVar477._0_8_ = 0x3f8000003f800000;
      auVar477._12_4_ = 0x3f800000;
      auVar483._8_4_ = 0xb95e8083;
      auVar483._0_8_ = 0xb95e8083b95e8083;
      auVar483._12_4_ = 0xb95e8083;
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      in_ZMM20 = ZEXT1664(auVar169);
      auVar170 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      in_ZMM21 = (float  [16])ZEXT1664(auVar170);
      auVar191 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar192 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar194 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar195 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar196 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar197 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar209 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar202 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar198 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (0 < local_118.h) {
          uVar13 = bottom_blob->w;
          unaff_R13 = (ulong)uVar13;
          iVar138 = bottom_blob->h;
          ppp_Var150 = (_func_int ***)
                       ((long)(_func_int ***)local_118.data +
                       local_118.cstep * local_1e0 *
                       CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize));
          uVar160 = bottom_blob->c;
          local_88._0_8_ = local_1e0 * 0x10;
          uVar153 = 0;
          do {
            if (0 < local_118.w) {
              uVar161 = 0;
              iVar139 = (1 - uVar140) * iVar147;
              do {
                if (lVar155 == 0) {
                  auVar200 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar200 = *(undefined1 (*) [16])(lVar155 + local_1e0 * 0x10);
                }
                auVar274 = ZEXT1664(auVar200);
                if (0 < (int)uVar160) {
                  pvVar151 = (void *)((this->weight_data_tm).cstep * local_1e0 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  uVar143 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar134 = (((int)uVar157 - uVar11) + 1) * iVar10 + uVar153;
                        if (((-1 < iVar134) && (iVar135 = iVar134 / iVar158, iVar134 % iVar158 == 0)
                            ) && ((iVar135 < iVar138 && (0 < (int)uVar140)))) {
                          uVar154 = uVar162;
                          uVar164 = (ulong)uVar140;
                          iVar134 = iVar139;
                          do {
                            if (((-1 < iVar134) &&
                                (iVar136 = iVar134 / iVar156, iVar134 % iVar156 == 0)) &&
                               (iVar136 < (int)uVar13)) {
                              uVar1 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar136 * 4 +
                                       (long)iVar135 * (long)bottom_blob->w * bottom_blob->elemsize
                                       + bottom_blob->cstep * bottom_blob->elemsize * uVar143);
                              auVar409._4_4_ = uVar1;
                              auVar409._0_4_ = uVar1;
                              auVar409._8_4_ = uVar1;
                              auVar409._12_4_ = uVar1;
                              auVar200 = vfmadd231ps_fma(auVar274._0_16_,auVar409,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar151 +
                                                          (uVar154 & 0xffffffff) * 4));
                              auVar274 = ZEXT1664(auVar200);
                            }
                            uVar154 = uVar154 + 4;
                            iVar134 = iVar134 + iVar147;
                            uVar164 = uVar164 - 1;
                          } while (uVar164 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar140 * 4;
                      } while (uVar157 != uVar11);
                    }
                    auVar200 = auVar274._0_16_;
                    pvVar151 = (void *)((long)pvVar151 + (long)(int)(uVar140 * uVar11 * 4) * 4);
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar160);
                }
                switch(uVar12) {
                case 1:
                  auVar200 = vmaxps_avx(auVar200,auVar199);
                  break;
                case 2:
                  auVar201 = vmaxps_avx(auVar200,auVar199);
                  auVar200 = vminps_avx(auVar200,auVar199);
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar82._4_4_ = uVar1;
                  auVar82._0_4_ = uVar1;
                  auVar82._8_4_ = uVar1;
                  auVar82._12_4_ = uVar1;
                  auVar200 = vfmadd132ps_avx512vl(auVar200,auVar201,auVar82);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar80._4_4_ = uVar1;
                  auVar80._0_4_ = uVar1;
                  auVar80._8_4_ = uVar1;
                  auVar80._12_4_ = uVar1;
                  auVar200 = vmaxps_avx512vl(auVar200,auVar80);
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar81._4_4_ = uVar1;
                  auVar81._0_4_ = uVar1;
                  auVar81._8_4_ = uVar1;
                  auVar81._12_4_ = uVar1;
                  auVar200 = vminps_avx512vl(auVar200,auVar81);
                  break;
                case 4:
                  auVar78._8_4_ = 0x80000000;
                  auVar78._0_8_ = 0x8000000080000000;
                  auVar78._12_4_ = 0x80000000;
                  auVar200 = vxorps_avx512vl(auVar200,auVar78);
                  auVar200 = vminps_avx(auVar200,auVar363);
                  auVar200 = vmaxps_avx(auVar200,auVar370);
                  auVar201 = vfmadd231ps_fma(auVar376,auVar200,auVar382);
                  auVar171 = vcvttps2dq_avx512vl(auVar201);
                  auVar171 = vcvtdq2ps_avx512vl(auVar171);
                  uVar143 = vcmpps_avx512vl(auVar201,auVar171,1);
                  auVar201 = vsubps_avx512vl(auVar171,auVar388);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar221._0_4_ = (uint)bVar37 * auVar201._0_4_ | (uint)!bVar37 * auVar171._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar221._4_4_ = (uint)bVar37 * auVar201._4_4_ | (uint)!bVar37 * auVar171._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar221._8_4_ = (uint)bVar37 * auVar201._8_4_ | (uint)!bVar37 * auVar171._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar221._12_4_ = (uint)bVar37 * auVar201._12_4_ | (uint)!bVar37 * auVar171._12_4_
                  ;
                  in_ZMM16 = ZEXT1664(auVar221);
                  auVar200 = vfmsub231ps_avx512vl(auVar200,auVar221,auVar394);
                  auVar79._8_4_ = 0x395e8083;
                  auVar79._0_8_ = 0x395e8083395e8083;
                  auVar79._12_4_ = 0x395e8083;
                  auVar201 = vfmsub231ps_avx512vl(auVar200,auVar221,auVar79);
                  auVar410._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar410._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar410._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar410._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar200 = vfmadd213ps_fma(auVar168,auVar201,auVar452);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar201,auVar458);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar201,auVar464);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar201,auVar470);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar201,auVar376);
                  auVar200 = vfmadd213ps_fma(auVar200,auVar410,auVar201);
                  auVar411._0_4_ = auVar200._0_4_ + 1.0;
                  auVar411._4_4_ = auVar200._4_4_ + 1.0;
                  auVar411._8_4_ = auVar200._8_4_ + 1.0;
                  auVar411._12_4_ = auVar200._12_4_ + 1.0;
                  auVar200 = vcvttps2dq_avx512vl(auVar221);
                  auVar200 = vpslld_avx(auVar200,0x17);
                  auVar200 = vpaddd_avx(auVar477,auVar200);
                  auVar201 = vfmadd213ps_fma(auVar200,auVar411,auVar388);
                  auVar200 = vrcpps_avx(auVar201);
                  auVar201 = vfmsub213ps_fma(auVar201,auVar200,auVar388);
                  auVar200 = vfnmadd132ps_fma(auVar201,auVar200,auVar200);
                  break;
                case 5:
                  auVar201 = vminps_avx(auVar200,auVar363);
                  auVar201 = vmaxps_avx(auVar201,auVar370);
                  auVar171 = vfmadd213ps_fma(auVar382,auVar201,auVar376);
                  auVar172 = vcvttps2dq_avx512vl(auVar171);
                  auVar172 = vcvtdq2ps_avx512vl(auVar172);
                  uVar143 = vcmpps_avx512vl(auVar171,auVar172,1);
                  auVar171 = vsubps_avx512vl(auVar172,auVar388);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar216._0_4_ = (uint)bVar37 * auVar171._0_4_ | (uint)!bVar37 * auVar172._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar216._4_4_ = (uint)bVar37 * auVar171._4_4_ | (uint)!bVar37 * auVar172._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar216._8_4_ = (uint)bVar37 * auVar171._8_4_ | (uint)!bVar37 * auVar172._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar216._12_4_ = (uint)bVar37 * auVar171._12_4_ | (uint)!bVar37 * auVar172._12_4_
                  ;
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar216,auVar394);
                  auVar201 = vfnmsub231ps_avx512vl(auVar201,auVar216,auVar483);
                  auVar436._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar436._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar436._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar436._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar171 = vfmadd213ps_avx512vl(auVar168,auVar201,auVar452);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar458);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar464);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar470);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar376);
                  auVar201 = vfmadd213ps_avx512vl(auVar171,auVar436,auVar201);
                  auVar171 = vaddps_avx512vl(auVar201,auVar388);
                  auVar201 = vcvttps2dq_avx512vl(auVar216);
                  auVar201 = vpslld_avx(auVar201,0x17);
                  auVar201 = vpaddd_avx(auVar201,auVar477);
                  auVar201 = vfmadd213ps_fma(auVar201,auVar171,auVar388);
                  uVar143 = vcmpps_avx512vl(auVar201,auVar199,2);
                  auVar75._8_4_ = 0x800000;
                  auVar75._0_8_ = 0x80000000800000;
                  auVar75._12_4_ = 0x800000;
                  auVar201 = vmaxps_avx512vl(auVar201,auVar75);
                  auVar173 = vpsrld_avx(auVar201,0x17);
                  auVar171 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar76._8_4_ = 0x3f000000;
                  auVar76._0_8_ = 0x3f0000003f000000;
                  auVar76._12_4_ = 0x3f000000;
                  auVar201 = vpternlogd_avx512vl(auVar201,auVar171,auVar76,0xea);
                  uVar157 = vcmpps_avx512vl(auVar201,auVar169,1);
                  auVar171 = vaddps_avx512vl(auVar201,auVar170);
                  auVar201 = vaddps_avx512vl(auVar171,auVar201);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar217._0_4_ = (uint)bVar37 * auVar201._0_4_ | (uint)!bVar37 * auVar171._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar217._4_4_ = (uint)bVar37 * auVar201._4_4_ | (uint)!bVar37 * auVar171._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar217._8_4_ = (uint)bVar37 * auVar201._8_4_ | (uint)!bVar37 * auVar171._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar217._12_4_ = (uint)bVar37 * auVar201._12_4_ | (uint)!bVar37 * auVar171._12_4_
                  ;
                  auVar171 = vmulps_avx512vl(auVar217,auVar217);
                  auVar201 = vfmadd213ps_avx512vl(auVar191,auVar217,auVar192);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar217,auVar193);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar217,auVar194);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar217,auVar195);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar217,auVar196);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar217,auVar197);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar217,auVar209);
                  auVar201 = vfmadd213ps_avx512vl(auVar201,auVar217,auVar202);
                  auVar172 = vmulps_avx512vl(auVar171,auVar217);
                  auVar172 = vmulps_avx512vl(auVar172,auVar201);
                  auVar77._8_4_ = 0xffffff82;
                  auVar77._0_8_ = 0xffffff82ffffff82;
                  auVar77._12_4_ = 0xffffff82;
                  auVar201 = vpaddd_avx512vl(auVar173,auVar77);
                  auVar201 = vcvtdq2ps_avx(auVar201);
                  auVar173 = vsubps_avx512vl(auVar201,auVar388);
                  bVar37 = (bool)((byte)uVar157 & 1);
                  auVar218._0_4_ = (uint)bVar37 * auVar173._0_4_ | (uint)!bVar37 * auVar201._0_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 1) & 1);
                  auVar218._4_4_ = (uint)bVar37 * auVar173._4_4_ | (uint)!bVar37 * auVar201._4_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 2) & 1);
                  auVar218._8_4_ = (uint)bVar37 * auVar173._8_4_ | (uint)!bVar37 * auVar201._8_4_;
                  bVar37 = (bool)((byte)(uVar157 >> 3) & 1);
                  auVar218._12_4_ = (uint)bVar37 * auVar173._12_4_ | (uint)!bVar37 * auVar201._12_4_
                  ;
                  auVar201 = vfmadd231ps_avx512vl(auVar172,auVar218,auVar483);
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar376,auVar171);
                  auVar201 = vsubps_avx512vl(auVar201,auVar217);
                  auVar201 = vfnmadd231ps_fma(auVar201,auVar394,auVar218);
                  auVar171 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar219._0_4_ =
                       (uint)bVar37 * auVar171._0_4_ |
                       (uint)!bVar37 * (int)(auVar201._0_4_ + auVar201._0_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar219._4_4_ =
                       (uint)bVar37 * auVar171._4_4_ |
                       (uint)!bVar37 * (int)(auVar201._4_4_ + auVar201._4_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar219._8_4_ =
                       (uint)bVar37 * auVar171._8_4_ |
                       (uint)!bVar37 * (int)(auVar201._8_4_ + auVar201._8_4_);
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar219._12_4_ =
                       (uint)bVar37 * auVar171._12_4_ |
                       (uint)!bVar37 * (int)(auVar201._12_4_ + auVar201._12_4_);
                  auVar201 = vminps_avx(auVar219,auVar363);
                  auVar201 = vmaxps_avx(auVar201,auVar370);
                  auVar171 = vfmadd213ps_fma(auVar382,auVar201,auVar376);
                  auVar172 = vcvttps2dq_avx512vl(auVar171);
                  auVar172 = vcvtdq2ps_avx512vl(auVar172);
                  uVar143 = vcmpps_avx512vl(auVar171,auVar172,1);
                  auVar171 = vsubps_avx512vl(auVar172,auVar388);
                  bVar37 = (bool)((byte)uVar143 & 1);
                  auVar220._0_4_ = (uint)bVar37 * auVar171._0_4_ | (uint)!bVar37 * auVar172._0_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 1) & 1);
                  auVar220._4_4_ = (uint)bVar37 * auVar171._4_4_ | (uint)!bVar37 * auVar172._4_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 2) & 1);
                  auVar220._8_4_ = (uint)bVar37 * auVar171._8_4_ | (uint)!bVar37 * auVar172._8_4_;
                  bVar37 = (bool)((byte)(uVar143 >> 3) & 1);
                  auVar220._12_4_ = (uint)bVar37 * auVar171._12_4_ | (uint)!bVar37 * auVar172._12_4_
                  ;
                  auVar201 = vfmsub231ps_avx512vl(auVar201,auVar220,auVar394);
                  auVar201 = vfnmsub231ps_avx512vl(auVar201,auVar220,auVar483);
                  auVar437._0_4_ = auVar201._0_4_ * auVar201._0_4_;
                  auVar437._4_4_ = auVar201._4_4_ * auVar201._4_4_;
                  auVar437._8_4_ = auVar201._8_4_ * auVar201._8_4_;
                  auVar437._12_4_ = auVar201._12_4_ * auVar201._12_4_;
                  auVar171 = vfmadd213ps_avx512vl(auVar168,auVar201,auVar452);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar458);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar464);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar470);
                  auVar171 = vfmadd213ps_avx512vl(auVar171,auVar201,auVar376);
                  auVar201 = vfmadd213ps_avx512vl(auVar171,auVar437,auVar201);
                  auVar171 = vaddps_avx512vl(auVar201,auVar388);
                  auVar201 = vcvttps2dq_avx512vl(auVar220);
                  auVar201 = vpslld_avx(auVar201,0x17);
                  auVar201 = vpaddd_avx(auVar201,auVar477);
                  auVar171 = vfmadd213ps_fma(auVar201,auVar171,auVar388);
                  auVar201 = vrcpps_avx(auVar171);
                  auVar172 = vaddps_avx512vl(auVar201,auVar201);
                  in_ZMM16 = ZEXT1664(auVar172);
                  auVar171 = vfmsub213ps_avx512vl(auVar171,auVar172,auVar198);
                  auVar201 = vfnmadd213ps_avx512vl(auVar171,auVar201,auVar172);
                  auVar200 = vfmsub231ps_fma(auVar200,auVar200,auVar201);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var141);
                  auVar412._4_4_ = uVar1;
                  auVar412._0_4_ = uVar1;
                  auVar412._8_4_ = uVar1;
                  auVar412._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar74._4_4_ = uVar1;
                  auVar74._0_4_ = uVar1;
                  auVar74._8_4_ = uVar1;
                  auVar74._12_4_ = uVar1;
                  auVar201 = vfmadd213ps_avx512vl(auVar412,auVar200,auVar74);
                  auVar201 = vmaxps_avx(auVar201,auVar199);
                  auVar201 = vminps_avx(auVar201,auVar388);
                  auVar351._0_4_ = auVar201._0_4_ * auVar200._0_4_;
                  auVar351._4_4_ = auVar201._4_4_ * auVar200._4_4_;
                  auVar351._8_4_ = auVar201._8_4_ * auVar200._8_4_;
                  auVar351._12_4_ = auVar201._12_4_ * auVar200._12_4_;
                  auVar200 = auVar351;
                }
                *(undefined1 (*) [16])ppp_Var150 = auVar200;
                ppp_Var150 = ppp_Var150 + 2;
                uVar161 = uVar161 + 1;
                iVar139 = iVar139 + 1;
              } while (uVar161 != local_118.w);
            }
            uVar153 = uVar153 + 1;
          } while (uVar153 != local_118.h);
        }
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_118.c);
    }
    auVar169 = in_ZMM21._0_16_;
    auVar168 = in_ZMM16._0_16_;
    iVar147 = local_c8._0_4_;
    if (((iVar9 == 4) && (uVar145 == 1)) && (local_98 = (long)local_118.c, 0 < local_98)) {
      p_Var141 = pp_Var15[-3];
      uVar140 = *(uint *)(&this->field_0xdc + (long)p_Var141);
      pvVar151 = (void *)(ulong)uVar140;
      iVar10 = *(int *)(&this->field_0xe0 + (long)p_Var141);
      iVar156 = *(int *)(&this->field_0xe4 + (long)p_Var141);
      iVar158 = *(int *)(&this->field_0xe8 + (long)p_Var141);
      iVar138 = *(int *)(&this->field_0x114 + (long)p_Var141);
      lVar155 = *(long *)(&this->field_0x1a8 + (long)p_Var141);
      uVar11 = *(uint *)(&this->field_0xd4 + (long)p_Var141);
      uVar13 = *(uint *)(&this->field_0xd8 + (long)p_Var141);
      local_a0 = (Allocator *)local_118.data;
      local_a8 = (Allocator *)
                 (CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize) * local_118.cstep);
      uVar160 = bottom_blob->w;
      unaff_R13 = (ulong)uVar160;
      iVar139 = bottom_blob->h;
      uVar153 = bottom_blob->c;
      local_1e0 = 0;
      uVar148 = local_c8._0_8_;
      do {
        if (0 < iVar8) {
          local_1b8 = (_func_int ***)((long)&local_a0->_vptr_Allocator + (long)local_a8 * local_1e0)
          ;
          local_88._0_8_ =
               (void *)((this->weight_data_tm).cstep * local_1e0 * (this->weight_data_tm).elemsize +
                       (long)(this->weight_data_tm).data);
          uVar161 = 0;
          do {
            if (0 < iVar7) {
              iVar134 = bottom_blob->w;
              pvVar152 = bottom_blob->data;
              sVar16 = bottom_blob->elemsize;
              sVar17 = bottom_blob->cstep;
              pfVar18 = *(float **)(&this->field_0x118 + (long)p_Var141);
              uVar146 = 0;
              iVar147 = (1 - uVar11) * uVar140;
              do {
                if (lVar155 == 0) {
                  fVar346 = 0.0;
                }
                else {
                  fVar346 = *(float *)(lVar155 + local_1e0 * 4);
                }
                if ((int)uVar153 < 1) {
                  auVar168 = SUB6416(ZEXT864(0),0);
                }
                else {
                  auVar274 = ZEXT864(0);
                  uVar143 = 0;
                  lVar144 = local_88._0_8_;
                  do {
                    if (0 < (int)uVar13) {
                      uVar162 = 0;
                      uVar157 = 0;
                      do {
                        iVar135 = (((int)uVar157 - uVar13) + 1) * iVar10 + uVar161;
                        if (((-1 < iVar135) && (iVar136 = iVar135 / iVar158, iVar135 % iVar158 == 0)
                            ) && ((0 < (int)uVar11 && (iVar136 < iVar139)))) {
                          uVar154 = (ulong)uVar11;
                          uVar164 = uVar162;
                          iVar135 = iVar147;
                          do {
                            if (((-1 < iVar135) &&
                                (iVar137 = iVar135 / iVar156, iVar135 % iVar156 == 0)) &&
                               (iVar137 < (int)uVar160)) {
                              auVar168 = vfmadd231ps_fma(auVar274._0_16_,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar152 +
                                                          (long)(iVar137 << 2) * 4 +
                                                          (long)iVar136 * (long)iVar134 * sVar16 +
                                                          sVar17 * sVar16 * uVar143),
                                                         *(undefined1 (*) [16])
                                                          (lVar144 + (uVar164 & 0xffffffff) * 4));
                              auVar274 = ZEXT1664(auVar168);
                            }
                            uVar164 = uVar164 + 4;
                            iVar135 = iVar135 + uVar140;
                            uVar154 = uVar154 - 1;
                          } while (uVar154 != 0);
                        }
                        uVar157 = uVar157 + 1;
                        uVar162 = uVar162 + (ulong)uVar11 * 4;
                      } while (uVar157 != uVar13);
                    }
                    auVar168 = auVar274._0_16_;
                    lVar144 = lVar144 + (long)(int)(uVar11 * uVar13 * 4) * 4;
                    uVar143 = uVar143 + 1;
                  } while (uVar143 != uVar153);
                }
                auVar169 = vshufpd_avx(auVar168,auVar168,1);
                auVar352._0_4_ = auVar169._0_4_ + auVar168._0_4_;
                auVar352._4_4_ = auVar169._4_4_ + auVar168._4_4_;
                auVar352._8_4_ = auVar169._8_4_ + auVar168._8_4_;
                auVar352._12_4_ = auVar169._12_4_ + auVar168._12_4_;
                auVar168 = vmovshdup_avx(auVar352);
                fVar346 = auVar168._0_4_ + fVar346 + auVar352._0_4_;
                auVar168 = ZEXT416((uint)fVar346);
                fVar360 = fVar346;
                if (iVar138 - 1U < 6) {
                  switch(iVar138) {
                  case 1:
                    auVar168 = vmaxss_avx(ZEXT416((uint)fVar346),ZEXT416(0));
                    fVar360 = auVar168._0_4_;
                    break;
                  case 2:
                    uVar148 = vcmpss_avx512f(ZEXT416((uint)fVar346),ZEXT416(0),0xe);
                    bVar37 = (bool)((byte)uVar148 & 1);
                    fVar360 = (float)((uint)bVar37 * 0x3f800000 + (uint)!bVar37 * (int)*pfVar18) *
                              fVar346;
                    break;
                  case 3:
                    auVar168 = vmaxss_avx(auVar168,ZEXT416((uint)*pfVar18));
                    fVar360 = auVar168._0_4_;
                    if (pfVar18[1] < auVar168._0_4_) {
                      fVar360 = pfVar18[1];
                    }
                    break;
                  case 4:
                    auVar168 = vminss_avx(auVar168,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar84._8_4_ = 0x80000000;
                    auVar84._0_8_ = 0x8000000080000000;
                    auVar84._12_4_ = 0x80000000;
                    auVar169 = vxorps_avx512vl(auVar168,auVar84);
                    uVar148 = vcmpss_avx512f(auVar168,ZEXT416(0xc2b0c0a5),1);
                    bVar37 = (bool)((byte)uVar148 & 1);
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar346 = expf((float)((uint)bVar37 * 0x42b0c0a5 +
                                          (uint)!bVar37 * auVar169._0_4_));
                    fVar360 = 1.0 / (fVar346 + 1.0);
                    break;
                  case 5:
                    in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                    fVar360 = expf(fVar346);
                    fVar360 = logf(fVar360 + 1.0);
                    fVar360 = tanhf(fVar360);
                    fVar360 = fVar360 * fVar346;
                    break;
                  case 6:
                    fVar2 = *pfVar18;
                    auVar83._8_4_ = 0x80000000;
                    auVar83._0_8_ = 0x8000000080000000;
                    auVar83._12_4_ = 0x80000000;
                    auVar169 = vxorps_avx512vl(ZEXT416((uint)pfVar18[1]),auVar83);
                    fVar367 = auVar169._0_4_ / fVar2;
                    fVar360 = 0.0;
                    if ((fVar367 <= fVar346) &&
                       (fVar360 = fVar346, fVar346 <= fVar367 + 1.0 / fVar2)) {
                      auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar168,
                                                 ZEXT416((uint)pfVar18[1]));
                      fVar360 = auVar168._0_4_ * fVar346;
                    }
                  }
                }
                *(float *)local_1b8 = fVar360;
                local_1b8 = (_func_int ***)((long)local_1b8 + 4);
                uVar146 = uVar146 + 1;
                iVar147 = iVar147 + 1;
                uVar148 = local_c8._0_8_;
              } while (uVar146 != iVar7);
            }
            uVar161 = uVar161 + 1;
          } while (uVar161 != iVar8);
        }
        auVar169 = in_ZMM21._0_16_;
        auVar168 = in_ZMM16._0_16_;
        iVar147 = (int)uVar148;
        local_1e0 = local_1e0 + 1;
      } while (local_1e0 != local_98);
    }
    iVar8 = local_118.h;
    iVar7 = local_118.w;
    pvVar152 = local_118.data;
    if (((iVar9 == 1) && (uVar145 == 1)) &&
       (pp_Var15 = this->_vptr_Deconvolution_x86_avx512,
       0 < *(int *)(&this->field_0xd0 + (long)pp_Var15[-3]))) {
      iVar147 = iVar147 * (int)local_b0;
      lVar155 = local_118.cstep * CONCAT44(local_118.elemsize._4_4_,(uint)local_118.elemsize);
      iVar9 = bottom_blob->h;
      uVar145 = bottom_blob->c;
      uVar143 = (ulong)(uint)local_118.w;
      auVar279 = vpbroadcastd_avx512f(ZEXT416((uint)bottom_blob->w));
      lVar144 = (long)local_118.w;
      local_1b0 = 0;
      auVar168 = vxorps_avx512vl(auVar168,auVar168);
      auVar280 = ZEXT1664(auVar168);
      auVar278 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar291 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar277 = vpmovsxbd_avx512f(_DAT_005547c0);
      auVar276 = vpternlogd_avx512f(in_ZMM20,in_ZMM20,in_ZMM20,0xff);
      auVar168 = vxorps_avx512vl(auVar169,auVar169);
      auVar281 = ZEXT1664(auVar168);
      auVar275 = vpbroadcastq_avx512f(ZEXT816(0x10));
      auVar274 = vpbroadcastd_avx512f(ZEXT416(0x10));
      uVar157 = CONCAT62((int6)((ulong)pvVar151 >> 0x10),0x2000);
      uVar162 = CONCAT62((int6)(unaff_R13 >> 0x10),0x8000);
      local_88 = vmovdqu64_avx512f(auVar279);
      do {
        if (0 < iVar8) {
          local_1b8 = (_func_int ***)((long)(_func_int ***)pvVar152 + lVar155 * local_1b0);
          pp_Var19 = this->_vptr_Deconvolution_x86_avx512;
          sVar16 = (this->weight_data_tm).cstep;
          sVar17 = (this->weight_data_tm).elemsize;
          pvVar151 = (this->weight_data_tm).data;
          uVar140 = 0;
          do {
            if (0 < iVar7) {
              iVar10 = bottom_blob->w;
              pvVar159 = bottom_blob->data;
              sVar20 = bottom_blob->elemsize;
              sVar21 = bottom_blob->cstep;
              pp_Var22 = this->_vptr_Deconvolution_x86_avx512;
              iVar156 = uVar140 - local_90;
              uVar154 = 0;
              do {
                auVar168 = auVar280._0_16_;
                auVar169 = auVar281._0_16_;
                p_Var141 = pp_Var19[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var141) == 0) {
                  auVar282 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar282 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var141) +
                                              local_1b0 * 4));
                }
                auVar170 = auVar282._0_16_;
                if (0 < (int)uVar145) {
                  p_Var141 = pp_Var22[-3];
                  local_b0 = (_func_int *)
                             ((long)&this->_vptr_Deconvolution_x86_avx512 + (long)p_Var141);
                  auVar284 = vpbroadcastd_avx512f();
                  local_c8._0_8_ = (void *)(sVar16 * sVar17 * local_1b0 + (long)pvVar151);
                  uVar164 = 0;
                  auVar283 = auVar284;
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var141)) {
                      iVar158 = 0;
                      do {
                        iVar138 = *(int *)(local_b0 + 0xe0) * iVar158 + iVar156;
                        if (((-1 < iVar138) &&
                            (iVar139 = iVar138 / *(int *)(local_b0 + 0xe8),
                            iVar138 % *(int *)(local_b0 + 0xe8) == 0)) &&
                           ((iVar139 < iVar9 && (iVar138 = *(int *)(local_b0 + 0xd4), 0 < iVar138)))
                           ) {
                          auVar309._16_48_ = auVar283._16_48_;
                          auVar309._0_16_ = auVar168;
                          auVar308._4_60_ = auVar309._4_60_;
                          auVar308._0_4_ = auVar282._0_4_;
                          auVar398 = ZEXT1664(auVar308._0_16_);
                          auVar282 = vpbroadcastq_avx512f();
                          auVar283 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_b0 + 0xdc)));
                          uVar163 = 0;
                          auVar285 = vmovdqa64_avx512f(auVar291);
                          auVar286 = vmovdqa64_avx512f(auVar278);
                          auVar287 = vmovdqa64_avx512f(auVar277);
                          do {
                            uVar148 = vpcmpuq_avx512f(auVar285,auVar282,2);
                            uVar42 = vpcmpuq_avx512f(auVar286,auVar282,2);
                            bVar31 = (byte)uVar42;
                            uVar165 = CONCAT11(bVar31,(byte)uVar148);
                            auVar288 = vpmulld_avx512f(auVar283,auVar287);
                            auVar288 = vpaddd_avx512f(auVar284,auVar288);
                            uVar166 = vpcmpgtd_avx512f(auVar288,auVar276);
                            uVar166 = uVar165 & uVar166;
                            auVar289 = vpgatherdd_avx512f(*(undefined4 *)
                                                           (&this->field_0xe4 +
                                                           (long)(p_Var141 + uVar157 * 4)));
                            iVar135 = (uint)((byte)uVar166 & 1) * auVar289._0_4_;
                            iVar134 = (uint)((byte)(uVar166 >> 1) & 1) * auVar289._4_4_;
                            auVar310._4_4_ = iVar134;
                            auVar310._0_4_ = iVar135;
                            iVar136 = (uint)((byte)(uVar166 >> 2) & 1) * auVar289._8_4_;
                            auVar310._8_4_ = iVar136;
                            iVar137 = (uint)((byte)(uVar166 >> 3) & 1) * auVar289._12_4_;
                            auVar310._12_4_ = iVar137;
                            auVar310._16_4_ = (uint)((byte)(uVar166 >> 4) & 1) * auVar289._16_4_;
                            auVar310._20_4_ = (uint)((byte)(uVar166 >> 5) & 1) * auVar289._20_4_;
                            auVar310._24_4_ = (uint)((byte)(uVar166 >> 6) & 1) * auVar289._24_4_;
                            auVar310._28_4_ = (uint)((byte)(uVar166 >> 7) & 1) * auVar289._28_4_;
                            auVar310._32_4_ = (uint)((byte)(uVar166 >> 8) & 1) * auVar289._32_4_;
                            auVar310._36_4_ = (uint)((byte)(uVar166 >> 9) & 1) * auVar289._36_4_;
                            auVar310._40_4_ = (uint)((byte)(uVar166 >> 10) & 1) * auVar289._40_4_;
                            auVar310._44_4_ = (uint)((byte)(uVar166 >> 0xb) & 1) * auVar289._44_4_;
                            auVar310._48_4_ = (uint)((byte)(uVar166 >> 0xc) & 1) * auVar289._48_4_;
                            auVar310._52_4_ = (uint)((byte)(uVar166 >> 0xd) & 1) * auVar289._52_4_;
                            auVar310._56_4_ = (uint)((byte)(uVar166 >> 0xe) & 1) * auVar289._56_4_;
                            auVar310._60_4_ = (uint)(byte)(uVar166 >> 0xf) * auVar289._60_4_;
                            if ((uVar166 & 1) != 0) {
                              in_ZMM13 = (float  [16])ZEXT464((uint)(auVar288._0_4_ % iVar135));
                            }
                            if ((uVar166 & 2) != 0) {
                              auVar170 = vpinsrd_avx(in_ZMM13._0_16_,auVar288._4_4_ % iVar134,1);
                              in_ZMM13 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])in_ZMM13,auVar170,0)
                              ;
                            }
                            if ((uVar166 & 4) != 0) {
                              auVar170 = vpinsrd_avx(in_ZMM13._0_16_,auVar288._8_4_ % iVar136,2);
                              in_ZMM13 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])in_ZMM13,auVar170,0)
                              ;
                            }
                            if ((uVar166 & 8) != 0) {
                              auVar170 = vpinsrd_avx(in_ZMM13._0_16_,auVar288._12_4_ % iVar137,3);
                              in_ZMM13 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])in_ZMM13,auVar170,0)
                              ;
                            }
                            afVar311 = in_ZMM13;
                            if ((uVar166 & 0x10) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar311._0_16_ = in_ZMM13._0_16_;
                              afVar311[4] = auVar289._16_4_;
                              afVar311[5] = in_ZMM13[5];
                              afVar311[6] = in_ZMM13[6];
                              afVar311[7] = in_ZMM13[7];
                              afVar311[8] = in_ZMM13[8];
                              afVar311[9] = in_ZMM13[9];
                              afVar311[10] = in_ZMM13[10];
                              afVar311[0xb] = in_ZMM13[0xb];
                              afVar311[0xc] = in_ZMM13[0xc];
                              afVar311[0xd] = in_ZMM13[0xd];
                              afVar311[0xe] = in_ZMM13[0xe];
                              afVar311[0xf] = in_ZMM13[0xf];
                            }
                            afVar312 = afVar311;
                            if ((uVar166 & 0x20) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar312._0_20_ = afVar311._0_20_;
                              afVar312[5] = auVar289._20_4_;
                              afVar312[6] = afVar311[6];
                              afVar312[7] = afVar311[7];
                              afVar312[8] = afVar311[8];
                              afVar312[9] = afVar311[9];
                              afVar312[10] = afVar311[10];
                              afVar312[0xb] = afVar311[0xb];
                              afVar312[0xc] = afVar311[0xc];
                              afVar312[0xd] = afVar311[0xd];
                              afVar312[0xe] = afVar311[0xe];
                              afVar312[0xf] = afVar311[0xf];
                            }
                            afVar313 = afVar312;
                            if ((uVar166 & 0x40) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar313._0_24_ = afVar312._0_24_;
                              afVar313[6] = auVar289._24_4_;
                              afVar313[7] = afVar312[7];
                              afVar313[8] = afVar312[8];
                              afVar313[9] = afVar312[9];
                              afVar313[10] = afVar312[10];
                              afVar313[0xb] = afVar312[0xb];
                              afVar313[0xc] = afVar312[0xc];
                              afVar313[0xd] = afVar312[0xd];
                              afVar313[0xe] = afVar312[0xe];
                              afVar313[0xf] = afVar312[0xf];
                            }
                            afVar314 = afVar313;
                            if ((uVar166 & 0x80) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar314._0_28_ = afVar313._0_28_;
                              afVar314[7] = auVar289._28_4_;
                              afVar314[8] = afVar313[8];
                              afVar314[9] = afVar313[9];
                              afVar314[10] = afVar313[10];
                              afVar314[0xb] = afVar313[0xb];
                              afVar314[0xc] = afVar313[0xc];
                              afVar314[0xd] = afVar313[0xd];
                              afVar314[0xe] = afVar313[0xe];
                              afVar314[0xf] = afVar313[0xf];
                            }
                            vextracti32x4_avx512f(auVar288,2);
                            vextracti32x4_avx512f(auVar310,2);
                            afVar315 = afVar314;
                            if ((uVar166 & 0x100) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar315._0_32_ = afVar314._0_32_;
                              afVar315[8] = auVar289._32_4_;
                              afVar315[9] = afVar314[9];
                              afVar315[10] = afVar314[10];
                              afVar315[0xb] = afVar314[0xb];
                              afVar315[0xc] = afVar314[0xc];
                              afVar315[0xd] = afVar314[0xd];
                              afVar315[0xe] = afVar314[0xe];
                              afVar315[0xf] = afVar314[0xf];
                            }
                            afVar316 = afVar315;
                            if ((uVar166 & 0x200) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar316._0_36_ = afVar315._0_36_;
                              afVar316[9] = auVar289._36_4_;
                              afVar316[10] = afVar315[10];
                              afVar316[0xb] = afVar315[0xb];
                              afVar316[0xc] = afVar315[0xc];
                              afVar316[0xd] = afVar315[0xd];
                              afVar316[0xe] = afVar315[0xe];
                              afVar316[0xf] = afVar315[0xf];
                            }
                            afVar317 = afVar316;
                            if ((uVar166 & 0x400) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar317._0_40_ = afVar316._0_40_;
                              afVar317[10] = auVar289._40_4_;
                              afVar317[0xb] = afVar316[0xb];
                              afVar317[0xc] = afVar316[0xc];
                              afVar317[0xd] = afVar316[0xd];
                              afVar317[0xe] = afVar316[0xe];
                              afVar317[0xf] = afVar316[0xf];
                            }
                            afVar318 = afVar317;
                            if ((uVar166 & 0x800) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar318._0_44_ = afVar317._0_44_;
                              afVar318[0xb] = auVar289._44_4_;
                              afVar318[0xc] = afVar317[0xc];
                              afVar318[0xd] = afVar317[0xd];
                              afVar318[0xe] = afVar317[0xe];
                              afVar318[0xf] = afVar317[0xf];
                            }
                            vextracti32x4_avx512f(auVar288,3);
                            vextracti32x4_avx512f(auVar310,3);
                            afVar319 = afVar318;
                            if ((uVar166 & 0x1000) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar319._0_48_ = afVar318._0_48_;
                              afVar319[0xc] = auVar289._48_4_;
                              afVar319[0xd] = afVar318[0xd];
                              afVar319[0xe] = afVar318[0xe];
                              afVar319[0xf] = afVar318[0xf];
                            }
                            afVar320 = afVar319;
                            if ((uVar166 & 0x2000) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar320._0_52_ = afVar319._0_52_;
                              bVar37 = (bool)((byte)((uVar157 & 0xffffffff) >> 0xd) & 1);
                              afVar320[0xd] =
                                   (uint)bVar37 * auVar289._52_4_ |
                                   (uint)!bVar37 * (int)afVar319[0xd];
                              afVar320[0xe] = afVar319[0xe];
                              afVar320[0xf] = afVar319[0xf];
                            }
                            afVar474 = afVar320;
                            if ((uVar166 & 0x4000) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              afVar474._0_56_ = afVar320._0_56_;
                              afVar474[0xe] = auVar289._56_4_;
                              afVar474[0xf] = afVar320[0xf];
                            }
                            if ((uVar166 & 0x8000) != 0) {
                              auVar289 = vpbroadcastd_avx512f();
                              bVar37 = (bool)((byte)((uVar162 & 0xffffffff) >> 0xf) & 1);
                              afVar474[0xf] =
                                   (float)((uint)bVar37 * auVar289._60_4_ |
                                          (uint)!bVar37 * (int)afVar474[0xf]);
                            }
                            uVar167 = vptestnmd_avx512f((undefined1  [64])afVar474,
                                                        (undefined1  [64])afVar474);
                            uVar166 = uVar166 & uVar167;
                            if ((uVar166 & 1) != 0) {
                              afVar474 = (float  [16])ZEXT464((uint)(auVar288._0_4_ / iVar135));
                            }
                            if ((uVar166 & 2) != 0) {
                              auVar170 = vpinsrd_avx(afVar474._0_16_,auVar288._4_4_ / iVar134,1);
                              afVar474 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])afVar474,auVar170,0)
                              ;
                            }
                            if ((uVar166 & 4) != 0) {
                              auVar170 = vpinsrd_avx(afVar474._0_16_,auVar288._8_4_ / iVar136,2);
                              afVar474 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])afVar474,auVar170,0)
                              ;
                            }
                            if ((uVar166 & 8) != 0) {
                              auVar170 = vpinsrd_avx(afVar474._0_16_,auVar288._12_4_ / iVar137,3);
                              afVar474 = (float  [16])
                                         vinserti32x4_avx512f((undefined1  [64])afVar474,auVar170,0)
                              ;
                            }
                            afVar321 = afVar474;
                            if ((uVar166 & 0x10) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar321._0_16_ = afVar474._0_16_;
                              afVar321[4] = auVar288._16_4_;
                              afVar321[5] = afVar474[5];
                              afVar321[6] = afVar474[6];
                              afVar321[7] = afVar474[7];
                              afVar321[8] = afVar474[8];
                              afVar321[9] = afVar474[9];
                              afVar321[10] = afVar474[10];
                              afVar321[0xb] = afVar474[0xb];
                              afVar321[0xc] = afVar474[0xc];
                              afVar321[0xd] = afVar474[0xd];
                              afVar321[0xe] = afVar474[0xe];
                              afVar321[0xf] = afVar474[0xf];
                            }
                            afVar322 = afVar321;
                            if ((uVar166 & 0x20) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar322._0_20_ = afVar321._0_20_;
                              afVar322[5] = auVar288._20_4_;
                              afVar322[6] = afVar321[6];
                              afVar322[7] = afVar321[7];
                              afVar322[8] = afVar321[8];
                              afVar322[9] = afVar321[9];
                              afVar322[10] = afVar321[10];
                              afVar322[0xb] = afVar321[0xb];
                              afVar322[0xc] = afVar321[0xc];
                              afVar322[0xd] = afVar321[0xd];
                              afVar322[0xe] = afVar321[0xe];
                              afVar322[0xf] = afVar321[0xf];
                            }
                            afVar323 = afVar322;
                            if ((uVar166 & 0x40) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar323._0_24_ = afVar322._0_24_;
                              afVar323[6] = auVar288._24_4_;
                              afVar323[7] = afVar322[7];
                              afVar323[8] = afVar322[8];
                              afVar323[9] = afVar322[9];
                              afVar323[10] = afVar322[10];
                              afVar323[0xb] = afVar322[0xb];
                              afVar323[0xc] = afVar322[0xc];
                              afVar323[0xd] = afVar322[0xd];
                              afVar323[0xe] = afVar322[0xe];
                              afVar323[0xf] = afVar322[0xf];
                            }
                            afVar324 = afVar323;
                            if ((uVar166 & 0x80) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar324._0_28_ = afVar323._0_28_;
                              afVar324[7] = auVar288._28_4_;
                              afVar324[8] = afVar323[8];
                              afVar324[9] = afVar323[9];
                              afVar324[10] = afVar323[10];
                              afVar324[0xb] = afVar323[0xb];
                              afVar324[0xc] = afVar323[0xc];
                              afVar324[0xd] = afVar323[0xd];
                              afVar324[0xe] = afVar323[0xe];
                              afVar324[0xf] = afVar323[0xf];
                            }
                            afVar325 = afVar324;
                            if ((uVar166 & 0x100) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar325._0_32_ = afVar324._0_32_;
                              afVar325[8] = auVar288._32_4_;
                              afVar325[9] = afVar324[9];
                              afVar325[10] = afVar324[10];
                              afVar325[0xb] = afVar324[0xb];
                              afVar325[0xc] = afVar324[0xc];
                              afVar325[0xd] = afVar324[0xd];
                              afVar325[0xe] = afVar324[0xe];
                              afVar325[0xf] = afVar324[0xf];
                            }
                            afVar326 = afVar325;
                            if ((uVar166 & 0x200) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar326._0_36_ = afVar325._0_36_;
                              afVar326[9] = auVar288._36_4_;
                              afVar326[10] = afVar325[10];
                              afVar326[0xb] = afVar325[0xb];
                              afVar326[0xc] = afVar325[0xc];
                              afVar326[0xd] = afVar325[0xd];
                              afVar326[0xe] = afVar325[0xe];
                              afVar326[0xf] = afVar325[0xf];
                            }
                            afVar327 = afVar326;
                            if ((uVar166 & 0x400) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar327._0_40_ = afVar326._0_40_;
                              afVar327[10] = auVar288._40_4_;
                              afVar327[0xb] = afVar326[0xb];
                              afVar327[0xc] = afVar326[0xc];
                              afVar327[0xd] = afVar326[0xd];
                              afVar327[0xe] = afVar326[0xe];
                              afVar327[0xf] = afVar326[0xf];
                            }
                            afVar328 = afVar327;
                            if ((uVar166 & 0x800) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar328._0_44_ = afVar327._0_44_;
                              afVar328[0xb] = auVar288._44_4_;
                              afVar328[0xc] = afVar327[0xc];
                              afVar328[0xd] = afVar327[0xd];
                              afVar328[0xe] = afVar327[0xe];
                              afVar328[0xf] = afVar327[0xf];
                            }
                            afVar329 = afVar328;
                            if ((uVar166 & 0x1000) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar329._0_48_ = afVar328._0_48_;
                              afVar329[0xc] = auVar288._48_4_;
                              afVar329[0xd] = afVar328[0xd];
                              afVar329[0xe] = afVar328[0xe];
                              afVar329[0xf] = afVar328[0xf];
                            }
                            afVar330 = afVar329;
                            if ((uVar166 & 0x2000) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              afVar330._0_52_ = afVar329._0_52_;
                              bVar37 = (bool)((byte)((uVar157 & 0xffffffff) >> 0xd) & 1);
                              afVar330[0xd] =
                                   (uint)bVar37 * auVar288._52_4_ |
                                   (uint)!bVar37 * (int)afVar329[0xd];
                              afVar330[0xe] = afVar329[0xe];
                              afVar330[0xf] = afVar329[0xf];
                            }
                            in_ZMM13 = afVar330;
                            if ((uVar166 & 0x4000) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              in_ZMM13._0_56_ = afVar330._0_56_;
                              in_ZMM13[0xe] = auVar288._56_4_;
                              in_ZMM13[0xf] = afVar330[0xf];
                            }
                            if ((uVar166 & 0x8000) != 0) {
                              auVar288 = vpbroadcastd_avx512f();
                              bVar37 = (bool)((byte)((uVar162 & 0xffffffff) >> 0xf) & 1);
                              in_ZMM13[0xf] =
                                   (float)((uint)bVar37 * auVar288._60_4_ |
                                          (uint)!bVar37 * (int)in_ZMM13[0xf]);
                            }
                            uVar167 = vpcmpgtd_avx512f(auVar279,(undefined1  [64])in_ZMM13);
                            uVar167 = uVar166 & uVar167;
                            auVar288 = vgatherdps_avx512f(*(undefined4 *)
                                                           ((long)pvVar159 +
                                                           uVar162 * 4 +
                                                           (long)iVar139 * (long)iVar10 * sVar20 +
                                                           sVar21 * sVar20 * uVar164));
                            bVar23 = (byte)uVar167;
                            auVar331._4_4_ = (uint)((byte)(uVar167 >> 1) & 1) * auVar288._4_4_;
                            auVar331._0_4_ = (uint)(bVar23 & 1) * auVar288._0_4_;
                            auVar331._8_4_ = (uint)((byte)(uVar167 >> 2) & 1) * auVar288._8_4_;
                            auVar331._12_4_ = (uint)((byte)(uVar167 >> 3) & 1) * auVar288._12_4_;
                            auVar331._16_4_ = (uint)((byte)(uVar167 >> 4) & 1) * auVar288._16_4_;
                            auVar331._20_4_ = (uint)((byte)(uVar167 >> 5) & 1) * auVar288._20_4_;
                            auVar331._24_4_ = (uint)((byte)(uVar167 >> 6) & 1) * auVar288._24_4_;
                            auVar331._28_4_ = (uint)((byte)(uVar167 >> 7) & 1) * auVar288._28_4_;
                            bVar32 = (byte)(uVar167 >> 8);
                            auVar331._32_4_ = (uint)(bVar32 & 1) * auVar288._32_4_;
                            auVar331._36_4_ = (uint)((byte)(uVar167 >> 9) & 1) * auVar288._36_4_;
                            auVar331._40_4_ = (uint)((byte)(uVar167 >> 10) & 1) * auVar288._40_4_;
                            auVar331._44_4_ = (uint)((byte)(uVar167 >> 0xb) & 1) * auVar288._44_4_;
                            auVar331._48_4_ = (uint)((byte)(uVar167 >> 0xc) & 1) * auVar288._48_4_;
                            auVar331._52_4_ = (uint)((byte)(uVar167 >> 0xd) & 1) * auVar288._52_4_;
                            auVar331._56_4_ = (uint)((byte)(uVar167 >> 0xe) & 1) * auVar288._56_4_;
                            auVar331._60_4_ = (uint)(byte)(uVar167 >> 0xf) * auVar288._60_4_;
                            piVar14 = (int *)(local_c8._0_8_ + (ulong)(uint)(iVar138 * iVar158) * 4
                                             + uVar163 * 4);
                            auVar332._4_4_ = (uint)((byte)(uVar167 >> 1) & 1) * piVar14[1];
                            auVar332._0_4_ = (uint)(bVar23 & 1) * *piVar14;
                            auVar332._8_4_ = (uint)((byte)(uVar167 >> 2) & 1) * piVar14[2];
                            auVar332._12_4_ = (uint)((byte)(uVar167 >> 3) & 1) * piVar14[3];
                            auVar332._16_4_ = (uint)((byte)(uVar167 >> 4) & 1) * piVar14[4];
                            auVar332._20_4_ = (uint)((byte)(uVar167 >> 5) & 1) * piVar14[5];
                            auVar332._24_4_ = (uint)((byte)(uVar167 >> 6) & 1) * piVar14[6];
                            auVar332._28_4_ = (uint)((byte)(uVar167 >> 7) & 1) * piVar14[7];
                            auVar332._32_4_ = (uint)(bVar32 & 1) * piVar14[8];
                            auVar332._36_4_ = (uint)((byte)(uVar167 >> 9) & 1) * piVar14[9];
                            auVar332._40_4_ = (uint)((byte)(uVar167 >> 10) & 1) * piVar14[10];
                            auVar332._44_4_ = (uint)((byte)(uVar167 >> 0xb) & 1) * piVar14[0xb];
                            auVar332._48_4_ = (uint)((byte)(uVar167 >> 0xc) & 1) * piVar14[0xc];
                            auVar332._52_4_ = (uint)((byte)(uVar167 >> 0xd) & 1) * piVar14[0xd];
                            auVar332._56_4_ = (uint)((byte)(uVar167 >> 0xe) & 1) * piVar14[0xe];
                            auVar332._60_4_ = (uint)(byte)(uVar167 >> 0xf) * piVar14[0xf];
                            uVar41 = vpcmpd_avx512f((undefined1  [64])in_ZMM13,auVar279,5);
                            uVar166 = uVar166 & uVar41;
                            auVar288 = vfmadd231ps_avx512f(auVar398,auVar332,auVar331);
                            iVar134 = auVar398._0_4_;
                            bVar24 = (bool)((byte)(uVar167 >> 1) & 1);
                            iVar135 = auVar398._4_4_;
                            bVar25 = (bool)((byte)(uVar167 >> 2) & 1);
                            iVar136 = auVar398._8_4_;
                            bVar26 = (bool)((byte)(uVar167 >> 3) & 1);
                            iVar137 = auVar398._12_4_;
                            bVar27 = (bool)((byte)(uVar167 >> 4) & 1);
                            iVar334 = auVar398._16_4_;
                            bVar28 = (bool)((byte)(uVar167 >> 5) & 1);
                            iVar335 = auVar398._20_4_;
                            bVar29 = (bool)((byte)(uVar167 >> 6) & 1);
                            iVar336 = auVar398._24_4_;
                            bVar30 = (bool)((byte)(uVar167 >> 7) & 1);
                            iVar337 = auVar398._28_4_;
                            iVar338 = auVar398._32_4_;
                            bVar33 = (bool)((byte)(uVar167 >> 9) & 1);
                            iVar339 = auVar398._36_4_;
                            bVar34 = (bool)((byte)(uVar167 >> 10) & 1);
                            iVar340 = auVar398._40_4_;
                            bVar35 = (bool)((byte)(uVar167 >> 0xb) & 1);
                            iVar341 = auVar398._44_4_;
                            bVar36 = (bool)((byte)(uVar167 >> 0xc) & 1);
                            iVar342 = auVar398._48_4_;
                            bVar38 = (bool)((byte)(uVar167 >> 0xd) & 1);
                            iVar343 = auVar398._52_4_;
                            bVar39 = (bool)((byte)(uVar167 >> 0xe) & 1);
                            iVar344 = auVar398._56_4_;
                            bVar40 = SUB81(uVar167 >> 0xf,0);
                            iVar345 = auVar398._60_4_;
                            bVar37 = (bool)((byte)uVar166 & 1);
                            auVar398._0_4_ =
                                 (uint)bVar37 * iVar134 |
                                 (uint)!bVar37 *
                                 ((uint)(bVar23 & 1) * auVar288._0_4_ |
                                 (uint)!(bool)(bVar23 & 1) * iVar134);
                            bVar37 = (bool)((byte)(uVar166 >> 1) & 1);
                            auVar398._4_4_ =
                                 (uint)bVar37 * iVar135 |
                                 (uint)!bVar37 *
                                 ((uint)bVar24 * auVar288._4_4_ | (uint)!bVar24 * iVar135);
                            bVar37 = (bool)((byte)(uVar166 >> 2) & 1);
                            auVar398._8_4_ =
                                 (uint)bVar37 * iVar136 |
                                 (uint)!bVar37 *
                                 ((uint)bVar25 * auVar288._8_4_ | (uint)!bVar25 * iVar136);
                            bVar37 = (bool)((byte)(uVar166 >> 3) & 1);
                            auVar398._12_4_ =
                                 (uint)bVar37 * iVar137 |
                                 (uint)!bVar37 *
                                 ((uint)bVar26 * auVar288._12_4_ | (uint)!bVar26 * iVar137);
                            bVar37 = (bool)((byte)(uVar166 >> 4) & 1);
                            auVar398._16_4_ =
                                 (uint)bVar37 * iVar334 |
                                 (uint)!bVar37 *
                                 ((uint)bVar27 * auVar288._16_4_ | (uint)!bVar27 * iVar334);
                            bVar37 = (bool)((byte)(uVar166 >> 5) & 1);
                            auVar398._20_4_ =
                                 (uint)bVar37 * iVar335 |
                                 (uint)!bVar37 *
                                 ((uint)bVar28 * auVar288._20_4_ | (uint)!bVar28 * iVar335);
                            bVar37 = (bool)((byte)(uVar166 >> 6) & 1);
                            auVar398._24_4_ =
                                 (uint)bVar37 * iVar336 |
                                 (uint)!bVar37 *
                                 ((uint)bVar29 * auVar288._24_4_ | (uint)!bVar29 * iVar336);
                            bVar37 = (bool)((byte)(uVar166 >> 7) & 1);
                            auVar398._28_4_ =
                                 (uint)bVar37 * iVar337 |
                                 (uint)!bVar37 *
                                 ((uint)bVar30 * auVar288._28_4_ | (uint)!bVar30 * iVar337);
                            bVar37 = (bool)((byte)(uVar166 >> 8) & 1);
                            auVar398._32_4_ =
                                 (uint)bVar37 * iVar338 |
                                 (uint)!bVar37 *
                                 ((uint)(bVar32 & 1) * auVar288._32_4_ |
                                 (uint)!(bool)(bVar32 & 1) * iVar338);
                            bVar37 = (bool)((byte)(uVar166 >> 9) & 1);
                            auVar398._36_4_ =
                                 (uint)bVar37 * iVar339 |
                                 (uint)!bVar37 *
                                 ((uint)bVar33 * auVar288._36_4_ | (uint)!bVar33 * iVar339);
                            bVar37 = (bool)((byte)(uVar166 >> 10) & 1);
                            auVar398._40_4_ =
                                 (uint)bVar37 * iVar340 |
                                 (uint)!bVar37 *
                                 ((uint)bVar34 * auVar288._40_4_ | (uint)!bVar34 * iVar340);
                            bVar37 = (bool)((byte)(uVar166 >> 0xb) & 1);
                            auVar398._44_4_ =
                                 (uint)bVar37 * iVar341 |
                                 (uint)!bVar37 *
                                 ((uint)bVar35 * auVar288._44_4_ | (uint)!bVar35 * iVar341);
                            bVar37 = (bool)((byte)(uVar166 >> 0xc) & 1);
                            auVar398._48_4_ =
                                 (uint)bVar37 * iVar342 |
                                 (uint)!bVar37 *
                                 ((uint)bVar36 * auVar288._48_4_ | (uint)!bVar36 * iVar342);
                            bVar37 = (bool)((byte)(uVar166 >> 0xd) & 1);
                            auVar398._52_4_ =
                                 (uint)bVar37 * iVar343 |
                                 (uint)!bVar37 *
                                 ((uint)bVar38 * auVar288._52_4_ | (uint)!bVar38 * iVar343);
                            bVar37 = (bool)((byte)(uVar166 >> 0xe) & 1);
                            auVar398._56_4_ =
                                 (uint)bVar37 * iVar344 |
                                 (uint)!bVar37 *
                                 ((uint)bVar39 * auVar288._56_4_ | (uint)!bVar39 * iVar344);
                            bVar37 = SUB81(uVar166 >> 0xf,0);
                            auVar398._60_4_ =
                                 (uint)bVar37 * iVar345 |
                                 (uint)!bVar37 *
                                 ((uint)bVar40 * auVar288._60_4_ | (uint)!bVar40 * iVar345);
                            uVar163 = uVar163 + 0x10;
                            auVar285 = vpaddq_avx512f(auVar285,auVar275);
                            auVar286 = vpaddq_avx512f(auVar286,auVar275);
                            auVar287 = vpaddd_avx512f(auVar287,auVar274);
                          } while ((iVar138 + 0xfU & 0xfffffff0) != uVar163);
                          bVar37 = (bool)((byte)uVar148 & 1);
                          auVar333._0_4_ = bVar37 * auVar398._0_4_ | (uint)!bVar37 * iVar134;
                          bVar37 = (bool)((byte)(uVar165 >> 1) & 1);
                          auVar333._4_4_ = bVar37 * auVar398._4_4_ | (uint)!bVar37 * iVar135;
                          bVar37 = (bool)((byte)(uVar165 >> 2) & 1);
                          auVar333._8_4_ = bVar37 * auVar398._8_4_ | (uint)!bVar37 * iVar136;
                          bVar37 = (bool)((byte)(uVar165 >> 3) & 1);
                          auVar333._12_4_ = bVar37 * auVar398._12_4_ | (uint)!bVar37 * iVar137;
                          bVar37 = (bool)((byte)(uVar165 >> 4) & 1);
                          auVar333._16_4_ = bVar37 * auVar398._16_4_ | (uint)!bVar37 * iVar334;
                          bVar37 = (bool)((byte)(uVar165 >> 5) & 1);
                          auVar333._20_4_ = bVar37 * auVar398._20_4_ | (uint)!bVar37 * iVar335;
                          bVar37 = (bool)((byte)(uVar165 >> 6) & 1);
                          auVar333._24_4_ = bVar37 * auVar398._24_4_ | (uint)!bVar37 * iVar336;
                          bVar37 = (bool)((byte)(uVar165 >> 7) & 1);
                          auVar333._28_4_ = bVar37 * auVar398._28_4_ | (uint)!bVar37 * iVar337;
                          auVar333._32_4_ =
                               (bVar31 & 1) * auVar398._32_4_ | (uint)!(bool)(bVar31 & 1) * iVar338;
                          bVar37 = (bool)(bVar31 >> 1 & 1);
                          auVar333._36_4_ = bVar37 * auVar398._36_4_ | (uint)!bVar37 * iVar339;
                          bVar37 = (bool)(bVar31 >> 2 & 1);
                          auVar333._40_4_ = bVar37 * auVar398._40_4_ | (uint)!bVar37 * iVar340;
                          bVar37 = (bool)(bVar31 >> 3 & 1);
                          auVar333._44_4_ = bVar37 * auVar398._44_4_ | (uint)!bVar37 * iVar341;
                          bVar37 = (bool)(bVar31 >> 4 & 1);
                          auVar333._48_4_ = bVar37 * auVar398._48_4_ | (uint)!bVar37 * iVar342;
                          bVar37 = (bool)(bVar31 >> 5 & 1);
                          auVar333._52_4_ = bVar37 * auVar398._52_4_ | (uint)!bVar37 * iVar343;
                          bVar37 = (bool)(bVar31 >> 6 & 1);
                          auVar333._56_4_ = bVar37 * auVar398._56_4_ | (uint)!bVar37 * iVar344;
                          auVar333._60_4_ =
                               (bVar31 >> 7) * auVar398._60_4_ |
                               (uint)!(bool)(bVar31 >> 7) * iVar345;
                          auVar222 = vextractf64x4_avx512f(auVar333,1);
                          auVar283 = vaddps_avx512f(auVar333,ZEXT3264(auVar222));
                          auVar353._0_4_ = auVar283._0_4_ + auVar283._16_4_;
                          auVar353._4_4_ = auVar283._4_4_ + auVar283._20_4_;
                          auVar353._8_4_ = auVar283._8_4_ + auVar283._24_4_;
                          auVar353._12_4_ = auVar283._12_4_ + auVar283._28_4_;
                          auVar170 = vshufpd_avx(auVar353,auVar353,1);
                          auVar354._0_4_ = auVar353._0_4_ + auVar170._0_4_;
                          auVar354._4_4_ = auVar353._4_4_ + auVar170._4_4_;
                          auVar354._8_4_ = auVar353._8_4_ + auVar170._8_4_;
                          auVar354._12_4_ = auVar353._12_4_ + auVar170._12_4_;
                          auVar170 = vhaddps_avx(auVar354,auVar354);
                          auVar282 = ZEXT1664(auVar170);
                        }
                        iVar158 = iVar158 + 1;
                      } while (iVar158 != *(int *)(&this->field_0xd8 + (long)p_Var141));
                    }
                    auVar170 = auVar282._0_16_;
                    uVar164 = uVar164 + 1;
                    local_c8._0_8_ = local_c8._0_8_ + (long)iVar147 * 4;
                  } while (uVar164 != uVar145);
                }
                p_Var141 = pp_Var19[-3];
                fVar360 = auVar170._0_4_;
                fVar346 = fVar360;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var141)) {
                case 1:
                  auVar168 = vmaxss_avx(auVar170,ZEXT416(0));
                  fVar346 = auVar168._0_4_;
                  break;
                case 2:
                  uVar148 = vcmpss_avx512f(auVar170,ZEXT416(0),0xe);
                  bVar37 = (bool)((byte)uVar148 & 1);
                  fVar346 = (float)((uint)bVar37 * 0x3f800000 +
                                   (uint)!bVar37 * **(int **)(&this->field_0x118 + (long)p_Var141))
                            * fVar360;
                  break;
                case 3:
                  fVar360 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var141))[1];
                  auVar168 = vmaxss_avx(auVar170,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var141)));
                  fVar346 = auVar168._0_4_;
                  if (fVar360 < auVar168._0_4_) {
                    fVar346 = fVar360;
                  }
                  break;
                case 4:
                  auVar170 = vminss_avx(auVar170,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar86._8_4_ = 0x80000000;
                  auVar86._0_8_ = 0x8000000080000000;
                  auVar86._12_4_ = 0x80000000;
                  auVar191 = vxorps_avx512vl(auVar170,auVar86);
                  uVar148 = vcmpss_avx512f(auVar170,ZEXT416(0xc2b0c0a5),1);
                  bVar37 = (bool)((byte)uVar148 & 1);
                  in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                  fVar346 = expf((float)((uint)bVar37 * 0x42b0c0a5 + (uint)!bVar37 * auVar191._0_4_)
                                );
                  auVar274 = vpbroadcastd_avx512f(ZEXT416(0x10));
                  auVar275 = vpbroadcastq_avx512f(ZEXT816(0x10));
                  auVar169 = vxorps_avx512vl(auVar169,auVar169);
                  auVar281 = ZEXT1664(auVar169);
                  auVar276 = vpternlogd_avx512f(auVar276,auVar276,auVar276,0xff);
                  auVar277 = vpmovsxbd_avx512f(_DAT_005547c0);
                  auVar291 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar278 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar168 = vxorps_avx512vl(auVar168,auVar168);
                  auVar280 = ZEXT1664(auVar168);
                  auVar279 = vmovdqu64_avx512f(local_88);
                  fVar346 = 1.0 / (fVar346 + 1.0);
                  break;
                case 5:
                  in_ZMM13 = (float  [16])ZEXT1664(in_ZMM13._0_16_);
                  local_c8 = auVar170;
                  fVar346 = expf(fVar360);
                  fVar346 = logf(fVar346 + 1.0);
                  fVar346 = tanhf(fVar346);
                  auVar274 = vpbroadcastd_avx512f(ZEXT416(0x10));
                  auVar275 = vpbroadcastq_avx512f(ZEXT816(0x10));
                  auVar169 = vxorps_avx512vl(auVar169,auVar169);
                  auVar281 = ZEXT1664(auVar169);
                  auVar276 = vpternlogd_avx512f(auVar276,auVar276,auVar276,0xff);
                  auVar277 = vpmovsxbd_avx512f(_DAT_005547c0);
                  auVar291 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar278 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar168 = vxorps_avx512vl(auVar168,auVar168);
                  auVar280 = ZEXT1664(auVar168);
                  auVar279 = vmovdqu64_avx512f(local_88);
                  fVar346 = fVar346 * (float)local_c8._0_4_;
                  break;
                case 6:
                  fVar2 = **(float **)(&this->field_0x118 + (long)p_Var141);
                  auVar85._8_4_ = 0x80000000;
                  auVar85._0_8_ = 0x8000000080000000;
                  auVar85._12_4_ = 0x80000000;
                  auVar169 = ZEXT416((uint)(*(float **)(&this->field_0x118 + (long)p_Var141))[1]);
                  auVar168 = vxorps_avx512vl(auVar169,auVar85);
                  fVar367 = auVar168._0_4_ / fVar2;
                  fVar346 = 0.0;
                  if ((fVar367 <= fVar360) && (fVar346 = fVar360, fVar360 <= fVar367 + 1.0 / fVar2))
                  {
                    auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar170,auVar169);
                    fVar346 = auVar168._0_4_ * fVar360;
                  }
                }
                *(float *)((long)local_1b8 + uVar154 * 4) = fVar346;
                uVar154 = uVar154 + 1;
              } while (uVar154 != uVar143);
            }
            local_1b8 = (_func_int ***)((long)local_1b8 + lVar144 * 4);
            uVar140 = uVar140 + 1;
          } while (uVar140 != iVar8);
        }
        local_1b0 = local_1b0 + 1;
      } while (local_1b0 < *(int *)(&this->field_0xd0 + (long)pp_Var15[-3]));
    }
    pMVar133 = local_40;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86_avx512 +
               (long)this->_vptr_Deconvolution_x86_avx512[-3]),&local_118,local_40,local_38);
    pvVar151 = (void *)0xffffff9c;
    if ((pMVar133->data != (void *)0x0) &&
       (pvVar151 = (void *)0xffffff9c, (long)pMVar133->c * pMVar133->cstep != 0)) {
      pvVar151 = (void *)0x0;
    }
  }
  piVar14 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_118.data != (Allocator *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return (int)pvVar151;
}

Assistant:

int Deconvolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}